

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [28];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  Primitive PVar10;
  uint uVar11;
  uint uVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [28];
  undefined1 auVar107 [12];
  undefined1 auVar108 [28];
  undefined1 auVar109 [28];
  undefined1 auVar110 [24];
  uint uVar111;
  uint uVar112;
  uint uVar113;
  long lVar114;
  ulong uVar115;
  long lVar116;
  ulong uVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar136;
  float fVar140;
  vint4 bi_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar137;
  float fVar141;
  float fVar144;
  float fVar147;
  float fVar150;
  float fVar153;
  float fVar156;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar138;
  float fVar139;
  float fVar142;
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  vint4 bi_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar174;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar175;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  float fVar176;
  float fVar188;
  float fVar189;
  vint4 ai;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar195 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar190;
  undefined1 auVar187 [32];
  float fVar191;
  float fVar203;
  float fVar204;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar206;
  undefined1 auVar194 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar196 [32];
  float fVar205;
  float fVar207;
  float fVar211;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  float fVar212;
  float fVar223;
  float fVar225;
  vint4 bi;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar213;
  undefined1 auVar217 [16];
  undefined1 auVar216 [16];
  float fVar227;
  undefined1 auVar218 [32];
  float fVar224;
  float fVar226;
  float fVar228;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar229;
  undefined1 auVar222 [32];
  float fVar230;
  float fVar237;
  float fVar239;
  vint4 ai_2;
  undefined1 auVar232 [16];
  float fVar241;
  undefined1 auVar233 [16];
  float fVar231;
  undefined1 auVar234 [16];
  float fVar238;
  float fVar240;
  float fVar242;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar243;
  float fVar244;
  float fVar252;
  float fVar254;
  vint4 ai_1;
  undefined1 auVar245 [16];
  float fVar256;
  undefined1 auVar246 [16];
  float fVar253;
  float fVar255;
  float fVar257;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar258;
  float fVar259;
  undefined1 auVar251 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar269;
  float fVar270;
  undefined1 auVar271 [16];
  float fVar280;
  undefined1 auVar272 [32];
  float fVar279;
  undefined1 auVar273 [32];
  float fVar277;
  float fVar281;
  undefined1 auVar274 [32];
  float fVar276;
  float fVar278;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar275 [64];
  float fVar285;
  float fVar292;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar296;
  float fVar297;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar307 [16];
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar308 [32];
  undefined1 auVar312 [16];
  float fVar319;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float fVar320;
  float fVar326;
  float fVar327;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar328;
  float fVar329;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar330;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar331 [32];
  float fVar335;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float local_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [16];
  Precalculations *local_810;
  ulong local_808;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  RTCFilterFunctionNArguments local_790;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  RayHitK<4> *local_720;
  undefined1 (*local_718) [16];
  size_t local_710;
  RayQueryContext *local_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  RTCHitN local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  PVar10 = prim[1];
  uVar117 = (ulong)(byte)PVar10;
  auVar234 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar234 = vinsertps_avx(auVar234,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar183 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar183 = vinsertps_avx(auVar183,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar234 = vsubps_avx(auVar234,*(undefined1 (*) [16])(prim + uVar117 * 0x19 + 6));
  fVar230 = *(float *)(prim + uVar117 * 0x19 + 0x12);
  auVar159._0_4_ = fVar230 * auVar234._0_4_;
  auVar159._4_4_ = fVar230 * auVar234._4_4_;
  auVar159._8_4_ = fVar230 * auVar234._8_4_;
  auVar159._12_4_ = fVar230 * auVar234._12_4_;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 4 + 6)));
  auVar260._0_4_ = fVar230 * auVar183._0_4_;
  auVar260._4_4_ = fVar230 * auVar183._4_4_;
  auVar260._8_4_ = fVar230 * auVar183._8_4_;
  auVar260._12_4_ = fVar230 * auVar183._12_4_;
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 5 + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 6 + 6)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0xb + 6)));
  auVar217 = vcvtdq2ps_avx(auVar217);
  auVar307 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0xc + 6)));
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0xd + 6)));
  auVar307 = vcvtdq2ps_avx(auVar307);
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0x12 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0x13 + 6)));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0x14 + 6)));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar121 = vshufps_avx(auVar260,auVar260,0);
  auVar160 = vshufps_avx(auVar260,auVar260,0x55);
  auVar177 = vshufps_avx(auVar260,auVar260,0xaa);
  fVar230 = auVar177._0_4_;
  fVar191 = auVar177._4_4_;
  fVar237 = auVar177._8_4_;
  fVar203 = auVar177._12_4_;
  fVar243 = auVar160._0_4_;
  fVar252 = auVar160._4_4_;
  fVar254 = auVar160._8_4_;
  fVar256 = auVar160._12_4_;
  fVar239 = auVar121._0_4_;
  fVar204 = auVar121._4_4_;
  fVar241 = auVar121._8_4_;
  fVar206 = auVar121._12_4_;
  auVar312._0_4_ = fVar239 * auVar234._0_4_ + fVar243 * auVar183._0_4_ + fVar230 * auVar217._0_4_;
  auVar312._4_4_ = fVar204 * auVar234._4_4_ + fVar252 * auVar183._4_4_ + fVar191 * auVar217._4_4_;
  auVar312._8_4_ = fVar241 * auVar234._8_4_ + fVar254 * auVar183._8_4_ + fVar237 * auVar217._8_4_;
  auVar312._12_4_ =
       fVar206 * auVar234._12_4_ + fVar256 * auVar183._12_4_ + fVar203 * auVar217._12_4_;
  auVar321._0_4_ = fVar239 * auVar195._0_4_ + fVar243 * auVar307._0_4_ + auVar18._0_4_ * fVar230;
  auVar321._4_4_ = fVar204 * auVar195._4_4_ + fVar252 * auVar307._4_4_ + auVar18._4_4_ * fVar191;
  auVar321._8_4_ = fVar241 * auVar195._8_4_ + fVar254 * auVar307._8_4_ + auVar18._8_4_ * fVar237;
  auVar321._12_4_ = fVar206 * auVar195._12_4_ + fVar256 * auVar307._12_4_ + auVar18._12_4_ * fVar203
  ;
  auVar261._0_4_ = fVar239 * auVar122._0_4_ + fVar243 * auVar123._0_4_ + auVar161._0_4_ * fVar230;
  auVar261._4_4_ = fVar204 * auVar122._4_4_ + fVar252 * auVar123._4_4_ + auVar161._4_4_ * fVar191;
  auVar261._8_4_ = fVar241 * auVar122._8_4_ + fVar254 * auVar123._8_4_ + auVar161._8_4_ * fVar237;
  auVar261._12_4_ =
       fVar206 * auVar122._12_4_ + fVar256 * auVar123._12_4_ + auVar161._12_4_ * fVar203;
  auVar121 = vshufps_avx(auVar159,auVar159,0);
  auVar160 = vshufps_avx(auVar159,auVar159,0x55);
  auVar177 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar230 = auVar177._0_4_;
  fVar191 = auVar177._4_4_;
  fVar237 = auVar177._8_4_;
  fVar203 = auVar177._12_4_;
  fVar243 = auVar160._0_4_;
  fVar252 = auVar160._4_4_;
  fVar254 = auVar160._8_4_;
  fVar256 = auVar160._12_4_;
  fVar239 = auVar121._0_4_;
  fVar204 = auVar121._4_4_;
  fVar241 = auVar121._8_4_;
  fVar206 = auVar121._12_4_;
  auVar214._0_4_ = fVar239 * auVar234._0_4_ + fVar243 * auVar183._0_4_ + fVar230 * auVar217._0_4_;
  auVar214._4_4_ = fVar204 * auVar234._4_4_ + fVar252 * auVar183._4_4_ + fVar191 * auVar217._4_4_;
  auVar214._8_4_ = fVar241 * auVar234._8_4_ + fVar254 * auVar183._8_4_ + fVar237 * auVar217._8_4_;
  auVar214._12_4_ =
       fVar206 * auVar234._12_4_ + fVar256 * auVar183._12_4_ + fVar203 * auVar217._12_4_;
  auVar160._0_4_ = fVar239 * auVar195._0_4_ + auVar18._0_4_ * fVar230 + fVar243 * auVar307._0_4_;
  auVar160._4_4_ = fVar204 * auVar195._4_4_ + auVar18._4_4_ * fVar191 + fVar252 * auVar307._4_4_;
  auVar160._8_4_ = fVar241 * auVar195._8_4_ + auVar18._8_4_ * fVar237 + fVar254 * auVar307._8_4_;
  auVar160._12_4_ = fVar206 * auVar195._12_4_ + auVar18._12_4_ * fVar203 + fVar256 * auVar307._12_4_
  ;
  auVar121._0_4_ = fVar243 * auVar123._0_4_ + auVar161._0_4_ * fVar230 + fVar239 * auVar122._0_4_;
  auVar121._4_4_ = fVar252 * auVar123._4_4_ + auVar161._4_4_ * fVar191 + fVar204 * auVar122._4_4_;
  auVar121._8_4_ = fVar254 * auVar123._8_4_ + auVar161._8_4_ * fVar237 + fVar241 * auVar122._8_4_;
  auVar121._12_4_ =
       fVar256 * auVar123._12_4_ + auVar161._12_4_ * fVar203 + fVar206 * auVar122._12_4_;
  auVar245._8_4_ = 0x7fffffff;
  auVar245._0_8_ = 0x7fffffff7fffffff;
  auVar245._12_4_ = 0x7fffffff;
  auVar234 = vandps_avx(auVar312,auVar245);
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  auVar234 = vcmpps_avx(auVar234,auVar192,1);
  auVar183 = vblendvps_avx(auVar312,auVar192,auVar234);
  auVar234 = vandps_avx(auVar321,auVar245);
  auVar234 = vcmpps_avx(auVar234,auVar192,1);
  auVar217 = vblendvps_avx(auVar321,auVar192,auVar234);
  auVar234 = vandps_avx(auVar261,auVar245);
  auVar234 = vcmpps_avx(auVar234,auVar192,1);
  auVar234 = vblendvps_avx(auVar261,auVar192,auVar234);
  auVar195 = vrcpps_avx(auVar183);
  fVar243 = auVar195._0_4_;
  auVar177._0_4_ = fVar243 * auVar183._0_4_;
  fVar252 = auVar195._4_4_;
  auVar177._4_4_ = fVar252 * auVar183._4_4_;
  fVar254 = auVar195._8_4_;
  auVar177._8_4_ = fVar254 * auVar183._8_4_;
  fVar256 = auVar195._12_4_;
  auVar177._12_4_ = fVar256 * auVar183._12_4_;
  auVar262._8_4_ = 0x3f800000;
  auVar262._0_8_ = 0x3f8000003f800000;
  auVar262._12_4_ = 0x3f800000;
  auVar183 = vsubps_avx(auVar262,auVar177);
  fVar243 = fVar243 + fVar243 * auVar183._0_4_;
  fVar252 = fVar252 + fVar252 * auVar183._4_4_;
  fVar254 = fVar254 + fVar254 * auVar183._8_4_;
  fVar256 = fVar256 + fVar256 * auVar183._12_4_;
  auVar183 = vrcpps_avx(auVar217);
  fVar230 = auVar183._0_4_;
  auVar232._0_4_ = fVar230 * auVar217._0_4_;
  fVar237 = auVar183._4_4_;
  auVar232._4_4_ = fVar237 * auVar217._4_4_;
  fVar239 = auVar183._8_4_;
  auVar232._8_4_ = fVar239 * auVar217._8_4_;
  fVar241 = auVar183._12_4_;
  auVar232._12_4_ = fVar241 * auVar217._12_4_;
  auVar183 = vsubps_avx(auVar262,auVar232);
  fVar230 = fVar230 + fVar230 * auVar183._0_4_;
  fVar237 = fVar237 + fVar237 * auVar183._4_4_;
  fVar239 = fVar239 + fVar239 * auVar183._8_4_;
  fVar241 = fVar241 + fVar241 * auVar183._12_4_;
  auVar183 = vrcpps_avx(auVar234);
  fVar191 = auVar183._0_4_;
  auVar193._0_4_ = fVar191 * auVar234._0_4_;
  fVar203 = auVar183._4_4_;
  auVar193._4_4_ = fVar203 * auVar234._4_4_;
  fVar204 = auVar183._8_4_;
  auVar193._8_4_ = fVar204 * auVar234._8_4_;
  fVar206 = auVar183._12_4_;
  auVar193._12_4_ = fVar206 * auVar234._12_4_;
  auVar234 = vsubps_avx(auVar262,auVar193);
  fVar191 = fVar191 + fVar191 * auVar234._0_4_;
  fVar203 = fVar203 + fVar203 * auVar234._4_4_;
  fVar204 = fVar204 + fVar204 * auVar234._8_4_;
  fVar206 = fVar206 + fVar206 * auVar234._12_4_;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar117 * 7 + 6);
  auVar234 = vpmovsxwd_avx(auVar234);
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar217 = vsubps_avx(auVar234,auVar214);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar117 * 9 + 6);
  auVar234 = vpmovsxwd_avx(auVar183);
  auVar178._0_4_ = fVar243 * auVar217._0_4_;
  auVar178._4_4_ = fVar252 * auVar217._4_4_;
  auVar178._8_4_ = fVar254 * auVar217._8_4_;
  auVar178._12_4_ = fVar256 * auVar217._12_4_;
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar234 = vsubps_avx(auVar234,auVar214);
  auVar215._0_4_ = fVar243 * auVar234._0_4_;
  auVar215._4_4_ = fVar252 * auVar234._4_4_;
  auVar215._8_4_ = fVar254 * auVar234._8_4_;
  auVar215._12_4_ = fVar256 * auVar234._12_4_;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + uVar117 * 0xe + 6);
  auVar234 = vpmovsxwd_avx(auVar217);
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar183 = vsubps_avx(auVar234,auVar160);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar234 = vpmovsxwd_avx(auVar195);
  auVar246._0_4_ = auVar183._0_4_ * fVar230;
  auVar246._4_4_ = auVar183._4_4_ * fVar237;
  auVar246._8_4_ = auVar183._8_4_ * fVar239;
  auVar246._12_4_ = auVar183._12_4_ * fVar241;
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar234 = vsubps_avx(auVar234,auVar160);
  auVar161._0_4_ = fVar230 * auVar234._0_4_;
  auVar161._4_4_ = fVar237 * auVar234._4_4_;
  auVar161._8_4_ = fVar239 * auVar234._8_4_;
  auVar161._12_4_ = fVar241 * auVar234._12_4_;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = *(ulong *)(prim + uVar117 * 0x15 + 6);
  auVar234 = vpmovsxwd_avx(auVar307);
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar234 = vsubps_avx(auVar234,auVar121);
  auVar233._0_4_ = auVar234._0_4_ * fVar191;
  auVar233._4_4_ = auVar234._4_4_ * fVar203;
  auVar233._8_4_ = auVar234._8_4_ * fVar204;
  auVar233._12_4_ = auVar234._12_4_ * fVar206;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar117 * 0x17 + 6);
  auVar234 = vpmovsxwd_avx(auVar18);
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar234 = vsubps_avx(auVar234,auVar121);
  auVar122._0_4_ = auVar234._0_4_ * fVar191;
  auVar122._4_4_ = auVar234._4_4_ * fVar203;
  auVar122._8_4_ = auVar234._8_4_ * fVar204;
  auVar122._12_4_ = auVar234._12_4_ * fVar206;
  auVar234 = vpminsd_avx(auVar178,auVar215);
  auVar183 = vpminsd_avx(auVar246,auVar161);
  auVar234 = vmaxps_avx(auVar234,auVar183);
  auVar183 = vpminsd_avx(auVar233,auVar122);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar286._4_4_ = uVar9;
  auVar286._0_4_ = uVar9;
  auVar286._8_4_ = uVar9;
  auVar286._12_4_ = uVar9;
  auVar183 = vmaxps_avx(auVar183,auVar286);
  auVar234 = vmaxps_avx(auVar234,auVar183);
  auVar275 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
  local_2b0._0_4_ = auVar234._0_4_ * 0.99999964;
  local_2b0._4_4_ = auVar234._4_4_ * 0.99999964;
  local_2b0._8_4_ = auVar234._8_4_ * 0.99999964;
  local_2b0._12_4_ = auVar234._12_4_ * 0.99999964;
  auVar234 = vpmaxsd_avx(auVar178,auVar215);
  auVar183 = vpmaxsd_avx(auVar246,auVar161);
  auVar234 = vminps_avx(auVar234,auVar183);
  auVar183 = vpmaxsd_avx(auVar233,auVar122);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar179._4_4_ = uVar9;
  auVar179._0_4_ = uVar9;
  auVar179._8_4_ = uVar9;
  auVar179._12_4_ = uVar9;
  auVar183 = vminps_avx(auVar183,auVar179);
  auVar234 = vminps_avx(auVar234,auVar183);
  auVar123._0_4_ = auVar234._0_4_ * 1.0000004;
  auVar123._4_4_ = auVar234._4_4_ * 1.0000004;
  auVar123._8_4_ = auVar234._8_4_ * 1.0000004;
  auVar123._12_4_ = auVar234._12_4_ * 1.0000004;
  auVar234 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar183 = vpcmpgtd_avx(auVar234,_DAT_01f4ad30);
  auVar234 = vcmpps_avx(local_2b0,auVar123,2);
  auVar234 = vandps_avx(auVar234,auVar183);
  uVar111 = vmovmskps_avx(auVar234);
  local_5e8 = pre->ray_space + k;
  local_5e0 = mm_lookupmask_ps._16_8_;
  uStack_5d8 = mm_lookupmask_ps._24_8_;
  uStack_5d0 = mm_lookupmask_ps._16_8_;
  uStack_5c8 = mm_lookupmask_ps._24_8_;
  local_718 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_810 = pre;
  do {
    uVar117 = (ulong)uVar111;
    if (uVar117 == 0) {
      return;
    }
    auVar201 = auVar275._0_32_;
    lVar114 = 0;
    if (uVar117 != 0) {
      for (; (uVar111 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
      }
    }
    uVar117 = uVar117 - 1 & uVar117;
    uVar111 = *(uint *)(prim + 2);
    uVar11 = *(uint *)(prim + lVar114 * 4 + 6);
    local_808 = (ulong)uVar11;
    pGVar14 = (context->scene->geometries).items[uVar111].ptr;
    uVar115 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                              pGVar14[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * local_808);
    p_Var15 = pGVar14[1].intersectionFilterN;
    lVar114 = *(long *)&pGVar14[1].time_range.upper;
    auVar234 = *(undefined1 (*) [16])(lVar114 + (long)p_Var15 * uVar115);
    auVar183 = *(undefined1 (*) [16])(lVar114 + (uVar115 + 1) * (long)p_Var15);
    auVar217 = *(undefined1 (*) [16])(lVar114 + (uVar115 + 2) * (long)p_Var15);
    lVar116 = 0;
    if (uVar117 != 0) {
      for (; (uVar117 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
      }
    }
    auVar195 = *(undefined1 (*) [16])(lVar114 + (uVar115 + 3) * (long)p_Var15);
    if (((uVar117 != 0) && (uVar115 = uVar117 - 1 & uVar117, uVar115 != 0)) &&
       (lVar114 = 0, uVar115 != 0)) {
      for (; (uVar115 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
      }
    }
    uVar12 = (uint)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar307 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar123 = vinsertps_avx(auVar307,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar122 = vsubps_avx(auVar234,auVar123);
    auVar307 = vshufps_avx(auVar122,auVar122,0);
    auVar18 = vshufps_avx(auVar122,auVar122,0x55);
    auVar122 = vshufps_avx(auVar122,auVar122,0xaa);
    fVar230 = (local_5e8->vx).field_0.m128[0];
    fVar191 = (local_5e8->vx).field_0.m128[1];
    fVar237 = (local_5e8->vx).field_0.m128[2];
    fVar203 = (local_5e8->vx).field_0.m128[3];
    fVar239 = (local_5e8->vy).field_0.m128[0];
    fVar204 = (local_5e8->vy).field_0.m128[1];
    fVar241 = (local_5e8->vy).field_0.m128[2];
    fVar206 = (local_5e8->vy).field_0.m128[3];
    fVar243 = (local_5e8->vz).field_0.m128[0];
    fVar252 = (local_5e8->vz).field_0.m128[1];
    fVar254 = (local_5e8->vz).field_0.m128[2];
    fVar256 = (local_5e8->vz).field_0.m128[3];
    auVar162._0_4_ = auVar307._0_4_ * fVar230 + auVar18._0_4_ * fVar239 + fVar243 * auVar122._0_4_;
    auVar162._4_4_ = auVar307._4_4_ * fVar191 + auVar18._4_4_ * fVar204 + fVar252 * auVar122._4_4_;
    auVar162._8_4_ = auVar307._8_4_ * fVar237 + auVar18._8_4_ * fVar241 + fVar254 * auVar122._8_4_;
    auVar162._12_4_ =
         auVar307._12_4_ * fVar203 + auVar18._12_4_ * fVar206 + fVar256 * auVar122._12_4_;
    auVar307 = vblendps_avx(auVar162,auVar234,8);
    auVar161 = vsubps_avx(auVar183,auVar123);
    auVar18 = vshufps_avx(auVar161,auVar161,0);
    auVar122 = vshufps_avx(auVar161,auVar161,0x55);
    auVar161 = vshufps_avx(auVar161,auVar161,0xaa);
    auVar322._0_4_ = auVar18._0_4_ * fVar230 + auVar122._0_4_ * fVar239 + fVar243 * auVar161._0_4_;
    auVar322._4_4_ = auVar18._4_4_ * fVar191 + auVar122._4_4_ * fVar204 + fVar252 * auVar161._4_4_;
    auVar322._8_4_ = auVar18._8_4_ * fVar237 + auVar122._8_4_ * fVar241 + fVar254 * auVar161._8_4_;
    auVar322._12_4_ =
         auVar18._12_4_ * fVar203 + auVar122._12_4_ * fVar206 + fVar256 * auVar161._12_4_;
    auVar18 = vblendps_avx(auVar322,auVar183,8);
    auVar121 = vsubps_avx(auVar217,auVar123);
    auVar122 = vshufps_avx(auVar121,auVar121,0);
    auVar161 = vshufps_avx(auVar121,auVar121,0x55);
    auVar121 = vshufps_avx(auVar121,auVar121,0xaa);
    auVar271._0_4_ = auVar122._0_4_ * fVar230 + auVar161._0_4_ * fVar239 + fVar243 * auVar121._0_4_;
    auVar271._4_4_ = auVar122._4_4_ * fVar191 + auVar161._4_4_ * fVar204 + fVar252 * auVar121._4_4_;
    auVar271._8_4_ = auVar122._8_4_ * fVar237 + auVar161._8_4_ * fVar241 + fVar254 * auVar121._8_4_;
    auVar271._12_4_ =
         auVar122._12_4_ * fVar203 + auVar161._12_4_ * fVar206 + fVar256 * auVar121._12_4_;
    auVar121 = vshufps_avx(auVar217,auVar217,0xff);
    auVar122 = vblendps_avx(auVar271,auVar217,8);
    auVar160 = vsubps_avx(auVar195,auVar123);
    auVar123 = vshufps_avx(auVar160,auVar160,0);
    auVar161 = vshufps_avx(auVar160,auVar160,0x55);
    auVar160 = vshufps_avx(auVar160,auVar160,0xaa);
    auVar287._0_4_ = auVar123._0_4_ * fVar230 + auVar161._0_4_ * fVar239 + fVar243 * auVar160._0_4_;
    auVar287._4_4_ = auVar123._4_4_ * fVar191 + auVar161._4_4_ * fVar204 + fVar252 * auVar160._4_4_;
    auVar287._8_4_ = auVar123._8_4_ * fVar237 + auVar161._8_4_ * fVar241 + fVar254 * auVar160._8_4_;
    auVar287._12_4_ =
         auVar123._12_4_ * fVar203 + auVar161._12_4_ * fVar206 + fVar256 * auVar160._12_4_;
    auVar160 = vshufps_avx(auVar195,auVar195,0xff);
    auVar123 = vblendps_avx(auVar287,auVar195,8);
    auVar216._8_4_ = 0x7fffffff;
    auVar216._0_8_ = 0x7fffffff7fffffff;
    auVar216._12_4_ = 0x7fffffff;
    auVar307 = vandps_avx(auVar307,auVar216);
    auVar18 = vandps_avx(auVar18,auVar216);
    auVar161 = vmaxps_avx(auVar307,auVar18);
    auVar307 = vandps_avx(auVar122,auVar216);
    auVar18 = vandps_avx(auVar123,auVar216);
    auVar307 = vmaxps_avx(auVar307,auVar18);
    auVar307 = vmaxps_avx(auVar161,auVar307);
    auVar18 = vmovshdup_avx(auVar307);
    auVar18 = vmaxss_avx(auVar18,auVar307);
    auVar307 = vshufpd_avx(auVar307,auVar307,1);
    auVar307 = vmaxss_avx(auVar307,auVar18);
    lVar114 = (long)(int)uVar12 * 0x44;
    fVar205 = *(float *)(bspline_basis0 + lVar114 + 0x908);
    fVar311 = *(float *)(bspline_basis0 + lVar114 + 0x90c);
    fVar310 = *(float *)(bspline_basis0 + lVar114 + 0x910);
    fVar270 = *(float *)(bspline_basis0 + lVar114 + 0x914);
    fVar207 = *(float *)(bspline_basis0 + lVar114 + 0x918);
    fVar266 = *(float *)(bspline_basis0 + lVar114 + 0x91c);
    fVar277 = *(float *)(bspline_basis0 + lVar114 + 0x920);
    local_7e0._0_16_ = auVar271;
    auVar18 = vshufps_avx(auVar271,auVar271,0);
    register0x00001490 = auVar18;
    _local_500 = auVar18;
    auVar122 = vshufps_avx(auVar271,auVar271,0x55);
    register0x00001390 = auVar122;
    _local_520 = auVar122;
    register0x00001410 = auVar121;
    _local_100 = auVar121;
    fVar230 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar114 + 0xd8c);
    fVar191 = *(float *)(bspline_basis0 + lVar114 + 0xd90);
    fVar237 = *(float *)(bspline_basis0 + lVar114 + 0xd94);
    fVar203 = *(float *)(bspline_basis0 + lVar114 + 0xd98);
    fVar239 = *(float *)(bspline_basis0 + lVar114 + 0xd9c);
    fVar204 = *(float *)(bspline_basis0 + lVar114 + 0xda0);
    fVar241 = *(float *)(bspline_basis0 + lVar114 + 0xda4);
    auVar106 = *(undefined1 (*) [28])(bspline_basis0 + lVar114 + 0xd8c);
    auVar123 = vshufps_avx(auVar287,auVar287,0);
    register0x00001310 = auVar123;
    _local_4a0 = auVar123;
    auVar161 = vshufps_avx(auVar287,auVar287,0x55);
    register0x000015d0 = auVar161;
    _local_5a0 = auVar161;
    register0x000013d0 = auVar160;
    _local_140 = auVar160;
    fVar212 = auVar123._0_4_;
    fVar223 = auVar123._4_4_;
    fVar225 = auVar123._8_4_;
    fVar227 = auVar123._12_4_;
    fVar335 = auVar161._0_4_;
    fVar338 = auVar161._4_4_;
    fVar339 = auVar161._8_4_;
    fVar340 = auVar161._12_4_;
    fVar296 = auVar18._0_4_;
    fVar301 = auVar18._4_4_;
    fVar303 = auVar18._8_4_;
    fVar305 = auVar18._12_4_;
    fVar244 = auVar122._0_4_;
    fVar253 = auVar122._4_4_;
    fVar255 = auVar122._8_4_;
    fVar257 = auVar122._12_4_;
    fVar254 = auVar160._0_4_;
    fVar256 = auVar160._4_4_;
    fVar319 = auVar160._8_4_;
    fVar309 = auVar160._12_4_;
    fVar213 = auVar121._0_4_;
    fVar224 = auVar121._4_4_;
    fVar226 = auVar121._8_4_;
    auVar18 = vshufps_avx(auVar322,auVar322,0);
    register0x00001490 = auVar18;
    _local_2e0 = auVar18;
    fVar279 = *(float *)(bspline_basis0 + lVar114 + 0x484);
    fVar208 = *(float *)(bspline_basis0 + lVar114 + 0x488);
    fVar267 = *(float *)(bspline_basis0 + lVar114 + 0x48c);
    fVar281 = *(float *)(bspline_basis0 + lVar114 + 0x490);
    fVar282 = *(float *)(bspline_basis0 + lVar114 + 0x494);
    fVar209 = *(float *)(bspline_basis0 + lVar114 + 0x498);
    fVar268 = *(float *)(bspline_basis0 + lVar114 + 0x49c);
    fVar297 = auVar18._0_4_;
    fVar302 = auVar18._4_4_;
    fVar304 = auVar18._8_4_;
    fVar306 = auVar18._12_4_;
    auVar122 = vshufps_avx(auVar322,auVar322,0x55);
    register0x00001410 = auVar122;
    _local_480 = auVar122;
    fVar269 = auVar122._0_4_;
    fVar276 = auVar122._4_4_;
    fVar278 = auVar122._8_4_;
    fVar280 = auVar122._12_4_;
    auVar122 = vshufps_avx(auVar183,auVar183,0xff);
    register0x00001590 = auVar122;
    _local_80 = auVar122;
    fVar293 = auVar122._0_4_;
    fVar320 = auVar122._4_4_;
    fVar326 = auVar122._8_4_;
    fVar327 = auVar122._12_4_;
    fVar329 = *(float *)(bspline_basis0 + lVar114 + 0x924) + 0.0 + 0.0;
    auVar122 = vshufps_avx(auVar162,auVar162,0);
    register0x00001350 = auVar122;
    _local_120 = auVar122;
    pauVar1 = (undefined1 (*) [16])(bspline_basis0 + lVar114);
    fVar206 = *(float *)*pauVar1;
    fVar243 = *(float *)(bspline_basis0 + lVar114 + 4);
    fVar252 = *(float *)(bspline_basis0 + lVar114 + 8);
    auVar107 = *(undefined1 (*) [12])*pauVar1;
    fVar283 = *(float *)(bspline_basis0 + lVar114 + 0xc);
    fStack_330 = *(float *)(bspline_basis0 + lVar114 + 0x10);
    fStack_32c = *(float *)(bspline_basis0 + lVar114 + 0x14);
    fStack_328 = *(float *)(bspline_basis0 + lVar114 + 0x18);
    fVar231 = auVar122._0_4_;
    fVar238 = auVar122._4_4_;
    fVar240 = auVar122._8_4_;
    fVar242 = auVar122._12_4_;
    auVar308._0_4_ = fVar231 * fVar206 + fVar297 * fVar279 + fVar296 * fVar205 + fVar212 * fVar230;
    auVar308._4_4_ = fVar238 * fVar243 + fVar302 * fVar208 + fVar301 * fVar311 + fVar223 * fVar191;
    auVar308._8_4_ = fVar240 * fVar252 + fVar304 * fVar267 + fVar303 * fVar310 + fVar225 * fVar237;
    auVar308._12_4_ = fVar242 * fVar283 + fVar306 * fVar281 + fVar305 * fVar270 + fVar227 * fVar203;
    auVar308._16_4_ =
         fVar231 * fStack_330 + fVar297 * fVar282 + fVar296 * fVar207 + fVar212 * fVar239;
    auVar308._20_4_ =
         fVar238 * fStack_32c + fVar302 * fVar209 + fVar301 * fVar266 + fVar223 * fVar204;
    auVar308._24_4_ =
         fVar240 * fStack_328 + fVar304 * fVar268 + fVar303 * fVar277 + fVar225 * fVar241;
    auVar308._28_4_ = fVar257 + 0.0;
    auVar122 = vshufps_avx(auVar162,auVar162,0x55);
    register0x00001290 = auVar122;
    _local_740 = auVar122;
    fVar176 = auVar122._0_4_;
    fVar188 = auVar122._4_4_;
    fVar189 = auVar122._8_4_;
    fVar190 = auVar122._12_4_;
    auVar313._0_4_ = fVar176 * fVar206 + fVar269 * fVar279 + fVar244 * fVar205 + fVar335 * fVar230;
    auVar313._4_4_ = fVar188 * fVar243 + fVar276 * fVar208 + fVar253 * fVar311 + fVar338 * fVar191;
    auVar313._8_4_ = fVar189 * fVar252 + fVar278 * fVar267 + fVar255 * fVar310 + fVar339 * fVar237;
    auVar313._12_4_ = fVar190 * fVar283 + fVar280 * fVar281 + fVar257 * fVar270 + fVar340 * fVar203;
    auVar313._16_4_ =
         fVar176 * fStack_330 + fVar269 * fVar282 + fVar244 * fVar207 + fVar335 * fVar239;
    auVar313._20_4_ =
         fVar188 * fStack_32c + fVar276 * fVar209 + fVar253 * fVar266 + fVar338 * fVar204;
    auVar313._24_4_ =
         fVar189 * fStack_328 + fVar278 * fVar268 + fVar255 * fVar277 + fVar339 * fVar241;
    auVar313._28_4_ = 0;
    auVar122 = vpermilps_avx(auVar234,0xff);
    register0x00001450 = auVar122;
    _local_a0 = auVar122;
    _local_340 = *pauVar1;
    auVar160 = _local_340;
    uStack_324 = *(undefined4 *)(bspline_basis0 + lVar114 + 0x1c);
    fVar228 = auVar122._0_4_;
    fVar285 = auVar122._4_4_;
    fVar292 = auVar122._8_4_;
    fVar118 = fVar293 * fVar279 + fVar213 * fVar205 + fVar254 * fVar230 + fVar228 * fVar206;
    fVar136 = fVar320 * fVar208 + fVar224 * fVar311 + fVar256 * fVar191 + fVar285 * fVar243;
    fVar140 = fVar326 * fVar267 + fVar226 * fVar310 + fVar319 * fVar237 + fVar292 * fVar252;
    fVar144 = fVar327 * fVar281 + auVar121._12_4_ * fVar270 + fVar309 * fVar203 +
              auVar122._12_4_ * fVar283;
    fVar147 = fVar293 * fVar282 + fVar213 * fVar207 + fVar254 * fVar239 + fVar228 * fStack_330;
    fVar150 = fVar320 * fVar209 + fVar224 * fVar266 + fVar256 * fVar204 + fVar285 * fStack_32c;
    fVar153 = fVar326 * fVar268 + fVar226 * fVar277 + fVar319 * fVar241 + fVar292 * fStack_328;
    fVar156 = fVar329 + 0.0;
    fVar284 = *(float *)(bspline_basis1 + lVar114 + 0x908);
    fVar211 = *(float *)(bspline_basis1 + lVar114 + 0x90c);
    fVar174 = *(float *)(bspline_basis1 + lVar114 + 0x910);
    fVar295 = *(float *)(bspline_basis1 + lVar114 + 0x914);
    fVar137 = *(float *)(bspline_basis1 + lVar114 + 0x918);
    fVar141 = *(float *)(bspline_basis1 + lVar114 + 0x91c);
    fVar119 = *(float *)(bspline_basis1 + lVar114 + 0x920);
    fVar138 = *(float *)(bspline_basis1 + lVar114 + 0xd8c);
    fVar142 = *(float *)(bspline_basis1 + lVar114 + 0xd90);
    fVar145 = *(float *)(bspline_basis1 + lVar114 + 0xd94);
    fVar148 = *(float *)(bspline_basis1 + lVar114 + 0xd98);
    fVar151 = *(float *)(bspline_basis1 + lVar114 + 0xd9c);
    fVar154 = *(float *)(bspline_basis1 + lVar114 + 0xda0);
    fVar157 = *(float *)(bspline_basis1 + lVar114 + 0xda4);
    fVar229 = *(float *)(bspline_basis1 + lVar114 + 0x484);
    fVar258 = *(float *)(bspline_basis1 + lVar114 + 0x488);
    fVar210 = *(float *)(bspline_basis1 + lVar114 + 0x48c);
    fVar120 = *(float *)(bspline_basis1 + lVar114 + 0x490);
    fVar139 = *(float *)(bspline_basis1 + lVar114 + 0x494);
    fVar143 = *(float *)(bspline_basis1 + lVar114 + 0x498);
    fVar146 = *(float *)(bspline_basis1 + lVar114 + 0x49c);
    fVar149 = *(float *)(bspline_basis1 + lVar114);
    fVar152 = *(float *)(bspline_basis1 + lVar114 + 4);
    fVar155 = *(float *)(bspline_basis1 + lVar114 + 8);
    fVar158 = *(float *)(bspline_basis1 + lVar114 + 0xc);
    fVar175 = *(float *)(bspline_basis1 + lVar114 + 0x10);
    fVar259 = *(float *)(bspline_basis1 + lVar114 + 0x14);
    fVar294 = *(float *)(bspline_basis1 + lVar114 + 0x18);
    auVar218._0_4_ = fVar231 * fVar149 + fVar297 * fVar229 + fVar284 * fVar296 + fVar212 * fVar138;
    auVar218._4_4_ = fVar238 * fVar152 + fVar302 * fVar258 + fVar211 * fVar301 + fVar223 * fVar142;
    auVar218._8_4_ = fVar240 * fVar155 + fVar304 * fVar210 + fVar174 * fVar303 + fVar225 * fVar145;
    auVar218._12_4_ = fVar242 * fVar158 + fVar306 * fVar120 + fVar295 * fVar305 + fVar227 * fVar148;
    auVar218._16_4_ = fVar231 * fVar175 + fVar297 * fVar139 + fVar137 * fVar296 + fVar212 * fVar151;
    auVar218._20_4_ = fVar238 * fVar259 + fVar302 * fVar143 + fVar141 * fVar301 + fVar223 * fVar154;
    auVar218._24_4_ = fVar240 * fVar294 + fVar304 * fVar146 + fVar119 * fVar303 + fVar225 * fVar157;
    auVar218._28_4_ = fVar327 + fVar329 + fVar227 + 0.0;
    local_320._0_4_ = fVar176 * fVar149 + fVar269 * fVar229 + fVar284 * fVar244 + fVar335 * fVar138;
    local_320._4_4_ = fVar188 * fVar152 + fVar276 * fVar258 + fVar211 * fVar253 + fVar338 * fVar142;
    local_320._8_4_ = fVar189 * fVar155 + fVar278 * fVar210 + fVar174 * fVar255 + fVar339 * fVar145;
    local_320._12_4_ = fVar190 * fVar158 + fVar280 * fVar120 + fVar295 * fVar257 + fVar340 * fVar148
    ;
    local_320._16_4_ = fVar176 * fVar175 + fVar269 * fVar139 + fVar137 * fVar244 + fVar335 * fVar151
    ;
    local_320._20_4_ = fVar188 * fVar259 + fVar276 * fVar143 + fVar141 * fVar253 + fVar338 * fVar154
    ;
    local_320._24_4_ = fVar189 * fVar294 + fVar278 * fVar146 + fVar119 * fVar255 + fVar339 * fVar157
    ;
    local_320._28_4_ = fVar190 + fVar329 + fVar257 + 0.0;
    auVar272._0_4_ = fVar293 * fVar229 + fVar284 * fVar213 + fVar254 * fVar138 + fVar228 * fVar149;
    auVar272._4_4_ = fVar320 * fVar258 + fVar211 * fVar224 + fVar256 * fVar142 + fVar285 * fVar152;
    auVar272._8_4_ = fVar326 * fVar210 + fVar174 * fVar226 + fVar319 * fVar145 + fVar292 * fVar155;
    auVar272._12_4_ =
         fVar327 * fVar120 + fVar295 * auVar121._12_4_ + fVar309 * fVar148 +
         auVar122._12_4_ * fVar158;
    auVar272._16_4_ = fVar293 * fVar139 + fVar137 * fVar213 + fVar254 * fVar151 + fVar228 * fVar175;
    auVar272._20_4_ = fVar320 * fVar143 + fVar141 * fVar224 + fVar256 * fVar154 + fVar285 * fVar259;
    auVar272._24_4_ = fVar326 * fVar146 + fVar119 * fVar226 + fVar319 * fVar157 + fVar292 * fVar294;
    auVar272._28_4_ = fVar329 + fVar309 + fVar257 + fVar190;
    auVar130 = vsubps_avx(auVar218,auVar308);
    auVar19 = vsubps_avx(local_320,auVar313);
    fVar230 = auVar130._0_4_;
    fVar237 = auVar130._4_4_;
    auVar16._4_4_ = auVar313._4_4_ * fVar237;
    auVar16._0_4_ = auVar313._0_4_ * fVar230;
    fVar239 = auVar130._8_4_;
    auVar16._8_4_ = auVar313._8_4_ * fVar239;
    fVar241 = auVar130._12_4_;
    auVar16._12_4_ = auVar313._12_4_ * fVar241;
    fVar243 = auVar130._16_4_;
    auVar16._16_4_ = auVar313._16_4_ * fVar243;
    fVar254 = auVar130._20_4_;
    auVar16._20_4_ = auVar313._20_4_ * fVar254;
    fVar319 = auVar130._24_4_;
    auVar16._24_4_ = auVar313._24_4_ * fVar319;
    auVar16._28_4_ = fVar190;
    fVar191 = auVar19._0_4_;
    fVar203 = auVar19._4_4_;
    auVar20._4_4_ = auVar308._4_4_ * fVar203;
    auVar20._0_4_ = auVar308._0_4_ * fVar191;
    fVar204 = auVar19._8_4_;
    auVar20._8_4_ = auVar308._8_4_ * fVar204;
    fVar206 = auVar19._12_4_;
    auVar20._12_4_ = auVar308._12_4_ * fVar206;
    fVar252 = auVar19._16_4_;
    auVar20._16_4_ = auVar308._16_4_ * fVar252;
    fVar256 = auVar19._20_4_;
    auVar20._20_4_ = auVar308._20_4_ * fVar256;
    fVar309 = auVar19._24_4_;
    auVar20._24_4_ = auVar308._24_4_ * fVar309;
    auVar20._28_4_ = local_320._28_4_;
    auVar20 = vsubps_avx(auVar16,auVar20);
    auVar24._4_4_ = fVar136;
    auVar24._0_4_ = fVar118;
    auVar24._8_4_ = fVar140;
    auVar24._12_4_ = fVar144;
    auVar24._16_4_ = fVar147;
    auVar24._20_4_ = fVar150;
    auVar24._24_4_ = fVar153;
    auVar24._28_4_ = fVar156;
    auVar16 = vmaxps_avx(auVar24,auVar272);
    auVar26._4_4_ = auVar16._4_4_ * auVar16._4_4_ * (fVar237 * fVar237 + fVar203 * fVar203);
    auVar26._0_4_ = auVar16._0_4_ * auVar16._0_4_ * (fVar230 * fVar230 + fVar191 * fVar191);
    auVar26._8_4_ = auVar16._8_4_ * auVar16._8_4_ * (fVar239 * fVar239 + fVar204 * fVar204);
    auVar26._12_4_ = auVar16._12_4_ * auVar16._12_4_ * (fVar241 * fVar241 + fVar206 * fVar206);
    auVar26._16_4_ = auVar16._16_4_ * auVar16._16_4_ * (fVar243 * fVar243 + fVar252 * fVar252);
    auVar26._20_4_ = auVar16._20_4_ * auVar16._20_4_ * (fVar254 * fVar254 + fVar256 * fVar256);
    auVar26._24_4_ = auVar16._24_4_ * auVar16._24_4_ * (fVar319 * fVar319 + fVar309 * fVar309);
    auVar26._28_4_ = auVar19._28_4_ + local_320._28_4_;
    auVar17._4_4_ = auVar20._4_4_ * auVar20._4_4_;
    auVar17._0_4_ = auVar20._0_4_ * auVar20._0_4_;
    auVar17._8_4_ = auVar20._8_4_ * auVar20._8_4_;
    auVar17._12_4_ = auVar20._12_4_ * auVar20._12_4_;
    auVar17._16_4_ = auVar20._16_4_ * auVar20._16_4_;
    auVar17._20_4_ = auVar20._20_4_ * auVar20._20_4_;
    auVar17._24_4_ = auVar20._24_4_ * auVar20._24_4_;
    auVar17._28_4_ = auVar20._28_4_;
    auVar16 = vcmpps_avx(auVar17,auVar26,2);
    auVar194._0_4_ = (float)(int)uVar12;
    auVar194._4_12_ = auVar18._4_12_;
    local_4c0._0_16_ = auVar194;
    auVar18 = vshufps_avx(auVar194,auVar194,0);
    auVar196._16_16_ = auVar18;
    auVar196._0_16_ = auVar18;
    auVar20 = vcmpps_avx(_DAT_01f7b060,auVar196,1);
    auVar202 = ZEXT3264(auVar20);
    auVar18 = vpermilps_avx(auVar162,0xaa);
    register0x00001450 = auVar18;
    _local_160 = auVar18;
    auVar122 = vpermilps_avx(auVar322,0xaa);
    register0x00001550 = auVar122;
    _local_300 = auVar122;
    auVar123 = vpermilps_avx(auVar271,0xaa);
    register0x00001590 = auVar123;
    _local_c0 = auVar123;
    auVar161 = vpermilps_avx(auVar287,0xaa);
    register0x00001310 = auVar161;
    _local_540 = auVar161;
    auVar26 = auVar20 & auVar16;
    _local_760 = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
    local_670 = ZEXT416(uVar111);
    local_680 = ZEXT416(uVar11);
    auVar307 = ZEXT416((uint)(auVar307._0_4_ * 4.7683716e-07));
    local_8a0 = auVar234._0_4_;
    fStack_89c = auVar234._4_4_;
    fStack_898 = auVar234._8_4_;
    fStack_894 = auVar234._12_4_;
    local_880 = auVar183._0_4_;
    fStack_87c = auVar183._4_4_;
    fStack_878 = auVar183._8_4_;
    fStack_874 = auVar183._12_4_;
    local_890 = auVar217._0_4_;
    fStack_88c = auVar217._4_4_;
    fStack_888 = auVar217._8_4_;
    fStack_884 = auVar217._12_4_;
    local_830 = auVar195._0_4_;
    fStack_82c = auVar195._4_4_;
    fStack_828 = auVar195._8_4_;
    fStack_824 = auVar195._12_4_;
    fVar230 = fVar176;
    fVar191 = fVar188;
    fVar237 = fVar189;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0x7f,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar26 >> 0xbf,0) == '\0') &&
        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f]) {
      auVar275 = ZEXT3264(auVar201);
    }
    else {
      local_360 = vandps_avx(auVar16,auVar20);
      fVar285 = auVar18._0_4_;
      fVar292 = auVar18._4_4_;
      fVar329 = auVar18._8_4_;
      fVar293 = auVar18._12_4_;
      fVar320 = auVar122._0_4_;
      fVar326 = auVar122._4_4_;
      fVar327 = auVar122._8_4_;
      fVar328 = auVar122._12_4_;
      fVar330 = auVar123._0_4_;
      fVar332 = auVar123._4_4_;
      fVar333 = auVar123._8_4_;
      fVar334 = auVar123._12_4_;
      fVar213 = auVar161._0_4_;
      fVar224 = auVar161._4_4_;
      fVar226 = auVar161._8_4_;
      fVar228 = auVar161._12_4_;
      fVar203 = auVar20._28_4_ + *(float *)(bspline_basis1 + lVar114 + 0x924) + 0.0;
      local_380._0_4_ =
           fVar285 * fVar149 + fVar320 * fVar229 + fVar330 * fVar284 + fVar213 * fVar138;
      local_380._4_4_ =
           fVar292 * fVar152 + fVar326 * fVar258 + fVar332 * fVar211 + fVar224 * fVar142;
      fStack_378 = fVar329 * fVar155 + fVar327 * fVar210 + fVar333 * fVar174 + fVar226 * fVar145;
      fStack_374 = fVar293 * fVar158 + fVar328 * fVar120 + fVar334 * fVar295 + fVar228 * fVar148;
      fStack_370 = fVar285 * fVar175 + fVar320 * fVar139 + fVar330 * fVar137 + fVar213 * fVar151;
      fStack_36c = fVar292 * fVar259 + fVar326 * fVar143 + fVar332 * fVar141 + fVar224 * fVar154;
      fStack_368 = fVar329 * fVar294 + fVar327 * fVar146 + fVar333 * fVar119 + fVar226 * fVar157;
      fStack_364 = local_360._28_4_ + fVar203;
      local_340._0_4_ = auVar107._0_4_;
      local_340._4_4_ = auVar107._4_4_;
      fStack_338 = auVar107._8_4_;
      local_700._0_4_ = auVar106._0_4_;
      local_700._4_4_ = auVar106._4_4_;
      fStack_6f8 = auVar106._8_4_;
      fStack_6f4 = auVar106._12_4_;
      fStack_6f0 = auVar106._16_4_;
      fStack_6ec = auVar106._20_4_;
      fStack_6e8 = auVar106._24_4_;
      local_6e0 = fVar285 * (float)local_340._0_4_ +
                  fVar320 * fVar279 + fVar330 * fVar205 + fVar213 * (float)local_700._0_4_;
      fStack_6dc = fVar292 * (float)local_340._4_4_ +
                   fVar326 * fVar208 + fVar332 * fVar311 + fVar224 * (float)local_700._4_4_;
      fStack_6d8 = fVar329 * fStack_338 +
                   fVar327 * fVar267 + fVar333 * fVar310 + fVar226 * fStack_6f8;
      fStack_6d4 = fVar293 * fVar283 + fVar328 * fVar281 + fVar334 * fVar270 + fVar228 * fStack_6f4;
      fStack_6d0 = fVar285 * fStack_330 +
                   fVar320 * fVar282 + fVar330 * fVar207 + fVar213 * fStack_6f0;
      fStack_6cc = fVar292 * fStack_32c +
                   fVar326 * fVar209 + fVar332 * fVar266 + fVar224 * fStack_6ec;
      fStack_6c8 = fVar329 * fStack_328 +
                   fVar327 * fVar268 + fVar333 * fVar277 + fVar226 * fStack_6e8;
      fStack_6c4 = fStack_364 + fVar203 + local_360._28_4_ + auVar20._28_4_;
      fVar203 = *(float *)(bspline_basis0 + lVar114 + 0x1210);
      fVar239 = *(float *)(bspline_basis0 + lVar114 + 0x1214);
      fVar204 = *(float *)(bspline_basis0 + lVar114 + 0x1218);
      fVar241 = *(float *)(bspline_basis0 + lVar114 + 0x121c);
      fVar206 = *(float *)(bspline_basis0 + lVar114 + 0x1220);
      fVar243 = *(float *)(bspline_basis0 + lVar114 + 0x1224);
      fVar252 = *(float *)(bspline_basis0 + lVar114 + 0x1228);
      fVar254 = *(float *)(bspline_basis0 + lVar114 + 0x1694);
      fVar256 = *(float *)(bspline_basis0 + lVar114 + 0x1698);
      fVar319 = *(float *)(bspline_basis0 + lVar114 + 0x169c);
      fVar309 = *(float *)(bspline_basis0 + lVar114 + 0x16a0);
      fVar205 = *(float *)(bspline_basis0 + lVar114 + 0x16a4);
      fVar311 = *(float *)(bspline_basis0 + lVar114 + 0x16a8);
      fVar310 = *(float *)(bspline_basis0 + lVar114 + 0x16ac);
      fVar270 = *(float *)(bspline_basis0 + lVar114 + 0x1b18);
      fVar207 = *(float *)(bspline_basis0 + lVar114 + 0x1b1c);
      fVar266 = *(float *)(bspline_basis0 + lVar114 + 0x1b20);
      fVar277 = *(float *)(bspline_basis0 + lVar114 + 0x1b24);
      fVar279 = *(float *)(bspline_basis0 + lVar114 + 0x1b28);
      fVar208 = *(float *)(bspline_basis0 + lVar114 + 0x1b2c);
      fVar267 = *(float *)(bspline_basis0 + lVar114 + 0x1b30);
      fVar281 = *(float *)(bspline_basis0 + lVar114 + 0x1f9c);
      fVar282 = *(float *)(bspline_basis0 + lVar114 + 0x1fa0);
      fVar209 = *(float *)(bspline_basis0 + lVar114 + 0x1fa4);
      fVar268 = *(float *)(bspline_basis0 + lVar114 + 0x1fa8);
      fVar283 = *(float *)(bspline_basis0 + lVar114 + 0x1fac);
      fVar284 = *(float *)(bspline_basis0 + lVar114 + 0x1fb0);
      fVar211 = *(float *)(bspline_basis0 + lVar114 + 0x1fb4);
      local_7e0._0_16_ = auVar307;
      fVar174 = *(float *)(bspline_basis0 + lVar114 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar114 + 0x1fb8);
      fVar295 = *(float *)(bspline_basis0 + lVar114 + 0x16b0) + fVar174;
      local_660 = fVar231 * fVar203 + fVar297 * fVar254 + fVar296 * fVar270 + fVar212 * fVar281;
      fStack_65c = fVar238 * fVar239 + fVar302 * fVar256 + fVar301 * fVar207 + fVar223 * fVar282;
      fStack_658 = fVar240 * fVar204 + fVar304 * fVar319 + fVar303 * fVar266 + fVar225 * fVar209;
      fStack_654 = fVar242 * fVar241 + fVar306 * fVar309 + fVar305 * fVar277 + fVar227 * fVar268;
      fStack_650 = fVar231 * fVar206 + fVar297 * fVar205 + fVar296 * fVar279 + fVar212 * fVar283;
      fStack_64c = fVar238 * fVar243 + fVar302 * fVar311 + fVar301 * fVar208 + fVar223 * fVar284;
      fStack_648 = fVar240 * fVar252 + fVar304 * fVar310 + fVar303 * fVar267 + fVar225 * fVar211;
      fStack_644 = *(float *)(bspline_basis0 + lVar114 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar114 + 0x1fb8) +
                   fVar293 + *(float *)(bspline_basis1 + lVar114 + 0x4a0);
      auVar165._0_4_ = fVar176 * fVar203 + fVar244 * fVar270 + fVar335 * fVar281 + fVar269 * fVar254
      ;
      auVar165._4_4_ = fVar188 * fVar239 + fVar253 * fVar207 + fVar338 * fVar282 + fVar276 * fVar256
      ;
      auVar165._8_4_ = fVar189 * fVar204 + fVar255 * fVar266 + fVar339 * fVar209 + fVar278 * fVar319
      ;
      auVar165._12_4_ =
           fVar190 * fVar241 + fVar257 * fVar277 + fVar340 * fVar268 + fVar280 * fVar309;
      auVar165._16_4_ =
           fVar176 * fVar206 + fVar244 * fVar279 + fVar335 * fVar283 + fVar269 * fVar205;
      auVar165._20_4_ =
           fVar188 * fVar243 + fVar253 * fVar208 + fVar338 * fVar284 + fVar276 * fVar311;
      auVar165._24_4_ =
           fVar189 * fVar252 + fVar255 * fVar267 + fVar339 * fVar211 + fVar278 * fVar310;
      auVar165._28_4_ =
           fVar174 + fVar293 + *(float *)(bspline_basis1 + lVar114 + 0x1c) +
                     fVar293 + *(float *)(bspline_basis1 + lVar114 + 0x4a0);
      auVar247._0_4_ = fVar320 * fVar254 + fVar330 * fVar270 + fVar213 * fVar281 + fVar285 * fVar203
      ;
      auVar247._4_4_ = fVar326 * fVar256 + fVar332 * fVar207 + fVar224 * fVar282 + fVar292 * fVar239
      ;
      auVar247._8_4_ = fVar327 * fVar319 + fVar333 * fVar266 + fVar226 * fVar209 + fVar329 * fVar204
      ;
      auVar247._12_4_ =
           fVar328 * fVar309 + fVar334 * fVar277 + fVar228 * fVar268 + fVar293 * fVar241;
      auVar247._16_4_ =
           fVar320 * fVar205 + fVar330 * fVar279 + fVar213 * fVar283 + fVar285 * fVar206;
      auVar247._20_4_ =
           fVar326 * fVar311 + fVar332 * fVar208 + fVar224 * fVar284 + fVar292 * fVar243;
      auVar247._24_4_ =
           fVar327 * fVar310 + fVar333 * fVar267 + fVar226 * fVar211 + fVar329 * fVar252;
      auVar247._28_4_ = fVar295 + *(float *)(bspline_basis0 + lVar114 + 0x122c);
      fVar203 = *(float *)(bspline_basis1 + lVar114 + 0x1b18);
      fVar239 = *(float *)(bspline_basis1 + lVar114 + 0x1b1c);
      fVar204 = *(float *)(bspline_basis1 + lVar114 + 0x1b20);
      fVar241 = *(float *)(bspline_basis1 + lVar114 + 0x1b24);
      fVar206 = *(float *)(bspline_basis1 + lVar114 + 0x1b28);
      fVar243 = *(float *)(bspline_basis1 + lVar114 + 0x1b2c);
      fVar252 = *(float *)(bspline_basis1 + lVar114 + 0x1b30);
      fVar254 = *(float *)(bspline_basis1 + lVar114 + 0x1f9c);
      fVar256 = *(float *)(bspline_basis1 + lVar114 + 0x1fa0);
      fVar319 = *(float *)(bspline_basis1 + lVar114 + 0x1fa4);
      fVar309 = *(float *)(bspline_basis1 + lVar114 + 0x1fa8);
      fVar205 = *(float *)(bspline_basis1 + lVar114 + 0x1fac);
      fVar311 = *(float *)(bspline_basis1 + lVar114 + 0x1fb0);
      fVar310 = *(float *)(bspline_basis1 + lVar114 + 0x1fb4);
      fVar270 = *(float *)(bspline_basis1 + lVar114 + 0x1694);
      fVar207 = *(float *)(bspline_basis1 + lVar114 + 0x1698);
      fVar266 = *(float *)(bspline_basis1 + lVar114 + 0x169c);
      fVar277 = *(float *)(bspline_basis1 + lVar114 + 0x16a0);
      fVar279 = *(float *)(bspline_basis1 + lVar114 + 0x16a4);
      fVar208 = *(float *)(bspline_basis1 + lVar114 + 0x16a8);
      fVar267 = *(float *)(bspline_basis1 + lVar114 + 0x16ac);
      fVar281 = *(float *)(bspline_basis1 + lVar114 + 0x1210);
      fVar282 = *(float *)(bspline_basis1 + lVar114 + 0x1214);
      fVar209 = *(float *)(bspline_basis1 + lVar114 + 0x1218);
      fVar268 = *(float *)(bspline_basis1 + lVar114 + 0x121c);
      fVar283 = *(float *)(bspline_basis1 + lVar114 + 0x1220);
      fVar284 = *(float *)(bspline_basis1 + lVar114 + 0x1224);
      fVar211 = *(float *)(bspline_basis1 + lVar114 + 0x1228);
      auVar263._0_4_ = fVar231 * fVar281 + fVar297 * fVar270 + fVar296 * fVar203 + fVar212 * fVar254
      ;
      auVar263._4_4_ = fVar238 * fVar282 + fVar302 * fVar207 + fVar301 * fVar239 + fVar223 * fVar256
      ;
      auVar263._8_4_ = fVar240 * fVar209 + fVar304 * fVar266 + fVar303 * fVar204 + fVar225 * fVar319
      ;
      auVar263._12_4_ =
           fVar242 * fVar268 + fVar306 * fVar277 + fVar305 * fVar241 + fVar227 * fVar309;
      auVar263._16_4_ =
           fVar231 * fVar283 + fVar297 * fVar279 + fVar296 * fVar206 + fVar212 * fVar205;
      auVar263._20_4_ =
           fVar238 * fVar284 + fVar302 * fVar208 + fVar301 * fVar243 + fVar223 * fVar311;
      auVar263._24_4_ =
           fVar240 * fVar211 + fVar304 * fVar267 + fVar303 * fVar252 + fVar225 * fVar310;
      auVar263._28_4_ = fVar257 + fVar257 + fVar295 + fVar227;
      auVar288._0_4_ = fVar176 * fVar281 + fVar269 * fVar270 + fVar244 * fVar203 + fVar335 * fVar254
      ;
      auVar288._4_4_ = fVar188 * fVar282 + fVar276 * fVar207 + fVar253 * fVar239 + fVar338 * fVar256
      ;
      auVar288._8_4_ = fVar189 * fVar209 + fVar278 * fVar266 + fVar255 * fVar204 + fVar339 * fVar319
      ;
      auVar288._12_4_ =
           fVar190 * fVar268 + fVar280 * fVar277 + fVar257 * fVar241 + fVar340 * fVar309;
      auVar288._16_4_ =
           fVar176 * fVar283 + fVar269 * fVar279 + fVar244 * fVar206 + fVar335 * fVar205;
      auVar288._20_4_ =
           fVar188 * fVar284 + fVar276 * fVar208 + fVar253 * fVar243 + fVar338 * fVar311;
      auVar288._24_4_ =
           fVar189 * fVar211 + fVar278 * fVar267 + fVar255 * fVar252 + fVar339 * fVar310;
      auVar288._28_4_ = fVar257 + fVar257 + fVar257 + fVar295;
      auVar187._0_4_ = fVar285 * fVar281 + fVar320 * fVar270 + fVar330 * fVar203 + fVar254 * fVar213
      ;
      auVar187._4_4_ = fVar292 * fVar282 + fVar326 * fVar207 + fVar332 * fVar239 + fVar256 * fVar224
      ;
      auVar187._8_4_ = fVar329 * fVar209 + fVar327 * fVar266 + fVar333 * fVar204 + fVar319 * fVar226
      ;
      auVar187._12_4_ =
           fVar293 * fVar268 + fVar328 * fVar277 + fVar334 * fVar241 + fVar309 * fVar228;
      auVar187._16_4_ =
           fVar285 * fVar283 + fVar320 * fVar279 + fVar330 * fVar206 + fVar205 * fVar213;
      auVar187._20_4_ =
           fVar292 * fVar284 + fVar326 * fVar208 + fVar332 * fVar243 + fVar311 * fVar224;
      auVar187._24_4_ =
           fVar329 * fVar211 + fVar327 * fVar267 + fVar333 * fVar252 + fVar310 * fVar226;
      auVar187._28_4_ =
           *(float *)(bspline_basis1 + lVar114 + 0x122c) +
           *(float *)(bspline_basis1 + lVar114 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar114 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar114 + 0x1fb8);
      auVar219._8_4_ = 0x7fffffff;
      auVar219._0_8_ = 0x7fffffff7fffffff;
      auVar219._12_4_ = 0x7fffffff;
      auVar219._16_4_ = 0x7fffffff;
      auVar219._20_4_ = 0x7fffffff;
      auVar219._24_4_ = 0x7fffffff;
      auVar219._28_4_ = 0x7fffffff;
      auVar104._4_4_ = fStack_65c;
      auVar104._0_4_ = local_660;
      auVar104._8_4_ = fStack_658;
      auVar104._12_4_ = fStack_654;
      auVar104._16_4_ = fStack_650;
      auVar104._20_4_ = fStack_64c;
      auVar104._24_4_ = fStack_648;
      auVar104._28_4_ = fStack_644;
      auVar16 = vandps_avx(auVar104,auVar219);
      auVar20 = vandps_avx(auVar165,auVar219);
      auVar20 = vmaxps_avx(auVar16,auVar20);
      auVar16 = vandps_avx(auVar247,auVar219);
      auVar16 = vmaxps_avx(auVar20,auVar16);
      auVar234 = vpermilps_avx(auVar307,0);
      auVar248._16_16_ = auVar234;
      auVar248._0_16_ = auVar234;
      auVar16 = vcmpps_avx(auVar16,auVar248,1);
      auVar26 = vblendvps_avx(auVar104,auVar130,auVar16);
      auVar17 = vblendvps_avx(auVar165,auVar19,auVar16);
      auVar16 = vandps_avx(auVar263,auVar219);
      auVar20 = vandps_avx(auVar288,auVar219);
      auVar24 = vmaxps_avx(auVar16,auVar20);
      auVar16 = vandps_avx(auVar187,auVar219);
      auVar16 = vmaxps_avx(auVar24,auVar16);
      auVar24 = vcmpps_avx(auVar16,auVar248,1);
      auVar16 = vblendvps_avx(auVar263,auVar130,auVar24);
      auVar130 = vblendvps_avx(auVar288,auVar19,auVar24);
      fVar295 = auVar26._0_4_;
      fVar137 = auVar26._4_4_;
      fVar141 = auVar26._8_4_;
      fVar119 = auVar26._12_4_;
      fVar138 = auVar26._16_4_;
      fVar142 = auVar26._20_4_;
      fVar145 = auVar26._24_4_;
      fVar148 = auVar16._0_4_;
      fVar151 = auVar16._4_4_;
      fVar154 = auVar16._8_4_;
      fVar157 = auVar16._12_4_;
      fVar229 = auVar16._16_4_;
      fVar258 = auVar16._20_4_;
      fVar210 = auVar16._24_4_;
      fVar120 = -auVar16._28_4_;
      fVar203 = auVar17._0_4_;
      fVar206 = auVar17._4_4_;
      fVar256 = auVar17._8_4_;
      fVar311 = auVar17._12_4_;
      fVar266 = auVar17._16_4_;
      fVar267 = auVar17._20_4_;
      fVar268 = auVar17._24_4_;
      auVar126._0_4_ = fVar203 * fVar203 + fVar295 * fVar295;
      auVar126._4_4_ = fVar206 * fVar206 + fVar137 * fVar137;
      auVar126._8_4_ = fVar256 * fVar256 + fVar141 * fVar141;
      auVar126._12_4_ = fVar311 * fVar311 + fVar119 * fVar119;
      auVar126._16_4_ = fVar266 * fVar266 + fVar138 * fVar138;
      auVar126._20_4_ = fVar267 * fVar267 + fVar142 * fVar142;
      auVar126._24_4_ = fVar268 * fVar268 + fVar145 * fVar145;
      auVar126._28_4_ = auVar288._28_4_ + auVar26._28_4_;
      auVar19 = vrsqrtps_avx(auVar126);
      fVar239 = auVar19._0_4_;
      fVar204 = auVar19._4_4_;
      auVar25._4_4_ = fVar204 * 1.5;
      auVar25._0_4_ = fVar239 * 1.5;
      fVar241 = auVar19._8_4_;
      auVar25._8_4_ = fVar241 * 1.5;
      fVar243 = auVar19._12_4_;
      auVar25._12_4_ = fVar243 * 1.5;
      fVar252 = auVar19._16_4_;
      auVar25._16_4_ = fVar252 * 1.5;
      fVar254 = auVar19._20_4_;
      auVar25._20_4_ = fVar254 * 1.5;
      fVar319 = auVar19._24_4_;
      fVar174 = auVar20._28_4_;
      auVar25._24_4_ = fVar319 * 1.5;
      auVar25._28_4_ = fVar174;
      auVar19._4_4_ = fVar204 * fVar204 * fVar204 * auVar126._4_4_ * 0.5;
      auVar19._0_4_ = fVar239 * fVar239 * fVar239 * auVar126._0_4_ * 0.5;
      auVar19._8_4_ = fVar241 * fVar241 * fVar241 * auVar126._8_4_ * 0.5;
      auVar19._12_4_ = fVar243 * fVar243 * fVar243 * auVar126._12_4_ * 0.5;
      auVar19._16_4_ = fVar252 * fVar252 * fVar252 * auVar126._16_4_ * 0.5;
      auVar19._20_4_ = fVar254 * fVar254 * fVar254 * auVar126._20_4_ * 0.5;
      auVar19._24_4_ = fVar319 * fVar319 * fVar319 * auVar126._24_4_ * 0.5;
      auVar19._28_4_ = auVar126._28_4_;
      auVar20 = vsubps_avx(auVar25,auVar19);
      fVar239 = auVar20._0_4_;
      fVar243 = auVar20._4_4_;
      fVar319 = auVar20._8_4_;
      fVar310 = auVar20._12_4_;
      fVar277 = auVar20._16_4_;
      fVar281 = auVar20._20_4_;
      fVar283 = auVar20._24_4_;
      fVar204 = auVar130._0_4_;
      fVar252 = auVar130._4_4_;
      fVar309 = auVar130._8_4_;
      fVar270 = auVar130._12_4_;
      fVar279 = auVar130._16_4_;
      fVar282 = auVar130._20_4_;
      fVar284 = auVar130._24_4_;
      auVar127._0_4_ = fVar204 * fVar204 + fVar148 * fVar148;
      auVar127._4_4_ = fVar252 * fVar252 + fVar151 * fVar151;
      auVar127._8_4_ = fVar309 * fVar309 + fVar154 * fVar154;
      auVar127._12_4_ = fVar270 * fVar270 + fVar157 * fVar157;
      auVar127._16_4_ = fVar279 * fVar279 + fVar229 * fVar229;
      auVar127._20_4_ = fVar282 * fVar282 + fVar258 * fVar258;
      auVar127._24_4_ = fVar284 * fVar284 + fVar210 * fVar210;
      auVar127._28_4_ = auVar16._28_4_ + auVar20._28_4_;
      auVar16 = vrsqrtps_avx(auVar127);
      fVar241 = auVar16._0_4_;
      fVar254 = auVar16._4_4_;
      auVar21._4_4_ = fVar254 * 1.5;
      auVar21._0_4_ = fVar241 * 1.5;
      fVar205 = auVar16._8_4_;
      auVar21._8_4_ = fVar205 * 1.5;
      fVar207 = auVar16._12_4_;
      auVar21._12_4_ = fVar207 * 1.5;
      fVar208 = auVar16._16_4_;
      auVar21._16_4_ = fVar208 * 1.5;
      fVar209 = auVar16._20_4_;
      auVar21._20_4_ = fVar209 * 1.5;
      fVar211 = auVar16._24_4_;
      auVar21._24_4_ = fVar211 * 1.5;
      auVar21._28_4_ = fVar174;
      auVar22._4_4_ = fVar254 * fVar254 * fVar254 * auVar127._4_4_ * 0.5;
      auVar22._0_4_ = fVar241 * fVar241 * fVar241 * auVar127._0_4_ * 0.5;
      auVar22._8_4_ = fVar205 * fVar205 * fVar205 * auVar127._8_4_ * 0.5;
      auVar22._12_4_ = fVar207 * fVar207 * fVar207 * auVar127._12_4_ * 0.5;
      auVar22._16_4_ = fVar208 * fVar208 * fVar208 * auVar127._16_4_ * 0.5;
      auVar22._20_4_ = fVar209 * fVar209 * fVar209 * auVar127._20_4_ * 0.5;
      auVar22._24_4_ = fVar211 * fVar211 * fVar211 * auVar127._24_4_ * 0.5;
      auVar22._28_4_ = auVar127._28_4_;
      auVar16 = vsubps_avx(auVar21,auVar22);
      fVar241 = auVar16._0_4_;
      fVar254 = auVar16._4_4_;
      fVar205 = auVar16._8_4_;
      fVar207 = auVar16._12_4_;
      fVar208 = auVar16._16_4_;
      fVar209 = auVar16._20_4_;
      fVar211 = auVar16._24_4_;
      fVar203 = fVar118 * fVar203 * fVar239;
      fVar206 = fVar136 * fVar206 * fVar243;
      auVar23._4_4_ = fVar206;
      auVar23._0_4_ = fVar203;
      fVar256 = fVar140 * fVar256 * fVar319;
      auVar23._8_4_ = fVar256;
      fVar311 = fVar144 * fVar311 * fVar310;
      auVar23._12_4_ = fVar311;
      fVar266 = fVar147 * fVar266 * fVar277;
      auVar23._16_4_ = fVar266;
      fVar267 = fVar150 * fVar267 * fVar281;
      auVar23._20_4_ = fVar267;
      fVar268 = fVar153 * fVar268 * fVar283;
      auVar23._24_4_ = fVar268;
      auVar23._28_4_ = fVar120;
      local_700._4_4_ = auVar308._4_4_ + fVar206;
      local_700._0_4_ = auVar308._0_4_ + fVar203;
      fStack_6f8 = auVar308._8_4_ + fVar256;
      fStack_6f4 = auVar308._12_4_ + fVar311;
      fStack_6f0 = auVar308._16_4_ + fVar266;
      fStack_6ec = auVar308._20_4_ + fVar267;
      fStack_6e8 = auVar308._24_4_ + fVar268;
      fStack_6e4 = auVar308._28_4_ + fVar120;
      fVar203 = fVar118 * fVar239 * -fVar295;
      fVar206 = fVar136 * fVar243 * -fVar137;
      auVar27._4_4_ = fVar206;
      auVar27._0_4_ = fVar203;
      fVar256 = fVar140 * fVar319 * -fVar141;
      auVar27._8_4_ = fVar256;
      fVar311 = fVar144 * fVar310 * -fVar119;
      auVar27._12_4_ = fVar311;
      fVar266 = fVar147 * fVar277 * -fVar138;
      auVar27._16_4_ = fVar266;
      fVar267 = fVar150 * fVar281 * -fVar142;
      auVar27._20_4_ = fVar267;
      fVar268 = fVar153 * fVar283 * -fVar145;
      auVar27._24_4_ = fVar268;
      auVar27._28_4_ = fVar174;
      local_560._4_4_ = fVar206 + auVar313._4_4_;
      local_560._0_4_ = fVar203 + auVar313._0_4_;
      fStack_558 = fVar256 + auVar313._8_4_;
      fStack_554 = fVar311 + auVar313._12_4_;
      fStack_550 = fVar266 + auVar313._16_4_;
      fStack_54c = fVar267 + auVar313._20_4_;
      fStack_548 = fVar268 + auVar313._24_4_;
      fStack_544 = fVar174 + 0.0;
      fVar203 = fVar118 * fVar239 * 0.0;
      fVar239 = fVar136 * fVar243 * 0.0;
      auVar28._4_4_ = fVar239;
      auVar28._0_4_ = fVar203;
      fVar206 = fVar140 * fVar319 * 0.0;
      auVar28._8_4_ = fVar206;
      fVar243 = fVar144 * fVar310 * 0.0;
      auVar28._12_4_ = fVar243;
      fVar256 = fVar147 * fVar277 * 0.0;
      auVar28._16_4_ = fVar256;
      fVar319 = fVar150 * fVar281 * 0.0;
      auVar28._20_4_ = fVar319;
      fVar311 = fVar153 * fVar283 * 0.0;
      auVar28._24_4_ = fVar311;
      auVar28._28_4_ = fVar306;
      auVar102._4_4_ = fStack_6dc;
      auVar102._0_4_ = local_6e0;
      auVar102._8_4_ = fStack_6d8;
      auVar102._12_4_ = fStack_6d4;
      auVar102._16_4_ = fStack_6d0;
      auVar102._20_4_ = fStack_6cc;
      auVar102._24_4_ = fStack_6c8;
      auVar102._28_4_ = fStack_6c4;
      auVar249._0_4_ = fVar203 + local_6e0;
      auVar249._4_4_ = fVar239 + fStack_6dc;
      auVar249._8_4_ = fVar206 + fStack_6d8;
      auVar249._12_4_ = fVar243 + fStack_6d4;
      auVar249._16_4_ = fVar256 + fStack_6d0;
      auVar249._20_4_ = fVar319 + fStack_6cc;
      auVar249._24_4_ = fVar311 + fStack_6c8;
      auVar249._28_4_ = fVar306 + fStack_6c4;
      fVar203 = auVar272._0_4_ * fVar204 * fVar241;
      fVar239 = auVar272._4_4_ * fVar252 * fVar254;
      auVar29._4_4_ = fVar239;
      auVar29._0_4_ = fVar203;
      fVar204 = auVar272._8_4_ * fVar309 * fVar205;
      auVar29._8_4_ = fVar204;
      fVar206 = auVar272._12_4_ * fVar270 * fVar207;
      auVar29._12_4_ = fVar206;
      fVar243 = auVar272._16_4_ * fVar279 * fVar208;
      auVar29._16_4_ = fVar243;
      fVar252 = auVar272._20_4_ * fVar282 * fVar209;
      auVar29._20_4_ = fVar252;
      fVar256 = auVar272._24_4_ * fVar284 * fVar211;
      auVar29._24_4_ = fVar256;
      auVar29._28_4_ = auVar130._28_4_;
      auVar24 = vsubps_avx(auVar308,auVar23);
      auVar289._0_4_ = auVar218._0_4_ + fVar203;
      auVar289._4_4_ = auVar218._4_4_ + fVar239;
      auVar289._8_4_ = auVar218._8_4_ + fVar204;
      auVar289._12_4_ = auVar218._12_4_ + fVar206;
      auVar289._16_4_ = auVar218._16_4_ + fVar243;
      auVar289._20_4_ = auVar218._20_4_ + fVar252;
      auVar289._24_4_ = auVar218._24_4_ + fVar256;
      auVar289._28_4_ = auVar218._28_4_ + auVar130._28_4_;
      fVar203 = auVar272._0_4_ * fVar241 * -fVar148;
      fVar239 = auVar272._4_4_ * fVar254 * -fVar151;
      auVar130._4_4_ = fVar239;
      auVar130._0_4_ = fVar203;
      fVar204 = auVar272._8_4_ * fVar205 * -fVar154;
      auVar130._8_4_ = fVar204;
      fVar206 = auVar272._12_4_ * fVar207 * -fVar157;
      auVar130._12_4_ = fVar206;
      fVar243 = auVar272._16_4_ * fVar208 * -fVar229;
      auVar130._16_4_ = fVar243;
      fVar252 = auVar272._20_4_ * fVar209 * -fVar258;
      auVar130._20_4_ = fVar252;
      fVar256 = auVar272._24_4_ * fVar211 * -fVar210;
      auVar130._24_4_ = fVar256;
      auVar130._28_4_ = fVar328;
      auVar196 = vsubps_avx(auVar313,auVar27);
      auVar298._0_4_ = fVar203 + local_320._0_4_;
      auVar298._4_4_ = fVar239 + local_320._4_4_;
      auVar298._8_4_ = fVar204 + local_320._8_4_;
      auVar298._12_4_ = fVar206 + local_320._12_4_;
      auVar298._16_4_ = fVar243 + local_320._16_4_;
      auVar298._20_4_ = fVar252 + local_320._20_4_;
      auVar298._24_4_ = fVar256 + local_320._24_4_;
      auVar298._28_4_ = fVar328 + local_320._28_4_;
      fVar203 = auVar272._0_4_ * fVar241 * 0.0;
      fVar239 = auVar272._4_4_ * fVar254 * 0.0;
      auVar30._4_4_ = fVar239;
      auVar30._0_4_ = fVar203;
      fVar204 = auVar272._8_4_ * fVar205 * 0.0;
      auVar30._8_4_ = fVar204;
      fVar241 = auVar272._12_4_ * fVar207 * 0.0;
      auVar30._12_4_ = fVar241;
      fVar206 = auVar272._16_4_ * fVar208 * 0.0;
      auVar30._16_4_ = fVar206;
      fVar243 = auVar272._20_4_ * fVar209 * 0.0;
      auVar30._20_4_ = fVar243;
      fVar252 = auVar272._24_4_ * fVar211 * 0.0;
      auVar30._24_4_ = fVar252;
      auVar30._28_4_ = 0x3f000000;
      auVar25 = vsubps_avx(auVar102,auVar28);
      auVar331._0_4_ = fVar203 + (float)local_380._0_4_;
      auVar331._4_4_ = fVar239 + (float)local_380._4_4_;
      auVar331._8_4_ = fVar204 + fStack_378;
      auVar331._12_4_ = fVar241 + fStack_374;
      auVar331._16_4_ = fVar206 + fStack_370;
      auVar331._20_4_ = fVar243 + fStack_36c;
      auVar331._24_4_ = fVar252 + fStack_368;
      auVar331._28_4_ = fStack_364 + 0.5;
      auVar16 = vsubps_avx(auVar218,auVar29);
      auVar20 = vsubps_avx(local_320,auVar130);
      auVar21 = vsubps_avx(_local_380,auVar30);
      auVar130 = vsubps_avx(auVar298,auVar196);
      auVar19 = vsubps_avx(auVar331,auVar25);
      auVar31._4_4_ = auVar25._4_4_ * auVar130._4_4_;
      auVar31._0_4_ = auVar25._0_4_ * auVar130._0_4_;
      auVar31._8_4_ = auVar25._8_4_ * auVar130._8_4_;
      auVar31._12_4_ = auVar25._12_4_ * auVar130._12_4_;
      auVar31._16_4_ = auVar25._16_4_ * auVar130._16_4_;
      auVar31._20_4_ = auVar25._20_4_ * auVar130._20_4_;
      auVar31._24_4_ = auVar25._24_4_ * auVar130._24_4_;
      auVar31._28_4_ = fVar293;
      auVar32._4_4_ = auVar196._4_4_ * auVar19._4_4_;
      auVar32._0_4_ = auVar196._0_4_ * auVar19._0_4_;
      auVar32._8_4_ = auVar196._8_4_ * auVar19._8_4_;
      auVar32._12_4_ = auVar196._12_4_ * auVar19._12_4_;
      auVar32._16_4_ = auVar196._16_4_ * auVar19._16_4_;
      auVar32._20_4_ = auVar196._20_4_ * auVar19._20_4_;
      auVar32._24_4_ = auVar196._24_4_ * auVar19._24_4_;
      auVar32._28_4_ = local_320._28_4_;
      auVar26 = vsubps_avx(auVar32,auVar31);
      auVar33._4_4_ = auVar24._4_4_ * auVar19._4_4_;
      auVar33._0_4_ = auVar24._0_4_ * auVar19._0_4_;
      auVar33._8_4_ = auVar24._8_4_ * auVar19._8_4_;
      auVar33._12_4_ = auVar24._12_4_ * auVar19._12_4_;
      auVar33._16_4_ = auVar24._16_4_ * auVar19._16_4_;
      auVar33._20_4_ = auVar24._20_4_ * auVar19._20_4_;
      auVar33._24_4_ = auVar24._24_4_ * auVar19._24_4_;
      auVar33._28_4_ = auVar19._28_4_;
      auVar17 = vsubps_avx(auVar289,auVar24);
      auVar34._4_4_ = auVar25._4_4_ * auVar17._4_4_;
      auVar34._0_4_ = auVar25._0_4_ * auVar17._0_4_;
      auVar34._8_4_ = auVar25._8_4_ * auVar17._8_4_;
      auVar34._12_4_ = auVar25._12_4_ * auVar17._12_4_;
      auVar34._16_4_ = auVar25._16_4_ * auVar17._16_4_;
      auVar34._20_4_ = auVar25._20_4_ * auVar17._20_4_;
      auVar34._24_4_ = auVar25._24_4_ * auVar17._24_4_;
      auVar34._28_4_ = auVar218._28_4_;
      auVar218 = vsubps_avx(auVar34,auVar33);
      auVar35._4_4_ = auVar17._4_4_ * auVar196._4_4_;
      auVar35._0_4_ = auVar17._0_4_ * auVar196._0_4_;
      auVar35._8_4_ = auVar17._8_4_ * auVar196._8_4_;
      auVar35._12_4_ = auVar17._12_4_ * auVar196._12_4_;
      auVar35._16_4_ = auVar17._16_4_ * auVar196._16_4_;
      auVar35._20_4_ = auVar17._20_4_ * auVar196._20_4_;
      auVar35._24_4_ = auVar17._24_4_ * auVar196._24_4_;
      auVar35._28_4_ = auVar19._28_4_;
      auVar36._4_4_ = auVar24._4_4_ * auVar130._4_4_;
      auVar36._0_4_ = auVar24._0_4_ * auVar130._0_4_;
      auVar36._8_4_ = auVar24._8_4_ * auVar130._8_4_;
      auVar36._12_4_ = auVar24._12_4_ * auVar130._12_4_;
      auVar36._16_4_ = auVar24._16_4_ * auVar130._16_4_;
      auVar36._20_4_ = auVar24._20_4_ * auVar130._20_4_;
      auVar36._24_4_ = auVar24._24_4_ * auVar130._24_4_;
      auVar36._28_4_ = auVar130._28_4_;
      auVar130 = vsubps_avx(auVar36,auVar35);
      auVar128._0_4_ = auVar26._0_4_ * 0.0 + auVar130._0_4_ + auVar218._0_4_ * 0.0;
      auVar128._4_4_ = auVar26._4_4_ * 0.0 + auVar130._4_4_ + auVar218._4_4_ * 0.0;
      auVar128._8_4_ = auVar26._8_4_ * 0.0 + auVar130._8_4_ + auVar218._8_4_ * 0.0;
      auVar128._12_4_ = auVar26._12_4_ * 0.0 + auVar130._12_4_ + auVar218._12_4_ * 0.0;
      auVar128._16_4_ = auVar26._16_4_ * 0.0 + auVar130._16_4_ + auVar218._16_4_ * 0.0;
      auVar128._20_4_ = auVar26._20_4_ * 0.0 + auVar130._20_4_ + auVar218._20_4_ * 0.0;
      auVar128._24_4_ = auVar26._24_4_ * 0.0 + auVar130._24_4_ + auVar218._24_4_ * 0.0;
      auVar128._28_4_ = auVar130._28_4_ + auVar130._28_4_ + auVar218._28_4_;
      auVar313 = vcmpps_avx(auVar128,ZEXT432(0) << 0x20,2);
      auVar16 = vblendvps_avx(auVar16,_local_700,auVar313);
      auVar20 = vblendvps_avx(auVar20,_local_560,auVar313);
      auVar130 = vblendvps_avx(auVar21,auVar249,auVar313);
      auVar19 = vblendvps_avx(auVar24,auVar289,auVar313);
      auVar26 = vblendvps_avx(auVar196,auVar298,auVar313);
      auVar17 = vblendvps_avx(auVar25,auVar331,auVar313);
      auVar24 = vblendvps_avx(auVar289,auVar24,auVar313);
      auVar196 = vblendvps_avx(auVar298,auVar196,auVar313);
      auVar234 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
      auStack_690 = auVar308._16_16_;
      auVar218 = vblendvps_avx(auVar331,auVar25,auVar313);
      auVar24 = vsubps_avx(auVar24,auVar16);
      auVar308 = vsubps_avx(auVar196,auVar20);
      auVar218 = vsubps_avx(auVar218,auVar130);
      auVar25 = vsubps_avx(auVar20,auVar26);
      fVar203 = auVar308._0_4_;
      fVar145 = auVar130._0_4_;
      fVar243 = auVar308._4_4_;
      fVar148 = auVar130._4_4_;
      auVar37._4_4_ = fVar148 * fVar243;
      auVar37._0_4_ = fVar145 * fVar203;
      fVar309 = auVar308._8_4_;
      fVar151 = auVar130._8_4_;
      auVar37._8_4_ = fVar151 * fVar309;
      fVar207 = auVar308._12_4_;
      fVar154 = auVar130._12_4_;
      auVar37._12_4_ = fVar154 * fVar207;
      fVar267 = auVar308._16_4_;
      fVar157 = auVar130._16_4_;
      auVar37._16_4_ = fVar157 * fVar267;
      fVar283 = auVar308._20_4_;
      fVar229 = auVar130._20_4_;
      auVar37._20_4_ = fVar229 * fVar283;
      fVar137 = auVar308._24_4_;
      fVar258 = auVar130._24_4_;
      auVar37._24_4_ = fVar258 * fVar137;
      auVar37._28_4_ = auVar196._28_4_;
      fVar239 = auVar20._0_4_;
      fVar155 = auVar218._0_4_;
      fVar252 = auVar20._4_4_;
      fVar158 = auVar218._4_4_;
      auVar38._4_4_ = fVar158 * fVar252;
      auVar38._0_4_ = fVar155 * fVar239;
      fVar205 = auVar20._8_4_;
      fVar175 = auVar218._8_4_;
      auVar38._8_4_ = fVar175 * fVar205;
      fVar266 = auVar20._12_4_;
      fVar259 = auVar218._12_4_;
      auVar38._12_4_ = fVar259 * fVar266;
      fVar281 = auVar20._16_4_;
      fVar294 = auVar218._16_4_;
      auVar38._16_4_ = fVar294 * fVar281;
      fVar284 = auVar20._20_4_;
      fVar212 = auVar218._20_4_;
      auVar38._20_4_ = fVar212 * fVar284;
      fVar141 = auVar20._24_4_;
      fVar223 = auVar218._24_4_;
      uVar9 = auVar21._28_4_;
      auVar38._24_4_ = fVar223 * fVar141;
      auVar38._28_4_ = uVar9;
      auVar196 = vsubps_avx(auVar38,auVar37);
      fVar204 = auVar16._0_4_;
      fVar254 = auVar16._4_4_;
      auVar39._4_4_ = fVar158 * fVar254;
      auVar39._0_4_ = fVar155 * fVar204;
      fVar311 = auVar16._8_4_;
      auVar39._8_4_ = fVar175 * fVar311;
      fVar277 = auVar16._12_4_;
      auVar39._12_4_ = fVar259 * fVar277;
      fVar282 = auVar16._16_4_;
      auVar39._16_4_ = fVar294 * fVar282;
      fVar211 = auVar16._20_4_;
      auVar39._20_4_ = fVar212 * fVar211;
      fVar119 = auVar16._24_4_;
      auVar39._24_4_ = fVar223 * fVar119;
      auVar39._28_4_ = uVar9;
      fVar241 = auVar24._0_4_;
      fVar256 = auVar24._4_4_;
      auVar40._4_4_ = fVar148 * fVar256;
      auVar40._0_4_ = fVar145 * fVar241;
      fVar310 = auVar24._8_4_;
      auVar40._8_4_ = fVar151 * fVar310;
      fVar279 = auVar24._12_4_;
      auVar40._12_4_ = fVar154 * fVar279;
      fVar209 = auVar24._16_4_;
      auVar40._16_4_ = fVar157 * fVar209;
      fVar174 = auVar24._20_4_;
      auVar40._20_4_ = fVar229 * fVar174;
      fVar138 = auVar24._24_4_;
      auVar40._24_4_ = fVar258 * fVar138;
      auVar40._28_4_ = auVar331._28_4_;
      auVar21 = vsubps_avx(auVar40,auVar39);
      auVar41._4_4_ = fVar252 * fVar256;
      auVar41._0_4_ = fVar239 * fVar241;
      auVar41._8_4_ = fVar205 * fVar310;
      auVar41._12_4_ = fVar266 * fVar279;
      auVar41._16_4_ = fVar281 * fVar209;
      auVar41._20_4_ = fVar284 * fVar174;
      auVar41._24_4_ = fVar141 * fVar138;
      auVar41._28_4_ = uVar9;
      auVar336._0_4_ = fVar204 * fVar203;
      auVar336._4_4_ = fVar254 * fVar243;
      auVar336._8_4_ = fVar311 * fVar309;
      auVar336._12_4_ = fVar277 * fVar207;
      auVar336._16_4_ = fVar282 * fVar267;
      auVar336._20_4_ = fVar211 * fVar283;
      auVar336._24_4_ = fVar119 * fVar137;
      auVar336._28_4_ = 0;
      auVar22 = vsubps_avx(auVar336,auVar41);
      auVar23 = vsubps_avx(auVar130,auVar17);
      fVar206 = auVar22._28_4_ + auVar21._28_4_;
      auVar166._0_4_ = auVar22._0_4_ + auVar21._0_4_ * 0.0 + auVar196._0_4_ * 0.0;
      auVar166._4_4_ = auVar22._4_4_ + auVar21._4_4_ * 0.0 + auVar196._4_4_ * 0.0;
      auVar166._8_4_ = auVar22._8_4_ + auVar21._8_4_ * 0.0 + auVar196._8_4_ * 0.0;
      auVar166._12_4_ = auVar22._12_4_ + auVar21._12_4_ * 0.0 + auVar196._12_4_ * 0.0;
      auVar166._16_4_ = auVar22._16_4_ + auVar21._16_4_ * 0.0 + auVar196._16_4_ * 0.0;
      auVar166._20_4_ = auVar22._20_4_ + auVar21._20_4_ * 0.0 + auVar196._20_4_ * 0.0;
      auVar166._24_4_ = auVar22._24_4_ + auVar21._24_4_ * 0.0 + auVar196._24_4_ * 0.0;
      auVar166._28_4_ = fVar206 + auVar196._28_4_;
      fVar210 = auVar25._0_4_;
      fVar120 = auVar25._4_4_;
      auVar42._4_4_ = fVar120 * auVar17._4_4_;
      auVar42._0_4_ = fVar210 * auVar17._0_4_;
      fVar139 = auVar25._8_4_;
      auVar42._8_4_ = fVar139 * auVar17._8_4_;
      fVar143 = auVar25._12_4_;
      auVar42._12_4_ = fVar143 * auVar17._12_4_;
      fVar146 = auVar25._16_4_;
      auVar42._16_4_ = fVar146 * auVar17._16_4_;
      fVar149 = auVar25._20_4_;
      auVar42._20_4_ = fVar149 * auVar17._20_4_;
      fVar152 = auVar25._24_4_;
      auVar42._24_4_ = fVar152 * auVar17._24_4_;
      auVar42._28_4_ = fVar206;
      fVar206 = auVar23._0_4_;
      fVar319 = auVar23._4_4_;
      auVar43._4_4_ = auVar26._4_4_ * fVar319;
      auVar43._0_4_ = auVar26._0_4_ * fVar206;
      fVar270 = auVar23._8_4_;
      auVar43._8_4_ = auVar26._8_4_ * fVar270;
      fVar208 = auVar23._12_4_;
      auVar43._12_4_ = auVar26._12_4_ * fVar208;
      fVar268 = auVar23._16_4_;
      auVar43._16_4_ = auVar26._16_4_ * fVar268;
      fVar295 = auVar23._20_4_;
      auVar43._20_4_ = auVar26._20_4_ * fVar295;
      fVar142 = auVar23._24_4_;
      auVar43._24_4_ = auVar26._24_4_ * fVar142;
      auVar43._28_4_ = auVar22._28_4_;
      auVar25 = vsubps_avx(auVar43,auVar42);
      auVar21 = vsubps_avx(auVar16,auVar19);
      fVar225 = auVar21._0_4_;
      fVar227 = auVar21._4_4_;
      auVar44._4_4_ = fVar227 * auVar17._4_4_;
      auVar44._0_4_ = fVar225 * auVar17._0_4_;
      fVar231 = auVar21._8_4_;
      auVar44._8_4_ = fVar231 * auVar17._8_4_;
      fVar238 = auVar21._12_4_;
      auVar44._12_4_ = fVar238 * auVar17._12_4_;
      fVar240 = auVar21._16_4_;
      auVar44._16_4_ = fVar240 * auVar17._16_4_;
      fVar242 = auVar21._20_4_;
      auVar44._20_4_ = fVar242 * auVar17._20_4_;
      fVar244 = auVar21._24_4_;
      auVar44._24_4_ = fVar244 * auVar17._24_4_;
      auVar44._28_4_ = auVar17._28_4_;
      auVar45._4_4_ = auVar19._4_4_ * fVar319;
      auVar45._0_4_ = auVar19._0_4_ * fVar206;
      auVar45._8_4_ = auVar19._8_4_ * fVar270;
      auVar45._12_4_ = auVar19._12_4_ * fVar208;
      auVar45._16_4_ = auVar19._16_4_ * fVar268;
      auVar45._20_4_ = auVar19._20_4_ * fVar295;
      auVar45._24_4_ = auVar19._24_4_ * fVar142;
      auVar45._28_4_ = auVar196._28_4_;
      auVar196 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar26._4_4_ * fVar227;
      auVar46._0_4_ = auVar26._0_4_ * fVar225;
      auVar46._8_4_ = auVar26._8_4_ * fVar231;
      auVar46._12_4_ = auVar26._12_4_ * fVar238;
      auVar46._16_4_ = auVar26._16_4_ * fVar240;
      auVar46._20_4_ = auVar26._20_4_ * fVar242;
      auVar46._24_4_ = auVar26._24_4_ * fVar244;
      auVar46._28_4_ = auVar17._28_4_;
      auVar47._4_4_ = auVar19._4_4_ * fVar120;
      auVar47._0_4_ = auVar19._0_4_ * fVar210;
      auVar47._8_4_ = auVar19._8_4_ * fVar139;
      auVar47._12_4_ = auVar19._12_4_ * fVar143;
      auVar47._16_4_ = auVar19._16_4_ * fVar146;
      auVar47._20_4_ = auVar19._20_4_ * fVar149;
      auVar47._24_4_ = auVar19._24_4_ * fVar152;
      auVar47._28_4_ = auVar19._28_4_;
      auVar19 = vsubps_avx(auVar47,auVar46);
      auVar220._0_4_ = auVar25._0_4_ * 0.0 + auVar19._0_4_ + auVar196._0_4_ * 0.0;
      auVar220._4_4_ = auVar25._4_4_ * 0.0 + auVar19._4_4_ + auVar196._4_4_ * 0.0;
      auVar220._8_4_ = auVar25._8_4_ * 0.0 + auVar19._8_4_ + auVar196._8_4_ * 0.0;
      auVar220._12_4_ = auVar25._12_4_ * 0.0 + auVar19._12_4_ + auVar196._12_4_ * 0.0;
      auVar220._16_4_ = auVar25._16_4_ * 0.0 + auVar19._16_4_ + auVar196._16_4_ * 0.0;
      auVar220._20_4_ = auVar25._20_4_ * 0.0 + auVar19._20_4_ + auVar196._20_4_ * 0.0;
      auVar220._24_4_ = auVar25._24_4_ * 0.0 + auVar19._24_4_ + auVar196._24_4_ * 0.0;
      auVar220._28_4_ = auVar19._28_4_ + auVar19._28_4_ + auVar196._28_4_;
      auVar19 = vmaxps_avx(auVar166,auVar220);
      auVar19 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,2);
      auVar183 = vpackssdw_avx(auVar19._0_16_,auVar19._16_16_);
      auVar234 = vpand_avx(auVar183,auVar234);
      auVar183 = vpmovsxwd_avx(auVar234);
      auVar217 = vpunpckhwd_avx(auVar234,auVar234);
      auVar197._16_16_ = auVar217;
      auVar197._0_16_ = auVar183;
      if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar197 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar197 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar197 >> 0x7f,0) == '\0') &&
            (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar217 >> 0x3f,0) == '\0') &&
          (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar217[0xf]
         ) {
LAB_00867c02:
        auVar275 = ZEXT3264(auVar201);
        auVar202 = ZEXT3264(auVar197);
        auVar173 = ZEXT3264(CONCAT824(uStack_5c8,
                                      CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
        auVar201._4_4_ = fVar136;
        auVar201._0_4_ = fVar118;
        auVar201._8_4_ = fVar140;
        auVar201._12_4_ = fVar144;
        auVar201._16_4_ = fVar147;
        auVar201._20_4_ = fVar150;
        auVar201._24_4_ = fVar153;
        auVar201._28_4_ = fVar156;
      }
      else {
        auVar48._4_4_ = fVar319 * fVar243;
        auVar48._0_4_ = fVar206 * fVar203;
        auVar48._8_4_ = fVar270 * fVar309;
        auVar48._12_4_ = fVar208 * fVar207;
        auVar48._16_4_ = fVar268 * fVar267;
        auVar48._20_4_ = fVar295 * fVar283;
        auVar48._24_4_ = fVar142 * fVar137;
        auVar48._28_4_ = auVar217._12_4_;
        auVar314._0_4_ = fVar210 * fVar155;
        auVar314._4_4_ = fVar120 * fVar158;
        auVar314._8_4_ = fVar139 * fVar175;
        auVar314._12_4_ = fVar143 * fVar259;
        auVar314._16_4_ = fVar146 * fVar294;
        auVar314._20_4_ = fVar149 * fVar212;
        auVar314._24_4_ = fVar152 * fVar223;
        auVar314._28_4_ = 0;
        auVar19 = vsubps_avx(auVar314,auVar48);
        auVar49._4_4_ = fVar227 * fVar158;
        auVar49._0_4_ = fVar225 * fVar155;
        auVar49._8_4_ = fVar231 * fVar175;
        auVar49._12_4_ = fVar238 * fVar259;
        auVar49._16_4_ = fVar240 * fVar294;
        auVar49._20_4_ = fVar242 * fVar212;
        auVar49._24_4_ = fVar244 * fVar223;
        auVar49._28_4_ = auVar218._28_4_;
        auVar50._4_4_ = fVar319 * fVar256;
        auVar50._0_4_ = fVar206 * fVar241;
        auVar50._8_4_ = fVar270 * fVar310;
        auVar50._12_4_ = fVar208 * fVar279;
        auVar50._16_4_ = fVar268 * fVar209;
        auVar50._20_4_ = fVar295 * fVar174;
        auVar50._24_4_ = fVar142 * fVar138;
        auVar50._28_4_ = auVar23._28_4_;
        auVar17 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = fVar120 * fVar256;
        auVar51._0_4_ = fVar210 * fVar241;
        auVar51._8_4_ = fVar139 * fVar310;
        auVar51._12_4_ = fVar143 * fVar279;
        auVar51._16_4_ = fVar146 * fVar209;
        auVar51._20_4_ = fVar149 * fVar174;
        auVar51._24_4_ = fVar152 * fVar138;
        auVar51._28_4_ = auVar166._28_4_;
        auVar52._4_4_ = fVar227 * fVar243;
        auVar52._0_4_ = fVar225 * fVar203;
        auVar52._8_4_ = fVar231 * fVar309;
        auVar52._12_4_ = fVar238 * fVar207;
        auVar52._16_4_ = fVar240 * fVar267;
        auVar52._20_4_ = fVar242 * fVar283;
        auVar52._24_4_ = fVar244 * fVar137;
        auVar52._28_4_ = auVar308._28_4_;
        auVar196 = vsubps_avx(auVar52,auVar51);
        auVar264._0_4_ = auVar19._0_4_ * 0.0 + auVar196._0_4_ + auVar17._0_4_ * 0.0;
        auVar264._4_4_ = auVar19._4_4_ * 0.0 + auVar196._4_4_ + auVar17._4_4_ * 0.0;
        auVar264._8_4_ = auVar19._8_4_ * 0.0 + auVar196._8_4_ + auVar17._8_4_ * 0.0;
        auVar264._12_4_ = auVar19._12_4_ * 0.0 + auVar196._12_4_ + auVar17._12_4_ * 0.0;
        auVar264._16_4_ = auVar19._16_4_ * 0.0 + auVar196._16_4_ + auVar17._16_4_ * 0.0;
        auVar264._20_4_ = auVar19._20_4_ * 0.0 + auVar196._20_4_ + auVar17._20_4_ * 0.0;
        auVar264._24_4_ = auVar19._24_4_ * 0.0 + auVar196._24_4_ + auVar17._24_4_ * 0.0;
        auVar264._28_4_ = auVar308._28_4_ + auVar196._28_4_ + auVar166._28_4_;
        auVar26 = vrcpps_avx(auVar264);
        fVar203 = auVar26._0_4_;
        fVar241 = auVar26._4_4_;
        auVar53._4_4_ = auVar264._4_4_ * fVar241;
        auVar53._0_4_ = auVar264._0_4_ * fVar203;
        fVar206 = auVar26._8_4_;
        auVar53._8_4_ = auVar264._8_4_ * fVar206;
        fVar243 = auVar26._12_4_;
        auVar53._12_4_ = auVar264._12_4_ * fVar243;
        fVar256 = auVar26._16_4_;
        auVar53._16_4_ = auVar264._16_4_ * fVar256;
        fVar319 = auVar26._20_4_;
        auVar53._20_4_ = auVar264._20_4_ * fVar319;
        fVar309 = auVar26._24_4_;
        auVar53._24_4_ = auVar264._24_4_ * fVar309;
        auVar53._28_4_ = auVar23._28_4_;
        auVar315._8_4_ = 0x3f800000;
        auVar315._0_8_ = 0x3f8000003f800000;
        auVar315._12_4_ = 0x3f800000;
        auVar315._16_4_ = 0x3f800000;
        auVar315._20_4_ = 0x3f800000;
        auVar315._24_4_ = 0x3f800000;
        auVar315._28_4_ = 0x3f800000;
        auVar218 = vsubps_avx(auVar315,auVar53);
        fVar203 = auVar218._0_4_ * fVar203 + fVar203;
        fVar241 = auVar218._4_4_ * fVar241 + fVar241;
        fVar206 = auVar218._8_4_ * fVar206 + fVar206;
        fVar243 = auVar218._12_4_ * fVar243 + fVar243;
        fVar256 = auVar218._16_4_ * fVar256 + fVar256;
        fVar319 = auVar218._20_4_ * fVar319 + fVar319;
        fVar309 = auVar218._24_4_ * fVar309 + fVar309;
        auVar54._4_4_ =
             (auVar19._4_4_ * fVar254 + auVar17._4_4_ * fVar252 + auVar196._4_4_ * fVar148) *
             fVar241;
        auVar54._0_4_ =
             (auVar19._0_4_ * fVar204 + auVar17._0_4_ * fVar239 + auVar196._0_4_ * fVar145) *
             fVar203;
        auVar54._8_4_ =
             (auVar19._8_4_ * fVar311 + auVar17._8_4_ * fVar205 + auVar196._8_4_ * fVar151) *
             fVar206;
        auVar54._12_4_ =
             (auVar19._12_4_ * fVar277 + auVar17._12_4_ * fVar266 + auVar196._12_4_ * fVar154) *
             fVar243;
        auVar54._16_4_ =
             (auVar19._16_4_ * fVar282 + auVar17._16_4_ * fVar281 + auVar196._16_4_ * fVar157) *
             fVar256;
        auVar54._20_4_ =
             (auVar19._20_4_ * fVar211 + auVar17._20_4_ * fVar284 + auVar196._20_4_ * fVar229) *
             fVar319;
        auVar54._24_4_ =
             (auVar19._24_4_ * fVar119 + auVar17._24_4_ * fVar141 + auVar196._24_4_ * fVar258) *
             fVar309;
        auVar54._28_4_ = auVar24._28_4_ + auVar130._28_4_;
        auVar183 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
        auVar129._16_16_ = auVar183;
        auVar129._0_16_ = auVar183;
        auVar130 = vcmpps_avx(auVar129,auVar54,2);
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar198._4_4_ = uVar9;
        auVar198._0_4_ = uVar9;
        auVar198._8_4_ = uVar9;
        auVar198._12_4_ = uVar9;
        auVar198._16_4_ = uVar9;
        auVar198._20_4_ = uVar9;
        auVar198._24_4_ = uVar9;
        auVar198._28_4_ = uVar9;
        auVar19 = vcmpps_avx(auVar54,auVar198,2);
        auVar130 = vandps_avx(auVar19,auVar130);
        auVar183 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
        auVar234 = vpand_avx(auVar234,auVar183);
        auVar183 = vpmovsxwd_avx(auVar234);
        auVar217 = vpshufd_avx(auVar234,0xee);
        auVar217 = vpmovsxwd_avx(auVar217);
        auVar197._16_16_ = auVar217;
        auVar197._0_16_ = auVar183;
        if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar197 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar197 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar197 >> 0x7f,0) == '\0') &&
              (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar217 >> 0x3f,0) == '\0') &&
            (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar217[0xf]) goto LAB_00867c02;
        auVar130 = vcmpps_avx(ZEXT832(0) << 0x20,auVar264,4);
        auVar183 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
        auVar234 = vpand_avx(auVar234,auVar183);
        auVar183 = vpmovsxwd_avx(auVar234);
        auVar202 = ZEXT1664(auVar183);
        auVar234 = vpunpckhwd_avx(auVar234,auVar234);
        auVar250._16_16_ = auVar234;
        auVar250._0_16_ = auVar183;
        auVar173 = ZEXT3264(CONCAT824(uStack_5c8,
                                      CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
        auVar275 = ZEXT3264(auVar201);
        auVar201._4_4_ = fVar136;
        auVar201._0_4_ = fVar118;
        auVar201._8_4_ = fVar140;
        auVar201._12_4_ = fVar144;
        auVar201._16_4_ = fVar147;
        auVar201._20_4_ = fVar150;
        auVar201._24_4_ = fVar153;
        auVar201._28_4_ = fVar156;
        if ((((((((auVar250 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar250 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar250 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar250 >> 0x7f,0) != '\0') ||
              (auVar250 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar234 >> 0x3f,0) != '\0') ||
            (auVar250 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar234[0xf] < '\0') {
          auVar55._4_4_ = auVar166._4_4_ * fVar241;
          auVar55._0_4_ = auVar166._0_4_ * fVar203;
          auVar55._8_4_ = auVar166._8_4_ * fVar206;
          auVar55._12_4_ = auVar166._12_4_ * fVar243;
          auVar55._16_4_ = auVar166._16_4_ * fVar256;
          auVar55._20_4_ = auVar166._20_4_ * fVar319;
          auVar55._24_4_ = auVar166._24_4_ * fVar309;
          auVar55._28_4_ = SUB84(uStack_5c8,4);
          auVar56._4_4_ = auVar220._4_4_ * fVar241;
          auVar56._0_4_ = auVar220._0_4_ * fVar203;
          auVar56._8_4_ = auVar220._8_4_ * fVar206;
          auVar56._12_4_ = auVar220._12_4_ * fVar243;
          auVar56._16_4_ = auVar220._16_4_ * fVar256;
          auVar56._20_4_ = auVar220._20_4_ * fVar319;
          auVar56._24_4_ = auVar220._24_4_ * fVar309;
          auVar56._28_4_ = auVar218._28_4_ + auVar26._28_4_;
          auVar221._8_4_ = 0x3f800000;
          auVar221._0_8_ = 0x3f8000003f800000;
          auVar221._12_4_ = 0x3f800000;
          auVar221._16_4_ = 0x3f800000;
          auVar221._20_4_ = 0x3f800000;
          auVar221._24_4_ = 0x3f800000;
          auVar221._28_4_ = 0x3f800000;
          auVar130 = vsubps_avx(auVar221,auVar55);
          auVar202 = ZEXT3264(auVar130);
          auVar130 = vblendvps_avx(auVar130,auVar55,auVar313);
          auVar275 = ZEXT3264(auVar130);
          auVar130 = vsubps_avx(auVar221,auVar56);
          _local_3a0 = vblendvps_avx(auVar130,auVar56,auVar313);
          auVar173 = ZEXT3264(auVar250);
          local_4e0 = auVar54;
        }
      }
      auVar130 = auVar173._0_32_;
      if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar130 >> 0x7f,0) != '\0') ||
            (auVar173 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar130 >> 0xbf,0) != '\0') ||
          (auVar173 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar173[0x1f] < '\0') {
        auVar19 = vsubps_avx(auVar272,auVar201);
        fVar239 = auVar201._0_4_ + auVar275._0_4_ * auVar19._0_4_;
        fVar204 = auVar201._4_4_ + auVar275._4_4_ * auVar19._4_4_;
        fVar241 = auVar201._8_4_ + auVar275._8_4_ * auVar19._8_4_;
        fVar206 = auVar201._12_4_ + auVar275._12_4_ * auVar19._12_4_;
        fVar243 = auVar201._16_4_ + auVar275._16_4_ * auVar19._16_4_;
        fVar252 = auVar201._20_4_ + auVar275._20_4_ * auVar19._20_4_;
        fVar254 = auVar201._24_4_ + auVar275._24_4_ * auVar19._24_4_;
        fVar256 = auVar201._28_4_ + auVar19._28_4_;
        fVar203 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar57._4_4_ = (fVar204 + fVar204) * fVar203;
        auVar57._0_4_ = (fVar239 + fVar239) * fVar203;
        auVar57._8_4_ = (fVar241 + fVar241) * fVar203;
        auVar57._12_4_ = (fVar206 + fVar206) * fVar203;
        auVar57._16_4_ = (fVar243 + fVar243) * fVar203;
        auVar57._20_4_ = (fVar252 + fVar252) * fVar203;
        auVar57._24_4_ = (fVar254 + fVar254) * fVar203;
        auVar57._28_4_ = fVar256 + fVar256;
        auVar201 = vcmpps_avx(local_4e0,auVar57,6);
        auVar19 = auVar130 & auVar201;
        if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0x7f,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0xbf,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar19[0x1f] < '\0') {
          auVar202 = ZEXT3264(CONCAT428(0xbf800000,
                                        CONCAT424(0xbf800000,
                                                  CONCAT420(0xbf800000,
                                                            CONCAT416(0xbf800000,
                                                                      CONCAT412(0xbf800000,
                                                                                CONCAT48(0xbf800000,
                                                                                                                                                                                  
                                                  0xbf800000bf800000)))))));
          local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
          local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
          uStack_398._0_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
          uStack_398._4_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
          uStack_390._0_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
          uStack_390._4_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
          uStack_388._0_4_ = (float)uStack_388 + (float)uStack_388 + -1.0;
          uStack_388._4_4_ = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
          local_7c0 = auVar275._0_32_;
          local_2a0 = local_7c0;
          auVar110 = _local_3a0;
          auVar19 = _local_3a0;
          local_280 = (float)local_3a0._0_4_;
          fStack_27c = (float)local_3a0._4_4_;
          fStack_278 = (float)uStack_398;
          fStack_274 = uStack_398._4_4_;
          fStack_270 = (float)uStack_390;
          fStack_26c = uStack_390._4_4_;
          fStack_268 = (float)uStack_388;
          fStack_264 = uStack_388._4_4_;
          local_260 = local_4e0;
          local_240 = 0;
          local_23c = uVar12;
          local_230 = local_8a0;
          fStack_22c = fStack_89c;
          fStack_228 = fStack_898;
          fStack_224 = fStack_894;
          local_220 = local_880;
          fStack_21c = fStack_87c;
          fStack_218 = fStack_878;
          fStack_214 = fStack_874;
          local_210 = local_890;
          fStack_20c = fStack_88c;
          fStack_208 = fStack_888;
          fStack_204 = fStack_884;
          local_200 = local_830;
          fStack_1fc = fStack_82c;
          fStack_1f8 = fStack_828;
          fStack_1f4 = fStack_824;
          _local_3a0 = auVar19;
          if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_620 = vandps_avx(auVar201,auVar130);
            auVar180._0_4_ = 1.0 / auVar194._0_4_;
            auVar180._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar234 = vshufps_avx(auVar180,auVar180,0);
            local_1c0[0] = auVar234._0_4_ * (auVar275._0_4_ + 0.0);
            local_1c0[1] = auVar234._4_4_ * (auVar275._4_4_ + 1.0);
            local_1c0[2] = auVar234._8_4_ * (auVar275._8_4_ + 2.0);
            local_1c0[3] = auVar234._12_4_ * (auVar275._12_4_ + 3.0);
            fStack_1b0 = auVar234._0_4_ * (auVar275._16_4_ + 4.0);
            fStack_1ac = auVar234._4_4_ * (auVar275._20_4_ + 5.0);
            fStack_1a8 = auVar234._8_4_ * (auVar275._24_4_ + 6.0);
            fStack_1a4 = auVar275._28_4_ + 7.0;
            uStack_390 = auVar110._16_8_;
            uStack_388 = auVar19._24_8_;
            local_1a0 = local_3a0;
            uStack_198 = uStack_398;
            uStack_190 = uStack_390;
            uStack_188 = uStack_388;
            local_180 = local_4e0;
            auVar167._8_4_ = 0x7f800000;
            auVar167._0_8_ = 0x7f8000007f800000;
            auVar167._12_4_ = 0x7f800000;
            auVar167._16_4_ = 0x7f800000;
            auVar167._20_4_ = 0x7f800000;
            auVar167._24_4_ = 0x7f800000;
            auVar167._28_4_ = 0x7f800000;
            auVar201 = vblendvps_avx(auVar167,local_4e0,local_620);
            auVar130 = vshufps_avx(auVar201,auVar201,0xb1);
            auVar130 = vminps_avx(auVar201,auVar130);
            auVar19 = vshufpd_avx(auVar130,auVar130,5);
            auVar130 = vminps_avx(auVar130,auVar19);
            auVar19 = vperm2f128_avx(auVar130,auVar130,1);
            auVar130 = vminps_avx(auVar130,auVar19);
            auVar130 = vcmpps_avx(auVar201,auVar130,0);
            auVar19 = local_620 & auVar130;
            auVar201 = local_620;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0x7f,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0xbf,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar19[0x1f] < '\0') {
              auVar201 = vandps_avx(auVar130,local_620);
            }
            uVar112 = vmovmskps_avx(auVar201);
            uVar113 = 0;
            if (uVar112 != 0) {
              for (; (uVar112 >> uVar113 & 1) == 0; uVar113 = uVar113 + 1) {
              }
            }
            uVar115 = (ulong)uVar113;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar203 = local_1c0[uVar115];
              uVar9 = *(undefined4 *)((long)&local_1a0 + uVar115 * 4);
              fVar204 = 1.0 - fVar203;
              fVar239 = fVar203 * fVar204 * 4.0;
              auVar234 = ZEXT416((uint)(fVar203 * fVar203 * 0.5));
              auVar234 = vshufps_avx(auVar234,auVar234,0);
              auVar183 = ZEXT416((uint)((fVar204 * fVar204 + fVar239) * 0.5));
              auVar183 = vshufps_avx(auVar183,auVar183,0);
              auVar217 = ZEXT416((uint)((-fVar203 * fVar203 - fVar239) * 0.5));
              auVar217 = vshufps_avx(auVar217,auVar217,0);
              auVar195 = ZEXT416((uint)(fVar204 * -fVar204 * 0.5));
              auVar195 = vshufps_avx(auVar195,auVar195,0);
              auVar181._0_4_ =
                   local_8a0 * auVar195._0_4_ +
                   local_880 * auVar217._0_4_ +
                   local_830 * auVar234._0_4_ + local_890 * auVar183._0_4_;
              auVar181._4_4_ =
                   fStack_89c * auVar195._4_4_ +
                   fStack_87c * auVar217._4_4_ +
                   fStack_82c * auVar234._4_4_ + fStack_88c * auVar183._4_4_;
              auVar181._8_4_ =
                   fStack_898 * auVar195._8_4_ +
                   fStack_878 * auVar217._8_4_ +
                   fStack_828 * auVar234._8_4_ + fStack_888 * auVar183._8_4_;
              auVar181._12_4_ =
                   fStack_894 * auVar195._12_4_ +
                   fStack_874 * auVar217._12_4_ +
                   fStack_824 * auVar234._12_4_ + fStack_884 * auVar183._12_4_;
              auVar202 = ZEXT464(*(uint *)(local_180 + uVar115 * 4));
              *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_180 + uVar115 * 4);
              *(float *)(ray + k * 4 + 0xc0) = auVar181._0_4_;
              uVar13 = vextractps_avx(auVar181,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
              uVar13 = vextractps_avx(auVar181,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
              *(float *)(ray + k * 4 + 0xf0) = fVar203;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar9;
              *(uint *)(ray + k * 4 + 0x110) = uVar11;
              *(uint *)(ray + k * 4 + 0x120) = uVar111;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_6a0 = vpermilps_avx(local_670,0);
              _local_6c0 = vpermilps_avx(local_680,0);
              _auStack_6b0 = auVar16._16_16_;
              local_640._16_16_ = auVar20._16_16_;
              local_640._0_16_ = *local_718;
              auStack_7f0 = auVar272._16_16_;
              local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              local_710 = k;
              local_708 = context;
              _local_340 = auVar160;
              while( true ) {
                local_420 = local_1c0[uVar115];
                local_410 = *(undefined4 *)((long)&local_1a0 + uVar115 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar115 * 4);
                fVar239 = 1.0 - local_420;
                fVar203 = local_420 * fVar239 * 4.0;
                auVar234 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                auVar234 = vshufps_avx(auVar234,auVar234,0);
                auVar183 = ZEXT416((uint)((fVar239 * fVar239 + fVar203) * 0.5));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar217 = ZEXT416((uint)((-local_420 * local_420 - fVar203) * 0.5));
                auVar217 = vshufps_avx(auVar217,auVar217,0);
                local_790.context = context->user;
                auVar195 = ZEXT416((uint)(fVar239 * -fVar239 * 0.5));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar186._0_4_ =
                     local_8a0 * auVar195._0_4_ +
                     local_880 * auVar217._0_4_ +
                     local_830 * auVar234._0_4_ + local_890 * auVar183._0_4_;
                auVar186._4_4_ =
                     fStack_89c * auVar195._4_4_ +
                     fStack_87c * auVar217._4_4_ +
                     fStack_82c * auVar234._4_4_ + fStack_88c * auVar183._4_4_;
                auVar186._8_4_ =
                     fStack_898 * auVar195._8_4_ +
                     fStack_878 * auVar217._8_4_ +
                     fStack_828 * auVar234._8_4_ + fStack_888 * auVar183._8_4_;
                auVar186._12_4_ =
                     fStack_894 * auVar195._12_4_ +
                     fStack_874 * auVar217._12_4_ +
                     fStack_824 * auVar234._12_4_ + fStack_884 * auVar183._12_4_;
                auVar234 = vshufps_avx(auVar186,auVar186,0);
                local_450[0] = (RTCHitN)auVar234[0];
                local_450[1] = (RTCHitN)auVar234[1];
                local_450[2] = (RTCHitN)auVar234[2];
                local_450[3] = (RTCHitN)auVar234[3];
                local_450[4] = (RTCHitN)auVar234[4];
                local_450[5] = (RTCHitN)auVar234[5];
                local_450[6] = (RTCHitN)auVar234[6];
                local_450[7] = (RTCHitN)auVar234[7];
                local_450[8] = (RTCHitN)auVar234[8];
                local_450[9] = (RTCHitN)auVar234[9];
                local_450[10] = (RTCHitN)auVar234[10];
                local_450[0xb] = (RTCHitN)auVar234[0xb];
                local_450[0xc] = (RTCHitN)auVar234[0xc];
                local_450[0xd] = (RTCHitN)auVar234[0xd];
                local_450[0xe] = (RTCHitN)auVar234[0xe];
                local_450[0xf] = (RTCHitN)auVar234[0xf];
                auVar234 = vshufps_avx(auVar186,auVar186,0x55);
                local_440 = auVar234;
                local_430 = vshufps_avx(auVar186,auVar186,0xaa);
                fStack_41c = local_420;
                fStack_418 = local_420;
                fStack_414 = local_420;
                uStack_40c = local_410;
                uStack_408 = local_410;
                uStack_404 = local_410;
                local_400 = local_6c0;
                uStack_3f8 = uStack_6b8;
                local_3f0 = local_6a0;
                vcmpps_avx(ZEXT1632(local_6a0),ZEXT1632(local_6a0),0xf);
                uStack_3dc = (local_790.context)->instID[0];
                local_3e0 = uStack_3dc;
                uStack_3d8 = uStack_3dc;
                uStack_3d4 = uStack_3dc;
                uStack_3d0 = (local_790.context)->instPrimID[0];
                uStack_3cc = uStack_3d0;
                uStack_3c8 = uStack_3d0;
                uStack_3c4 = uStack_3d0;
                local_820 = local_640._0_16_;
                local_790.valid = (int *)local_820;
                local_790.geometryUserPtr = pGVar14->userPtr;
                local_790.hit = local_450;
                local_790.N = 4;
                local_790.ray = (RTCRayN *)ray;
                if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar14->intersectionFilterN)(&local_790);
                  auVar275 = ZEXT3264(local_7c0);
                  pre = local_810;
                  context = local_708;
                  k = local_710;
                  fVar176 = (float)local_740._0_4_;
                  fVar188 = (float)local_740._4_4_;
                  fVar189 = fStack_738;
                  fVar190 = fStack_734;
                  fVar230 = fStack_730;
                  fVar191 = fStack_72c;
                  fVar237 = fStack_728;
                }
                if (local_820 == (undefined1  [16])0x0) {
                  auVar234 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar234 = auVar234 ^ _DAT_01f46b70;
                }
                else {
                  p_Var15 = context->args->filter;
                  if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var15)(&local_790);
                    auVar275 = ZEXT3264(local_7c0);
                    pre = local_810;
                    context = local_708;
                    k = local_710;
                    fVar176 = (float)local_740._0_4_;
                    fVar188 = (float)local_740._4_4_;
                    fVar189 = fStack_738;
                    fVar190 = fStack_734;
                    fVar230 = fStack_730;
                    fVar191 = fStack_72c;
                    fVar237 = fStack_728;
                  }
                  auVar183 = vpcmpeqd_avx(local_820,_DAT_01f45a50);
                  auVar217 = vpcmpeqd_avx(auVar234,auVar234);
                  auVar234 = auVar183 ^ auVar217;
                  if (local_820 != (undefined1  [16])0x0) {
                    auVar183 = auVar183 ^ auVar217;
                    auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])local_790.hit);
                    *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar217;
                    auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])(local_790.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar217;
                    auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])(local_790.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar217;
                    auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])(local_790.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar217;
                    auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])(local_790.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar217;
                    auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])(local_790.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar217;
                    auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])(local_790.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar217;
                    auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])(local_790.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar217;
                    auVar183 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])(local_790.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar183;
                  }
                }
                auVar201 = local_4e0;
                auVar164._8_8_ = 0x100000001;
                auVar164._0_8_ = 0x100000001;
                if ((auVar164 & auVar234) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = local_800._0_4_;
                  auVar234 = local_800;
                }
                else {
                  auVar234 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                auVar202 = ZEXT3264(local_4e0);
                *(undefined4 *)(local_620 + uVar115 * 4) = 0;
                local_800 = auVar234;
                auVar234 = vshufps_avx(auVar234,auVar234,0);
                auVar135._16_16_ = auVar234;
                auVar135._0_16_ = auVar234;
                auVar20 = vcmpps_avx(auVar201,auVar135,2);
                auVar16 = vandps_avx(auVar20,local_620);
                local_620 = local_620 & auVar20;
                if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_620 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_620 >> 0x7f,0) == '\0') &&
                      (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_620 >> 0xbf,0) == '\0') &&
                    (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_620[0x1f]) break;
                auVar172._8_4_ = 0x7f800000;
                auVar172._0_8_ = 0x7f8000007f800000;
                auVar172._12_4_ = 0x7f800000;
                auVar172._16_4_ = 0x7f800000;
                auVar172._20_4_ = 0x7f800000;
                auVar172._24_4_ = 0x7f800000;
                auVar172._28_4_ = 0x7f800000;
                auVar201 = vblendvps_avx(auVar172,auVar201,auVar16);
                auVar20 = vshufps_avx(auVar201,auVar201,0xb1);
                auVar20 = vminps_avx(auVar201,auVar20);
                auVar130 = vshufpd_avx(auVar20,auVar20,5);
                auVar20 = vminps_avx(auVar20,auVar130);
                auVar130 = vperm2f128_avx(auVar20,auVar20,1);
                auVar20 = vminps_avx(auVar20,auVar130);
                auVar20 = vcmpps_avx(auVar201,auVar20,0);
                auVar130 = auVar16 & auVar20;
                auVar201 = auVar16;
                if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar130 >> 0x7f,0) != '\0') ||
                      (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar130 >> 0xbf,0) != '\0') ||
                    (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar130[0x1f] < '\0') {
                  auVar201 = vandps_avx(auVar20,auVar16);
                }
                uVar113 = vmovmskps_avx(auVar201);
                uVar11 = 0;
                if (uVar113 != 0) {
                  for (; (uVar113 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                  }
                }
                uVar115 = (ulong)uVar11;
                local_620 = auVar16;
              }
            }
          }
        }
      }
      auVar307 = local_7e0._0_16_;
    }
    auVar173 = ZEXT3264(local_5c0);
    local_6a0._0_8_ = prim;
    if (8 < (int)uVar12) {
      _local_340 = vpshufd_avx(ZEXT416(uVar12),0);
      auVar234 = vshufps_avx(auVar307,auVar307,0);
      local_360._16_16_ = auVar234;
      local_360._0_16_ = auVar234;
      auVar234 = vpermilps_avx(_local_760,0);
      register0x00001210 = auVar234;
      _local_380 = auVar234;
      auVar125._0_4_ = 1.0 / (float)local_4c0._0_4_;
      auVar125._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar234 = vshufps_avx(auVar125,auVar125,0);
      register0x00001210 = auVar234;
      _local_e0 = auVar234;
      local_670 = vpermilps_avx(local_670,0);
      local_680 = vpermilps_avx(local_680,0);
      local_7c0 = auVar275._0_32_;
      for (lVar116 = 8; local_5c0 = auVar173._0_32_, lVar116 < (int)uVar12; lVar116 = lVar116 + 8) {
        pauVar2 = (undefined1 (*) [28])(bspline_basis0 + lVar116 * 4 + lVar114);
        fVar203 = *(float *)*pauVar2;
        fVar239 = *(float *)(*pauVar2 + 4);
        fVar204 = *(float *)(*pauVar2 + 8);
        fVar241 = *(float *)(*pauVar2 + 0xc);
        fVar206 = *(float *)(*pauVar2 + 0x10);
        fVar243 = *(float *)(*pauVar2 + 0x14);
        fVar252 = *(float *)(*pauVar2 + 0x18);
        auVar109 = *pauVar2;
        pauVar2 = (undefined1 (*) [28])(lVar114 + 0x21fffac + lVar116 * 4);
        fVar254 = *(float *)*pauVar2;
        fVar256 = *(float *)(*pauVar2 + 4);
        fVar319 = *(float *)(*pauVar2 + 8);
        fVar309 = *(float *)(*pauVar2 + 0xc);
        fVar205 = *(float *)(*pauVar2 + 0x10);
        fVar311 = *(float *)(*pauVar2 + 0x14);
        fVar310 = *(float *)(*pauVar2 + 0x18);
        auVar108 = *pauVar2;
        pauVar4 = (undefined1 (*) [32])(lVar114 + 0x2200430 + lVar116 * 4);
        fVar270 = *(float *)*pauVar4;
        fVar207 = *(float *)(*pauVar4 + 4);
        fVar266 = *(float *)(*pauVar4 + 8);
        fVar277 = *(float *)(*pauVar4 + 0xc);
        fVar279 = *(float *)(*pauVar4 + 0x10);
        fVar208 = *(float *)(*pauVar4 + 0x14);
        fVar267 = *(float *)(*pauVar4 + 0x18);
        auVar106 = *(undefined1 (*) [28])*pauVar4;
        pfVar5 = (float *)(lVar114 + 0x22008b4 + lVar116 * 4);
        fVar281 = *pfVar5;
        fVar282 = pfVar5[1];
        fVar209 = pfVar5[2];
        fVar268 = pfVar5[3];
        fVar283 = pfVar5[4];
        fVar284 = pfVar5[5];
        fVar211 = pfVar5[6];
        fVar174 = auVar202._28_4_;
        fVar157 = fVar174 + fVar174 + fStack_484;
        fVar229 = fVar174 + fVar174 + pfVar5[7];
        auVar323._0_4_ =
             (float)local_120._0_4_ * fVar203 +
             fVar254 * (float)local_2e0._0_4_ +
             (float)local_500._0_4_ * fVar270 + (float)local_4a0._0_4_ * fVar281;
        auVar323._4_4_ =
             (float)local_120._4_4_ * fVar239 +
             fVar256 * (float)local_2e0._4_4_ +
             (float)local_500._4_4_ * fVar207 + (float)local_4a0._4_4_ * fVar282;
        auVar323._8_4_ =
             fStack_118 * fVar204 +
             fVar319 * fStack_2d8 + fStack_4f8 * fVar266 + fStack_498 * fVar209;
        auVar323._12_4_ =
             fStack_114 * fVar241 +
             fVar309 * fStack_2d4 + fStack_4f4 * fVar277 + fStack_494 * fVar268;
        auVar323._16_4_ =
             fStack_110 * fVar206 +
             fVar205 * fStack_2d0 + fStack_4f0 * fVar279 + fStack_490 * fVar283;
        auVar323._20_4_ =
             fStack_10c * fVar243 +
             fVar311 * fStack_2cc + fStack_4ec * fVar208 + fStack_48c * fVar284;
        auVar323._24_4_ =
             fStack_108 * fVar252 +
             fVar310 * fStack_2c8 + fStack_4e8 * fVar267 + fStack_488 * fVar211;
        auVar323._28_4_ = fVar174 + pfVar5[7] + fVar157;
        local_7e0._0_4_ =
             fVar176 * fVar203 +
             (float)local_5a0._0_4_ * fVar281 + (float)local_520._0_4_ * fVar270 +
             (float)local_480._0_4_ * fVar254;
        local_7e0._4_4_ =
             fVar188 * fVar239 +
             (float)local_5a0._4_4_ * fVar282 + (float)local_520._4_4_ * fVar207 +
             (float)local_480._4_4_ * fVar256;
        local_7e0._8_4_ =
             fVar189 * fVar204 + fStack_598 * fVar209 + fStack_518 * fVar266 + fStack_478 * fVar319;
        local_7e0._12_4_ =
             fVar190 * fVar241 + fStack_594 * fVar268 + fStack_514 * fVar277 + fStack_474 * fVar309;
        local_7e0._16_4_ =
             fVar230 * fVar206 + fStack_590 * fVar283 + fStack_510 * fVar279 + fStack_470 * fVar205;
        local_7e0._20_4_ =
             fVar191 * fVar243 + fStack_58c * fVar284 + fStack_50c * fVar208 + fStack_46c * fVar311;
        local_7e0._24_4_ =
             fVar237 * fVar252 + fStack_588 * fVar211 + fStack_508 * fVar267 + fStack_468 * fVar310;
        local_7e0._28_4_ = fVar157 + auVar275._28_4_ + fVar174 + fVar174;
        fVar119 = fVar203 * (float)local_a0._0_4_ +
                  (float)local_80._0_4_ * fVar254 +
                  (float)local_100._0_4_ * fVar270 + fVar281 * (float)local_140._0_4_;
        fVar138 = fVar239 * (float)local_a0._4_4_ +
                  (float)local_80._4_4_ * fVar256 +
                  (float)local_100._4_4_ * fVar207 + fVar282 * (float)local_140._4_4_;
        fVar142 = fVar204 * fStack_98 +
                  fStack_78 * fVar319 + fStack_f8 * fVar266 + fVar209 * fStack_138;
        fVar145 = fVar241 * fStack_94 +
                  fStack_74 * fVar309 + fStack_f4 * fVar277 + fVar268 * fStack_134;
        fVar148 = fVar206 * fStack_90 +
                  fStack_70 * fVar205 + fStack_f0 * fVar279 + fVar283 * fStack_130;
        fVar151 = fVar243 * fStack_8c +
                  fStack_6c * fVar311 + fStack_ec * fVar208 + fVar284 * fStack_12c;
        fVar154 = fVar252 * fStack_88 +
                  fStack_68 * fVar310 + fStack_e8 * fVar267 + fVar211 * fStack_128;
        fVar157 = fVar157 + fVar229;
        pauVar3 = (undefined1 (*) [32])(bspline_basis1 + lVar116 * 4 + lVar114);
        auVar110 = *(undefined1 (*) [24])*pauVar3;
        pfVar5 = (float *)(lVar114 + 0x22023cc + lVar116 * 4);
        fVar206 = *pfVar5;
        fVar243 = pfVar5[1];
        fVar252 = pfVar5[2];
        fVar254 = pfVar5[3];
        fVar256 = pfVar5[4];
        fVar319 = pfVar5[5];
        fVar309 = pfVar5[6];
        pfVar6 = (float *)(lVar114 + 0x2202850 + lVar116 * 4);
        fVar205 = *pfVar6;
        fVar311 = pfVar6[1];
        fVar310 = pfVar6[2];
        fVar270 = pfVar6[3];
        fVar207 = pfVar6[4];
        fVar266 = pfVar6[5];
        fVar277 = pfVar6[6];
        pfVar7 = (float *)(lVar114 + 0x2202cd4 + lVar116 * 4);
        fVar279 = *pfVar7;
        fVar208 = pfVar7[1];
        fVar267 = pfVar7[2];
        fVar174 = pfVar7[3];
        fVar295 = pfVar7[4];
        fVar137 = pfVar7[5];
        fVar141 = pfVar7[6];
        fVar258 = fStack_4e4 + pfVar7[7];
        fVar203 = fStack_4e4 + fStack_4e4 + fVar229;
        local_760._0_4_ = auVar110._0_4_;
        local_760._4_4_ = auVar110._4_4_;
        fStack_758 = auVar110._8_4_;
        fStack_754 = auVar110._12_4_;
        fStack_750 = auVar110._16_4_;
        fStack_74c = auVar110._20_4_;
        fStack_748 = (float)*(undefined8 *)(*pauVar3 + 0x18);
        local_320._0_4_ =
             (float)local_120._0_4_ * (float)local_760._0_4_ +
             fVar206 * (float)local_2e0._0_4_ +
             (float)local_500._0_4_ * fVar205 + (float)local_4a0._0_4_ * fVar279;
        local_320._4_4_ =
             (float)local_120._4_4_ * (float)local_760._4_4_ +
             fVar243 * (float)local_2e0._4_4_ +
             (float)local_500._4_4_ * fVar311 + (float)local_4a0._4_4_ * fVar208;
        local_320._8_4_ =
             fStack_118 * fStack_758 +
             fVar252 * fStack_2d8 + fStack_4f8 * fVar310 + fStack_498 * fVar267;
        local_320._12_4_ =
             fStack_114 * fStack_754 +
             fVar254 * fStack_2d4 + fStack_4f4 * fVar270 + fStack_494 * fVar174;
        local_320._16_4_ =
             fStack_110 * fStack_750 +
             fVar256 * fStack_2d0 + fStack_4f0 * fVar207 + fStack_490 * fVar295;
        local_320._20_4_ =
             fStack_10c * fStack_74c +
             fVar319 * fStack_2cc + fStack_4ec * fVar266 + fStack_48c * fVar137;
        local_320._24_4_ =
             fStack_108 * fStack_748 +
             fVar309 * fStack_2c8 + fStack_4e8 * fVar277 + fStack_488 * fVar141;
        local_320._28_4_ = fVar258 + fVar203;
        auVar235._0_4_ =
             fVar176 * (float)local_760._0_4_ +
             (float)local_480._0_4_ * fVar206 +
             (float)local_520._0_4_ * fVar205 + fVar279 * (float)local_5a0._0_4_;
        auVar235._4_4_ =
             fVar188 * (float)local_760._4_4_ +
             (float)local_480._4_4_ * fVar243 +
             (float)local_520._4_4_ * fVar311 + fVar208 * (float)local_5a0._4_4_;
        auVar235._8_4_ =
             fVar189 * fStack_758 +
             fStack_478 * fVar252 + fStack_518 * fVar310 + fVar267 * fStack_598;
        auVar235._12_4_ =
             fVar190 * fStack_754 +
             fStack_474 * fVar254 + fStack_514 * fVar270 + fVar174 * fStack_594;
        auVar235._16_4_ =
             fVar230 * fStack_750 +
             fStack_470 * fVar256 + fStack_510 * fVar207 + fVar295 * fStack_590;
        auVar235._20_4_ =
             fVar191 * fStack_74c +
             fStack_46c * fVar319 + fStack_50c * fVar266 + fVar137 * fStack_58c;
        auVar235._24_4_ =
             fVar237 * fStack_748 +
             fStack_468 * fVar309 + fStack_508 * fVar277 + fVar141 * fStack_588;
        auVar235._28_4_ = fVar203 + fStack_4e4 + fStack_4e4 + fStack_484;
        auVar265._0_4_ =
             (float)local_80._0_4_ * fVar206 +
             (float)local_100._0_4_ * fVar205 + fVar279 * (float)local_140._0_4_ +
             (float)local_760._0_4_ * (float)local_a0._0_4_;
        auVar265._4_4_ =
             (float)local_80._4_4_ * fVar243 +
             (float)local_100._4_4_ * fVar311 + fVar208 * (float)local_140._4_4_ +
             (float)local_760._4_4_ * (float)local_a0._4_4_;
        auVar265._8_4_ =
             fStack_78 * fVar252 + fStack_f8 * fVar310 + fVar267 * fStack_138 +
             fStack_758 * fStack_98;
        auVar265._12_4_ =
             fStack_74 * fVar254 + fStack_f4 * fVar270 + fVar174 * fStack_134 +
             fStack_754 * fStack_94;
        auVar265._16_4_ =
             fStack_70 * fVar256 + fStack_f0 * fVar207 + fVar295 * fStack_130 +
             fStack_750 * fStack_90;
        auVar265._20_4_ =
             fStack_6c * fVar319 + fStack_ec * fVar266 + fVar137 * fStack_12c +
             fStack_74c * fStack_8c;
        auVar265._24_4_ =
             fStack_68 * fVar309 + fStack_e8 * fVar277 + fVar141 * fStack_128 +
             fStack_748 * fStack_88;
        auVar265._28_4_ = fStack_4e4 + fVar258 + fVar203;
        auVar16 = vsubps_avx(local_320,auVar323);
        auVar20 = vsubps_avx(auVar235,local_7e0);
        fVar229 = auVar16._0_4_;
        fVar210 = auVar16._4_4_;
        auVar58._4_4_ = fVar210 * local_7e0._4_4_;
        auVar58._0_4_ = fVar229 * local_7e0._0_4_;
        fVar120 = auVar16._8_4_;
        auVar58._8_4_ = fVar120 * local_7e0._8_4_;
        fVar139 = auVar16._12_4_;
        auVar58._12_4_ = fVar139 * local_7e0._12_4_;
        fVar143 = auVar16._16_4_;
        auVar58._16_4_ = fVar143 * local_7e0._16_4_;
        fVar146 = auVar16._20_4_;
        auVar58._20_4_ = fVar146 * local_7e0._20_4_;
        fVar149 = auVar16._24_4_;
        auVar58._24_4_ = fVar149 * local_7e0._24_4_;
        auVar58._28_4_ = fVar203;
        fVar230 = auVar20._0_4_;
        fVar191 = auVar20._4_4_;
        auVar59._4_4_ = auVar323._4_4_ * fVar191;
        auVar59._0_4_ = auVar323._0_4_ * fVar230;
        fVar237 = auVar20._8_4_;
        auVar59._8_4_ = auVar323._8_4_ * fVar237;
        fVar203 = auVar20._12_4_;
        auVar59._12_4_ = auVar323._12_4_ * fVar203;
        fVar239 = auVar20._16_4_;
        auVar59._16_4_ = auVar323._16_4_ * fVar239;
        fVar204 = auVar20._20_4_;
        auVar59._20_4_ = auVar323._20_4_ * fVar204;
        fVar241 = auVar20._24_4_;
        auVar59._24_4_ = auVar323._24_4_ * fVar241;
        auVar59._28_4_ = auVar235._28_4_;
        auVar130 = vsubps_avx(auVar58,auVar59);
        auVar101._4_4_ = fVar138;
        auVar101._0_4_ = fVar119;
        auVar101._8_4_ = fVar142;
        auVar101._12_4_ = fVar145;
        auVar101._16_4_ = fVar148;
        auVar101._20_4_ = fVar151;
        auVar101._24_4_ = fVar154;
        auVar101._28_4_ = fVar157;
        auVar201 = vmaxps_avx(auVar101,auVar265);
        auVar60._4_4_ = auVar201._4_4_ * auVar201._4_4_ * (fVar210 * fVar210 + fVar191 * fVar191);
        auVar60._0_4_ = auVar201._0_4_ * auVar201._0_4_ * (fVar229 * fVar229 + fVar230 * fVar230);
        auVar60._8_4_ = auVar201._8_4_ * auVar201._8_4_ * (fVar120 * fVar120 + fVar237 * fVar237);
        auVar60._12_4_ = auVar201._12_4_ * auVar201._12_4_ * (fVar139 * fVar139 + fVar203 * fVar203)
        ;
        auVar60._16_4_ = auVar201._16_4_ * auVar201._16_4_ * (fVar143 * fVar143 + fVar239 * fVar239)
        ;
        auVar60._20_4_ = auVar201._20_4_ * auVar201._20_4_ * (fVar146 * fVar146 + fVar204 * fVar204)
        ;
        auVar60._24_4_ = auVar201._24_4_ * auVar201._24_4_ * (fVar149 * fVar149 + fVar241 * fVar241)
        ;
        auVar60._28_4_ = fVar258 + auVar235._28_4_;
        auVar61._4_4_ = auVar130._4_4_ * auVar130._4_4_;
        auVar61._0_4_ = auVar130._0_4_ * auVar130._0_4_;
        auVar61._8_4_ = auVar130._8_4_ * auVar130._8_4_;
        auVar61._12_4_ = auVar130._12_4_ * auVar130._12_4_;
        auVar61._16_4_ = auVar130._16_4_ * auVar130._16_4_;
        auVar61._20_4_ = auVar130._20_4_ * auVar130._20_4_;
        auVar61._24_4_ = auVar130._24_4_ * auVar130._24_4_;
        auVar61._28_4_ = auVar130._28_4_;
        local_640 = vcmpps_avx(auVar61,auVar60,2);
        local_240 = (uint)lVar116;
        auVar183 = vpshufd_avx(ZEXT416(local_240),0);
        auVar234 = vpor_avx(auVar183,_DAT_01f4ad30);
        auVar183 = vpor_avx(auVar183,_DAT_01f7afa0);
        auVar234 = vpcmpgtd_avx(_local_340,auVar234);
        auVar183 = vpcmpgtd_avx(_local_340,auVar183);
        auVar199._16_16_ = auVar183;
        auVar199._0_16_ = auVar234;
        auVar202 = ZEXT3264(auVar199);
        auVar201 = auVar199 & local_640;
        fVar176 = (float)local_740._0_4_;
        fVar188 = (float)local_740._4_4_;
        fVar189 = fStack_738;
        fVar190 = fStack_734;
        fVar230 = fStack_730;
        fVar191 = fStack_72c;
        fVar237 = fStack_728;
        if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar201 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar201 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar201 >> 0x7f,0) == '\0') &&
              (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar201 >> 0xbf,0) == '\0') &&
            (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar201[0x1f]) {
          auVar173 = ZEXT3264(local_5c0);
          auVar275 = ZEXT3264(local_7c0);
          _local_760 = *pauVar3;
        }
        else {
          local_660 = (float)local_760._0_4_ * (float)local_160._0_4_ +
                      fVar206 * (float)local_300._0_4_ +
                      (float)local_c0._0_4_ * fVar205 + (float)local_540._0_4_ * fVar279;
          fStack_65c = (float)local_760._4_4_ * (float)local_160._4_4_ +
                       fVar243 * (float)local_300._4_4_ +
                       (float)local_c0._4_4_ * fVar311 + (float)local_540._4_4_ * fVar208;
          fStack_658 = fStack_758 * fStack_158 +
                       fVar252 * fStack_2f8 + fStack_b8 * fVar310 + fStack_538 * fVar267;
          fStack_654 = fStack_754 * fStack_154 +
                       fVar254 * fStack_2f4 + fStack_b4 * fVar270 + fStack_534 * fVar174;
          fStack_650 = fStack_750 * fStack_150 +
                       fVar256 * fStack_2f0 + fStack_b0 * fVar207 + fStack_530 * fVar295;
          fStack_64c = fStack_74c * fStack_14c +
                       fVar319 * fStack_2ec + fStack_ac * fVar266 + fStack_52c * fVar137;
          fStack_648 = fStack_748 * fStack_148 +
                       fVar309 * fStack_2e8 + fStack_a8 * fVar277 + fStack_528 * fVar141;
          fStack_644 = fStack_504 + pfVar6[7] + fStack_144 + 0.0;
          local_700._0_4_ = auVar108._0_4_;
          local_700._4_4_ = auVar108._4_4_;
          fStack_6f8 = auVar108._8_4_;
          fStack_6f4 = auVar108._12_4_;
          fStack_6f0 = auVar108._16_4_;
          fStack_6ec = auVar108._20_4_;
          fStack_6e8 = auVar108._24_4_;
          fVar120 = (float)local_300._0_4_ * (float)local_700._0_4_;
          fVar139 = (float)local_300._4_4_ * (float)local_700._4_4_;
          fVar143 = fStack_2f8 * fStack_6f8;
          fVar146 = fStack_2f4 * fStack_6f4;
          fVar149 = fStack_2f0 * fStack_6f0;
          fVar152 = fStack_2ec * fStack_6ec;
          fVar155 = fStack_2e8 * fStack_6e8;
          local_560._0_4_ = auVar106._0_4_;
          local_560._4_4_ = auVar106._4_4_;
          fStack_558 = auVar106._8_4_;
          fStack_554 = auVar106._12_4_;
          fStack_550 = auVar106._16_4_;
          fStack_54c = auVar106._20_4_;
          fStack_548 = auVar106._24_4_;
          pfVar6 = (float *)(lVar114 + 0x2201640 + lVar116 * 4);
          fVar203 = *pfVar6;
          fVar239 = pfVar6[1];
          fVar204 = pfVar6[2];
          fVar241 = pfVar6[3];
          fVar206 = pfVar6[4];
          fVar243 = pfVar6[5];
          fVar252 = pfVar6[6];
          pfVar7 = (float *)(lVar114 + 0x2201ac4 + lVar116 * 4);
          fVar254 = *pfVar7;
          fVar256 = pfVar7[1];
          fVar319 = pfVar7[2];
          fVar309 = pfVar7[3];
          fVar205 = pfVar7[4];
          fVar311 = pfVar7[5];
          fVar310 = pfVar7[6];
          fVar259 = pfVar5[7] + 0.0;
          pfVar8 = (float *)(lVar114 + 0x22011bc + lVar116 * 4);
          fVar270 = *pfVar8;
          fVar207 = pfVar8[1];
          fVar266 = pfVar8[2];
          fVar277 = pfVar8[3];
          fVar279 = pfVar8[4];
          fVar208 = pfVar8[5];
          fVar267 = pfVar8[6];
          fVar158 = pfVar6[7] + pfVar7[7];
          fVar175 = pfVar7[7] + fVar259;
          fVar259 = pfVar5[7] + auVar323._28_4_ + fVar259;
          pfVar5 = (float *)(lVar114 + 0x2200d38 + lVar116 * 4);
          fVar174 = *pfVar5;
          fVar295 = pfVar5[1];
          fVar137 = pfVar5[2];
          fVar141 = pfVar5[3];
          fVar229 = pfVar5[4];
          fVar258 = pfVar5[5];
          fVar210 = pfVar5[6];
          local_700._4_4_ =
               (float)local_120._4_4_ * fVar295 +
               fVar207 * (float)local_2e0._4_4_ +
               (float)local_500._4_4_ * fVar239 + (float)local_4a0._4_4_ * fVar256;
          local_700._0_4_ =
               (float)local_120._0_4_ * fVar174 +
               fVar270 * (float)local_2e0._0_4_ +
               (float)local_500._0_4_ * fVar203 + (float)local_4a0._0_4_ * fVar254;
          fStack_6f8 = fStack_118 * fVar137 +
                       fVar266 * fStack_2d8 + fStack_4f8 * fVar204 + fStack_498 * fVar319;
          fStack_6f4 = fStack_114 * fVar141 +
                       fVar277 * fStack_2d4 + fStack_4f4 * fVar241 + fStack_494 * fVar309;
          fStack_6f0 = fStack_110 * fVar229 +
                       fVar279 * fStack_2d0 + fStack_4f0 * fVar206 + fStack_490 * fVar205;
          fStack_6ec = fStack_10c * fVar258 +
                       fVar208 * fStack_2cc + fStack_4ec * fVar243 + fStack_48c * fVar311;
          fStack_6e8 = fStack_108 * fVar210 +
                       fVar267 * fStack_2c8 + fStack_4e8 * fVar252 + fStack_488 * fVar310;
          fStack_6e4 = fVar158 + fVar175;
          auVar168._0_4_ =
               fVar174 * (float)local_740._0_4_ +
               (float)local_520._0_4_ * fVar203 + fVar254 * (float)local_5a0._0_4_ +
               fVar270 * (float)local_480._0_4_;
          auVar168._4_4_ =
               fVar295 * (float)local_740._4_4_ +
               (float)local_520._4_4_ * fVar239 + fVar256 * (float)local_5a0._4_4_ +
               fVar207 * (float)local_480._4_4_;
          auVar168._8_4_ =
               fVar137 * fStack_738 +
               fStack_518 * fVar204 + fVar319 * fStack_598 + fVar266 * fStack_478;
          auVar168._12_4_ =
               fVar141 * fStack_734 +
               fStack_514 * fVar241 + fVar309 * fStack_594 + fVar277 * fStack_474;
          auVar168._16_4_ =
               fVar229 * fStack_730 +
               fStack_510 * fVar206 + fVar205 * fStack_590 + fVar279 * fStack_470;
          auVar168._20_4_ =
               fVar258 * fStack_72c +
               fStack_50c * fVar243 + fVar311 * fStack_58c + fVar208 * fStack_46c;
          auVar168._24_4_ =
               fVar210 * fStack_728 +
               fStack_508 * fVar252 + fVar310 * fStack_588 + fVar267 * fStack_468;
          auVar168._28_4_ = fVar175 + fVar259;
          auVar324._0_4_ =
               fVar270 * (float)local_300._0_4_ +
               (float)local_c0._0_4_ * fVar203 + (float)local_540._0_4_ * fVar254 +
               (float)local_160._0_4_ * fVar174;
          auVar324._4_4_ =
               fVar207 * (float)local_300._4_4_ +
               (float)local_c0._4_4_ * fVar239 + (float)local_540._4_4_ * fVar256 +
               (float)local_160._4_4_ * fVar295;
          auVar324._8_4_ =
               fVar266 * fStack_2f8 + fStack_b8 * fVar204 + fStack_538 * fVar319 +
               fStack_158 * fVar137;
          auVar324._12_4_ =
               fVar277 * fStack_2f4 + fStack_b4 * fVar241 + fStack_534 * fVar309 +
               fStack_154 * fVar141;
          auVar324._16_4_ =
               fVar279 * fStack_2f0 + fStack_b0 * fVar206 + fStack_530 * fVar205 +
               fStack_150 * fVar229;
          auVar324._20_4_ =
               fVar208 * fStack_2ec + fStack_ac * fVar243 + fStack_52c * fVar311 +
               fStack_14c * fVar258;
          auVar324._24_4_ =
               fVar267 * fStack_2e8 + fStack_a8 * fVar252 + fStack_528 * fVar310 +
               fStack_148 * fVar210;
          auVar324._28_4_ = pfVar8[7] + fVar158 + fVar259;
          pfVar5 = (float *)(lVar114 + 0x2203a60 + lVar116 * 4);
          fVar203 = *pfVar5;
          fVar239 = pfVar5[1];
          fVar204 = pfVar5[2];
          fVar241 = pfVar5[3];
          fVar206 = pfVar5[4];
          fVar243 = pfVar5[5];
          fVar252 = pfVar5[6];
          pfVar6 = (float *)(lVar114 + 0x2203ee4 + lVar116 * 4);
          fVar254 = *pfVar6;
          fVar256 = pfVar6[1];
          fVar319 = pfVar6[2];
          fVar309 = pfVar6[3];
          fVar205 = pfVar6[4];
          fVar311 = pfVar6[5];
          fVar310 = pfVar6[6];
          pfVar7 = (float *)(lVar114 + 0x22035dc + lVar116 * 4);
          fVar270 = *pfVar7;
          fVar207 = pfVar7[1];
          fVar266 = pfVar7[2];
          fVar277 = pfVar7[3];
          fVar279 = pfVar7[4];
          fVar208 = pfVar7[5];
          fVar267 = pfVar7[6];
          pfVar8 = (float *)(lVar114 + 0x2203158 + lVar116 * 4);
          fVar174 = *pfVar8;
          fVar295 = pfVar8[1];
          fVar137 = pfVar8[2];
          fVar141 = pfVar8[3];
          fVar229 = pfVar8[4];
          fVar258 = pfVar8[5];
          fVar210 = pfVar8[6];
          auVar290._0_4_ =
               (float)local_120._0_4_ * fVar174 +
               fVar270 * (float)local_2e0._0_4_ +
               (float)local_500._0_4_ * fVar203 + (float)local_4a0._0_4_ * fVar254;
          auVar290._4_4_ =
               (float)local_120._4_4_ * fVar295 +
               fVar207 * (float)local_2e0._4_4_ +
               (float)local_500._4_4_ * fVar239 + (float)local_4a0._4_4_ * fVar256;
          auVar290._8_4_ =
               fStack_118 * fVar137 +
               fVar266 * fStack_2d8 + fStack_4f8 * fVar204 + fStack_498 * fVar319;
          auVar290._12_4_ =
               fStack_114 * fVar141 +
               fVar277 * fStack_2d4 + fStack_4f4 * fVar241 + fStack_494 * fVar309;
          auVar290._16_4_ =
               fStack_110 * fVar229 +
               fVar279 * fStack_2d0 + fStack_4f0 * fVar206 + fStack_490 * fVar205;
          auVar290._20_4_ =
               fStack_10c * fVar258 +
               fVar208 * fStack_2cc + fStack_4ec * fVar243 + fStack_48c * fVar311;
          auVar290._24_4_ =
               fStack_108 * fVar210 +
               fVar267 * fStack_2c8 + fStack_4e8 * fVar252 + fStack_488 * fVar310;
          auVar290._28_4_ = fStack_144 + fStack_144 + fStack_484 + fStack_144;
          auVar316._0_4_ =
               fVar174 * (float)local_740._0_4_ +
               fVar270 * (float)local_480._0_4_ +
               fVar203 * (float)local_520._0_4_ + fVar254 * (float)local_5a0._0_4_;
          auVar316._4_4_ =
               fVar295 * (float)local_740._4_4_ +
               fVar207 * (float)local_480._4_4_ +
               fVar239 * (float)local_520._4_4_ + fVar256 * (float)local_5a0._4_4_;
          auVar316._8_4_ =
               fVar137 * fStack_738 +
               fVar266 * fStack_478 + fVar204 * fStack_518 + fVar319 * fStack_598;
          auVar316._12_4_ =
               fVar141 * fStack_734 +
               fVar277 * fStack_474 + fVar241 * fStack_514 + fVar309 * fStack_594;
          auVar316._16_4_ =
               fVar229 * fStack_730 +
               fVar279 * fStack_470 + fVar206 * fStack_510 + fVar205 * fStack_590;
          auVar316._20_4_ =
               fVar258 * fStack_72c +
               fVar208 * fStack_46c + fVar243 * fStack_50c + fVar311 * fStack_58c;
          auVar316._24_4_ =
               fVar210 * fStack_728 +
               fVar267 * fStack_468 + fVar252 * fStack_508 + fVar310 * fStack_588;
          auVar316._28_4_ = fStack_144 + fStack_144 + fStack_4e4 + fStack_144;
          auVar236._8_4_ = 0x7fffffff;
          auVar236._0_8_ = 0x7fffffff7fffffff;
          auVar236._12_4_ = 0x7fffffff;
          auVar236._16_4_ = 0x7fffffff;
          auVar236._20_4_ = 0x7fffffff;
          auVar236._24_4_ = 0x7fffffff;
          auVar236._28_4_ = 0x7fffffff;
          auVar201 = vandps_avx(_local_700,auVar236);
          auVar130 = vandps_avx(auVar168,auVar236);
          auVar130 = vmaxps_avx(auVar201,auVar130);
          auVar201 = vandps_avx(auVar324,auVar236);
          auVar130 = vmaxps_avx(auVar130,auVar201);
          auVar130 = vcmpps_avx(auVar130,local_360,1);
          auVar19 = vblendvps_avx(_local_700,auVar16,auVar130);
          auVar131._0_4_ =
               fVar174 * (float)local_160._0_4_ +
               fVar270 * (float)local_300._0_4_ +
               fVar254 * (float)local_540._0_4_ + (float)local_c0._0_4_ * fVar203;
          auVar131._4_4_ =
               fVar295 * (float)local_160._4_4_ +
               fVar207 * (float)local_300._4_4_ +
               fVar256 * (float)local_540._4_4_ + (float)local_c0._4_4_ * fVar239;
          auVar131._8_4_ =
               fVar137 * fStack_158 +
               fVar266 * fStack_2f8 + fVar319 * fStack_538 + fStack_b8 * fVar204;
          auVar131._12_4_ =
               fVar141 * fStack_154 +
               fVar277 * fStack_2f4 + fVar309 * fStack_534 + fStack_b4 * fVar241;
          auVar131._16_4_ =
               fVar229 * fStack_150 +
               fVar279 * fStack_2f0 + fVar205 * fStack_530 + fStack_b0 * fVar206;
          auVar131._20_4_ =
               fVar258 * fStack_14c +
               fVar208 * fStack_2ec + fVar311 * fStack_52c + fStack_ac * fVar243;
          auVar131._24_4_ =
               fVar210 * fStack_148 +
               fVar267 * fStack_2e8 + fVar310 * fStack_528 + fStack_a8 * fVar252;
          auVar131._28_4_ = auVar201._28_4_ + pfVar7[7] + pfVar6[7] + pfVar5[7];
          auVar26 = vblendvps_avx(auVar168,auVar20,auVar130);
          auVar201 = vandps_avx(auVar290,auVar236);
          auVar130 = vandps_avx(auVar316,auVar236);
          auVar17 = vmaxps_avx(auVar201,auVar130);
          auVar201 = vandps_avx(auVar131,auVar236);
          auVar201 = vmaxps_avx(auVar17,auVar201);
          local_6c0._0_4_ = auVar109._0_4_;
          local_6c0._4_4_ = auVar109._4_4_;
          uStack_6b8._0_4_ = auVar109._8_4_;
          uStack_6b8._4_4_ = auVar109._12_4_;
          auStack_6b0._0_4_ = auVar109._16_4_;
          auStack_6b0._4_4_ = auVar109._20_4_;
          fStack_6a8 = auVar109._24_4_;
          auVar130 = vcmpps_avx(auVar201,local_360,1);
          auVar201 = vblendvps_avx(auVar290,auVar16,auVar130);
          auVar132._0_4_ =
               (float)local_160._0_4_ * (float)local_6c0._0_4_ +
               fVar120 + (float)local_c0._0_4_ * (float)local_560._0_4_ +
                         (float)local_540._0_4_ * fVar281;
          auVar132._4_4_ =
               (float)local_160._4_4_ * (float)local_6c0._4_4_ +
               fVar139 + (float)local_c0._4_4_ * (float)local_560._4_4_ +
                         (float)local_540._4_4_ * fVar282;
          auVar132._8_4_ =
               fStack_158 * (float)uStack_6b8 +
               fVar143 + fStack_b8 * fStack_558 + fStack_538 * fVar209;
          auVar132._12_4_ =
               fStack_154 * uStack_6b8._4_4_ +
               fVar146 + fStack_b4 * fStack_554 + fStack_534 * fVar268;
          auVar132._16_4_ =
               fStack_150 * (float)auStack_6b0._0_4_ +
               fVar149 + fStack_b0 * fStack_550 + fStack_530 * fVar283;
          auVar132._20_4_ =
               fStack_14c * (float)auStack_6b0._4_4_ +
               fVar152 + fStack_ac * fStack_54c + fStack_52c * fVar284;
          auVar132._24_4_ =
               fStack_148 * fStack_6a8 + fVar155 + fStack_a8 * fStack_548 + fStack_528 * fVar211;
          auVar132._28_4_ = auVar17._28_4_ + fStack_644 + fStack_144 + 0.0;
          auVar130 = vblendvps_avx(auVar316,auVar20,auVar130);
          fVar120 = auVar19._0_4_;
          fVar139 = auVar19._4_4_;
          fVar143 = auVar19._8_4_;
          fVar146 = auVar19._12_4_;
          fVar149 = auVar19._16_4_;
          fVar152 = auVar19._20_4_;
          fVar155 = auVar19._24_4_;
          fVar158 = auVar19._28_4_;
          fVar270 = auVar201._0_4_;
          fVar266 = auVar201._4_4_;
          fVar279 = auVar201._8_4_;
          fVar267 = auVar201._12_4_;
          fVar282 = auVar201._16_4_;
          fVar268 = auVar201._20_4_;
          fVar284 = auVar201._24_4_;
          fVar203 = auVar26._0_4_;
          fVar204 = auVar26._4_4_;
          fVar206 = auVar26._8_4_;
          fVar252 = auVar26._12_4_;
          fVar256 = auVar26._16_4_;
          fVar309 = auVar26._20_4_;
          fVar311 = auVar26._24_4_;
          auVar299._0_4_ = fVar203 * fVar203 + fVar120 * fVar120;
          auVar299._4_4_ = fVar204 * fVar204 + fVar139 * fVar139;
          auVar299._8_4_ = fVar206 * fVar206 + fVar143 * fVar143;
          auVar299._12_4_ = fVar252 * fVar252 + fVar146 * fVar146;
          auVar299._16_4_ = fVar256 * fVar256 + fVar149 * fVar149;
          auVar299._20_4_ = fVar309 * fVar309 + fVar152 * fVar152;
          auVar299._24_4_ = fVar311 * fVar311 + fVar155 * fVar155;
          auVar299._28_4_ = auVar16._28_4_ + auVar20._28_4_;
          auVar16 = vrsqrtps_avx(auVar299);
          fVar239 = auVar16._0_4_;
          fVar241 = auVar16._4_4_;
          auVar62._4_4_ = fVar241 * 1.5;
          auVar62._0_4_ = fVar239 * 1.5;
          fVar243 = auVar16._8_4_;
          auVar62._8_4_ = fVar243 * 1.5;
          fVar254 = auVar16._12_4_;
          auVar62._12_4_ = fVar254 * 1.5;
          fVar319 = auVar16._16_4_;
          auVar62._16_4_ = fVar319 * 1.5;
          fVar205 = auVar16._20_4_;
          auVar62._20_4_ = fVar205 * 1.5;
          fVar310 = auVar16._24_4_;
          auVar62._24_4_ = fVar310 * 1.5;
          auVar62._28_4_ = auVar316._28_4_;
          auVar63._4_4_ = fVar241 * fVar241 * fVar241 * auVar299._4_4_ * 0.5;
          auVar63._0_4_ = fVar239 * fVar239 * fVar239 * auVar299._0_4_ * 0.5;
          auVar63._8_4_ = fVar243 * fVar243 * fVar243 * auVar299._8_4_ * 0.5;
          auVar63._12_4_ = fVar254 * fVar254 * fVar254 * auVar299._12_4_ * 0.5;
          auVar63._16_4_ = fVar319 * fVar319 * fVar319 * auVar299._16_4_ * 0.5;
          auVar63._20_4_ = fVar205 * fVar205 * fVar205 * auVar299._20_4_ * 0.5;
          auVar63._24_4_ = fVar310 * fVar310 * fVar310 * auVar299._24_4_ * 0.5;
          auVar63._28_4_ = auVar299._28_4_;
          auVar20 = vsubps_avx(auVar62,auVar63);
          fVar174 = auVar20._0_4_;
          fVar295 = auVar20._4_4_;
          fVar137 = auVar20._8_4_;
          fVar141 = auVar20._12_4_;
          fVar229 = auVar20._16_4_;
          fVar258 = auVar20._20_4_;
          fVar210 = auVar20._24_4_;
          fVar239 = auVar130._0_4_;
          fVar241 = auVar130._4_4_;
          fVar243 = auVar130._8_4_;
          fVar254 = auVar130._12_4_;
          fVar319 = auVar130._16_4_;
          fVar205 = auVar130._20_4_;
          fVar310 = auVar130._24_4_;
          auVar273._0_4_ = fVar239 * fVar239 + fVar270 * fVar270;
          auVar273._4_4_ = fVar241 * fVar241 + fVar266 * fVar266;
          auVar273._8_4_ = fVar243 * fVar243 + fVar279 * fVar279;
          auVar273._12_4_ = fVar254 * fVar254 + fVar267 * fVar267;
          auVar273._16_4_ = fVar319 * fVar319 + fVar282 * fVar282;
          auVar273._20_4_ = fVar205 * fVar205 + fVar268 * fVar268;
          auVar273._24_4_ = fVar310 * fVar310 + fVar284 * fVar284;
          auVar273._28_4_ = auVar16._28_4_ + auVar201._28_4_;
          auVar201 = vrsqrtps_avx(auVar273);
          fVar207 = auVar201._0_4_;
          fVar277 = auVar201._4_4_;
          auVar64._4_4_ = fVar277 * 1.5;
          auVar64._0_4_ = fVar207 * 1.5;
          fVar208 = auVar201._8_4_;
          auVar64._8_4_ = fVar208 * 1.5;
          fVar281 = auVar201._12_4_;
          auVar64._12_4_ = fVar281 * 1.5;
          fVar209 = auVar201._16_4_;
          auVar64._16_4_ = fVar209 * 1.5;
          fVar283 = auVar201._20_4_;
          auVar64._20_4_ = fVar283 * 1.5;
          fVar211 = auVar201._24_4_;
          auVar64._24_4_ = fVar211 * 1.5;
          auVar64._28_4_ = auVar316._28_4_;
          auVar65._4_4_ = fVar277 * fVar277 * fVar277 * auVar273._4_4_ * 0.5;
          auVar65._0_4_ = fVar207 * fVar207 * fVar207 * auVar273._0_4_ * 0.5;
          auVar65._8_4_ = fVar208 * fVar208 * fVar208 * auVar273._8_4_ * 0.5;
          auVar65._12_4_ = fVar281 * fVar281 * fVar281 * auVar273._12_4_ * 0.5;
          auVar65._16_4_ = fVar209 * fVar209 * fVar209 * auVar273._16_4_ * 0.5;
          auVar65._20_4_ = fVar283 * fVar283 * fVar283 * auVar273._20_4_ * 0.5;
          auVar65._24_4_ = fVar211 * fVar211 * fVar211 * auVar273._24_4_ * 0.5;
          auVar65._28_4_ = auVar273._28_4_;
          auVar16 = vsubps_avx(auVar64,auVar65);
          fVar207 = auVar16._0_4_;
          fVar277 = auVar16._4_4_;
          fVar208 = auVar16._8_4_;
          fVar281 = auVar16._12_4_;
          fVar209 = auVar16._16_4_;
          fVar283 = auVar16._20_4_;
          fVar211 = auVar16._24_4_;
          fVar203 = fVar119 * fVar174 * fVar203;
          fVar204 = fVar138 * fVar295 * fVar204;
          auVar66._4_4_ = fVar204;
          auVar66._0_4_ = fVar203;
          fVar206 = fVar142 * fVar137 * fVar206;
          auVar66._8_4_ = fVar206;
          fVar252 = fVar145 * fVar141 * fVar252;
          auVar66._12_4_ = fVar252;
          fVar256 = fVar148 * fVar229 * fVar256;
          auVar66._16_4_ = fVar256;
          fVar309 = fVar151 * fVar258 * fVar309;
          auVar66._20_4_ = fVar309;
          fVar311 = fVar154 * fVar210 * fVar311;
          auVar66._24_4_ = fVar311;
          auVar66._28_4_ = auVar201._28_4_;
          local_6c0._4_4_ = fVar204 + auVar323._4_4_;
          local_6c0._0_4_ = fVar203 + auVar323._0_4_;
          uStack_6b8._0_4_ = fVar206 + auVar323._8_4_;
          uStack_6b8._4_4_ = fVar252 + auVar323._12_4_;
          auStack_6b0._0_4_ = fVar256 + auVar323._16_4_;
          auStack_6b0._4_4_ = fVar309 + auVar323._20_4_;
          fStack_6a8 = fVar311 + auVar323._24_4_;
          fStack_6a4 = auVar201._28_4_ + auVar323._28_4_;
          local_6e0 = fVar119 * fVar174 * -fVar120;
          fStack_6dc = fVar138 * fVar295 * -fVar139;
          auVar67._4_4_ = fStack_6dc;
          auVar67._0_4_ = local_6e0;
          fStack_6d8 = fVar142 * fVar137 * -fVar143;
          auVar67._8_4_ = fStack_6d8;
          fStack_6d4 = fVar145 * fVar141 * -fVar146;
          auVar67._12_4_ = fStack_6d4;
          fStack_6d0 = fVar148 * fVar229 * -fVar149;
          auVar67._16_4_ = fStack_6d0;
          fStack_6cc = fVar151 * fVar258 * -fVar152;
          auVar67._20_4_ = fStack_6cc;
          fStack_6c8 = fVar154 * fVar210 * -fVar155;
          auVar67._24_4_ = fStack_6c8;
          auVar67._28_4_ = -fVar158;
          local_6e0 = local_7e0._0_4_ + local_6e0;
          fStack_6dc = local_7e0._4_4_ + fStack_6dc;
          fStack_6d8 = local_7e0._8_4_ + fStack_6d8;
          fStack_6d4 = local_7e0._12_4_ + fStack_6d4;
          fStack_6d0 = local_7e0._16_4_ + fStack_6d0;
          fStack_6cc = local_7e0._20_4_ + fStack_6cc;
          fStack_6c8 = local_7e0._24_4_ + fStack_6c8;
          fStack_6c4 = local_7e0._28_4_ + -fVar158;
          fVar203 = fVar174 * 0.0 * fVar119;
          fVar204 = fVar295 * 0.0 * fVar138;
          auVar68._4_4_ = fVar204;
          auVar68._0_4_ = fVar203;
          fVar206 = fVar137 * 0.0 * fVar142;
          auVar68._8_4_ = fVar206;
          fVar252 = fVar141 * 0.0 * fVar145;
          auVar68._12_4_ = fVar252;
          fVar256 = fVar229 * 0.0 * fVar148;
          auVar68._16_4_ = fVar256;
          fVar309 = fVar258 * 0.0 * fVar151;
          auVar68._20_4_ = fVar309;
          fVar311 = fVar210 * 0.0 * fVar154;
          auVar68._24_4_ = fVar311;
          auVar68._28_4_ = fVar158;
          auVar17 = vsubps_avx(auVar323,auVar66);
          auVar337._0_4_ = fVar203 + auVar132._0_4_;
          auVar337._4_4_ = fVar204 + auVar132._4_4_;
          auVar337._8_4_ = fVar206 + auVar132._8_4_;
          auVar337._12_4_ = fVar252 + auVar132._12_4_;
          auVar337._16_4_ = fVar256 + auVar132._16_4_;
          auVar337._20_4_ = fVar309 + auVar132._20_4_;
          auVar337._24_4_ = fVar311 + auVar132._24_4_;
          auVar337._28_4_ = fVar158 + auVar132._28_4_;
          fVar203 = auVar265._0_4_ * fVar207 * fVar239;
          fVar239 = auVar265._4_4_ * fVar277 * fVar241;
          auVar69._4_4_ = fVar239;
          auVar69._0_4_ = fVar203;
          fVar204 = auVar265._8_4_ * fVar208 * fVar243;
          auVar69._8_4_ = fVar204;
          fVar241 = auVar265._12_4_ * fVar281 * fVar254;
          auVar69._12_4_ = fVar241;
          fVar206 = auVar265._16_4_ * fVar209 * fVar319;
          auVar69._16_4_ = fVar206;
          fVar243 = auVar265._20_4_ * fVar283 * fVar205;
          auVar69._20_4_ = fVar243;
          fVar252 = auVar265._24_4_ * fVar211 * fVar310;
          auVar69._24_4_ = fVar252;
          auVar69._28_4_ = fVar157;
          auVar272 = vsubps_avx(local_7e0,auVar67);
          auVar325._0_4_ = local_320._0_4_ + fVar203;
          auVar325._4_4_ = local_320._4_4_ + fVar239;
          auVar325._8_4_ = local_320._8_4_ + fVar204;
          auVar325._12_4_ = local_320._12_4_ + fVar241;
          auVar325._16_4_ = local_320._16_4_ + fVar206;
          auVar325._20_4_ = local_320._20_4_ + fVar243;
          auVar325._24_4_ = local_320._24_4_ + fVar252;
          auVar325._28_4_ = local_320._28_4_ + fVar157;
          fVar203 = fVar207 * -fVar270 * auVar265._0_4_;
          fVar239 = fVar277 * -fVar266 * auVar265._4_4_;
          auVar70._4_4_ = fVar239;
          auVar70._0_4_ = fVar203;
          fVar204 = fVar208 * -fVar279 * auVar265._8_4_;
          auVar70._8_4_ = fVar204;
          fVar241 = fVar281 * -fVar267 * auVar265._12_4_;
          auVar70._12_4_ = fVar241;
          fVar206 = fVar209 * -fVar282 * auVar265._16_4_;
          auVar70._16_4_ = fVar206;
          fVar243 = fVar283 * -fVar268 * auVar265._20_4_;
          auVar70._20_4_ = fVar243;
          fVar252 = fVar211 * -fVar284 * auVar265._24_4_;
          auVar70._24_4_ = fVar252;
          auVar70._28_4_ = auVar323._28_4_;
          auVar308 = vsubps_avx(auVar132,auVar68);
          auVar222._0_4_ = auVar235._0_4_ + fVar203;
          auVar222._4_4_ = auVar235._4_4_ + fVar239;
          auVar222._8_4_ = auVar235._8_4_ + fVar204;
          auVar222._12_4_ = auVar235._12_4_ + fVar241;
          auVar222._16_4_ = auVar235._16_4_ + fVar206;
          auVar222._20_4_ = auVar235._20_4_ + fVar243;
          auVar222._24_4_ = auVar235._24_4_ + fVar252;
          auVar222._28_4_ = auVar235._28_4_ + auVar323._28_4_;
          fVar203 = fVar207 * 0.0 * auVar265._0_4_;
          fVar239 = fVar277 * 0.0 * auVar265._4_4_;
          auVar71._4_4_ = fVar239;
          auVar71._0_4_ = fVar203;
          fVar204 = fVar208 * 0.0 * auVar265._8_4_;
          auVar71._8_4_ = fVar204;
          fVar241 = fVar281 * 0.0 * auVar265._12_4_;
          auVar71._12_4_ = fVar241;
          fVar206 = fVar209 * 0.0 * auVar265._16_4_;
          auVar71._16_4_ = fVar206;
          fVar243 = fVar283 * 0.0 * auVar265._20_4_;
          auVar71._20_4_ = fVar243;
          fVar252 = fVar211 * 0.0 * auVar265._24_4_;
          auVar71._24_4_ = fVar252;
          auVar71._28_4_ = auVar132._28_4_;
          auVar201 = vsubps_avx(local_320,auVar69);
          auVar105._4_4_ = fStack_65c;
          auVar105._0_4_ = local_660;
          auVar105._8_4_ = fStack_658;
          auVar105._12_4_ = fStack_654;
          auVar105._16_4_ = fStack_650;
          auVar105._20_4_ = fStack_64c;
          auVar105._24_4_ = fStack_648;
          auVar105._28_4_ = fStack_644;
          auVar291._0_4_ = local_660 + fVar203;
          auVar291._4_4_ = fStack_65c + fVar239;
          auVar291._8_4_ = fStack_658 + fVar204;
          auVar291._12_4_ = fStack_654 + fVar241;
          auVar291._16_4_ = fStack_650 + fVar206;
          auVar291._20_4_ = fStack_64c + fVar243;
          auVar291._24_4_ = fStack_648 + fVar252;
          auVar291._28_4_ = fStack_644 + auVar132._28_4_;
          auVar20 = vsubps_avx(auVar235,auVar70);
          auVar130 = vsubps_avx(auVar105,auVar71);
          auVar19 = vsubps_avx(auVar222,auVar272);
          auVar26 = vsubps_avx(auVar291,auVar308);
          auVar72._4_4_ = auVar308._4_4_ * auVar19._4_4_;
          auVar72._0_4_ = auVar308._0_4_ * auVar19._0_4_;
          auVar72._8_4_ = auVar308._8_4_ * auVar19._8_4_;
          auVar72._12_4_ = auVar308._12_4_ * auVar19._12_4_;
          auVar72._16_4_ = auVar308._16_4_ * auVar19._16_4_;
          auVar72._20_4_ = auVar308._20_4_ * auVar19._20_4_;
          auVar72._24_4_ = auVar308._24_4_ * auVar19._24_4_;
          auVar72._28_4_ = auVar316._28_4_;
          auVar73._4_4_ = auVar272._4_4_ * auVar26._4_4_;
          auVar73._0_4_ = auVar272._0_4_ * auVar26._0_4_;
          auVar73._8_4_ = auVar272._8_4_ * auVar26._8_4_;
          auVar73._12_4_ = auVar272._12_4_ * auVar26._12_4_;
          auVar73._16_4_ = auVar272._16_4_ * auVar26._16_4_;
          auVar73._20_4_ = auVar272._20_4_ * auVar26._20_4_;
          auVar73._24_4_ = auVar272._24_4_ * auVar26._24_4_;
          auVar73._28_4_ = auVar235._28_4_;
          auVar24 = vsubps_avx(auVar73,auVar72);
          auVar74._4_4_ = auVar17._4_4_ * auVar26._4_4_;
          auVar74._0_4_ = auVar17._0_4_ * auVar26._0_4_;
          auVar74._8_4_ = auVar17._8_4_ * auVar26._8_4_;
          auVar74._12_4_ = auVar17._12_4_ * auVar26._12_4_;
          auVar74._16_4_ = auVar17._16_4_ * auVar26._16_4_;
          auVar74._20_4_ = auVar17._20_4_ * auVar26._20_4_;
          auVar74._24_4_ = auVar17._24_4_ * auVar26._24_4_;
          auVar74._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar325,auVar17);
          auVar75._4_4_ = auVar308._4_4_ * auVar26._4_4_;
          auVar75._0_4_ = auVar308._0_4_ * auVar26._0_4_;
          auVar75._8_4_ = auVar308._8_4_ * auVar26._8_4_;
          auVar75._12_4_ = auVar308._12_4_ * auVar26._12_4_;
          auVar75._16_4_ = auVar308._16_4_ * auVar26._16_4_;
          auVar75._20_4_ = auVar308._20_4_ * auVar26._20_4_;
          auVar75._24_4_ = auVar308._24_4_ * auVar26._24_4_;
          auVar75._28_4_ = auVar16._28_4_;
          auVar196 = vsubps_avx(auVar75,auVar74);
          auVar76._4_4_ = auVar272._4_4_ * auVar26._4_4_;
          auVar76._0_4_ = auVar272._0_4_ * auVar26._0_4_;
          auVar76._8_4_ = auVar272._8_4_ * auVar26._8_4_;
          auVar76._12_4_ = auVar272._12_4_ * auVar26._12_4_;
          auVar76._16_4_ = auVar272._16_4_ * auVar26._16_4_;
          auVar76._20_4_ = auVar272._20_4_ * auVar26._20_4_;
          auVar76._24_4_ = auVar272._24_4_ * auVar26._24_4_;
          auVar76._28_4_ = auVar16._28_4_;
          auVar77._4_4_ = auVar17._4_4_ * auVar19._4_4_;
          auVar77._0_4_ = auVar17._0_4_ * auVar19._0_4_;
          auVar77._8_4_ = auVar17._8_4_ * auVar19._8_4_;
          auVar77._12_4_ = auVar17._12_4_ * auVar19._12_4_;
          auVar77._16_4_ = auVar17._16_4_ * auVar19._16_4_;
          auVar77._20_4_ = auVar17._20_4_ * auVar19._20_4_;
          auVar77._24_4_ = auVar17._24_4_ * auVar19._24_4_;
          auVar77._28_4_ = auVar19._28_4_;
          auVar16 = vsubps_avx(auVar77,auVar76);
          auVar169._0_4_ = auVar24._0_4_ * 0.0 + auVar16._0_4_ + auVar196._0_4_ * 0.0;
          auVar169._4_4_ = auVar24._4_4_ * 0.0 + auVar16._4_4_ + auVar196._4_4_ * 0.0;
          auVar169._8_4_ = auVar24._8_4_ * 0.0 + auVar16._8_4_ + auVar196._8_4_ * 0.0;
          auVar169._12_4_ = auVar24._12_4_ * 0.0 + auVar16._12_4_ + auVar196._12_4_ * 0.0;
          auVar169._16_4_ = auVar24._16_4_ * 0.0 + auVar16._16_4_ + auVar196._16_4_ * 0.0;
          auVar169._20_4_ = auVar24._20_4_ * 0.0 + auVar16._20_4_ + auVar196._20_4_ * 0.0;
          auVar169._24_4_ = auVar24._24_4_ * 0.0 + auVar16._24_4_ + auVar196._24_4_ * 0.0;
          auVar169._28_4_ = auVar24._28_4_ + auVar16._28_4_ + auVar196._28_4_;
          auVar218 = vcmpps_avx(auVar169,ZEXT832(0) << 0x20,2);
          auVar201 = vblendvps_avx(auVar201,_local_6c0,auVar218);
          auVar103._4_4_ = fStack_6dc;
          auVar103._0_4_ = local_6e0;
          auVar103._8_4_ = fStack_6d8;
          auVar103._12_4_ = fStack_6d4;
          auVar103._16_4_ = fStack_6d0;
          auVar103._20_4_ = fStack_6cc;
          auVar103._24_4_ = fStack_6c8;
          auVar103._28_4_ = fStack_6c4;
          auVar16 = vblendvps_avx(auVar20,auVar103,auVar218);
          auVar20 = vblendvps_avx(auVar130,auVar337,auVar218);
          auVar130 = vblendvps_avx(auVar17,auVar325,auVar218);
          auVar19 = vblendvps_avx(auVar272,auVar222,auVar218);
          auVar26 = vblendvps_avx(auVar308,auVar291,auVar218);
          auVar17 = vblendvps_avx(auVar325,auVar17,auVar218);
          auVar24 = vblendvps_avx(auVar222,auVar272,auVar218);
          auVar196 = vblendvps_avx(auVar291,auVar308,auVar218);
          local_7e0 = vandps_avx(local_640,auVar199);
          auVar17 = vsubps_avx(auVar17,auVar201);
          auVar313 = vsubps_avx(auVar24,auVar16);
          auVar196 = vsubps_avx(auVar196,auVar20);
          auVar25 = vsubps_avx(auVar16,auVar19);
          fVar203 = auVar313._0_4_;
          fVar144 = auVar20._0_4_;
          fVar254 = auVar313._4_4_;
          fVar147 = auVar20._4_4_;
          auVar78._4_4_ = fVar147 * fVar254;
          auVar78._0_4_ = fVar144 * fVar203;
          fVar270 = auVar313._8_4_;
          fVar150 = auVar20._8_4_;
          auVar78._8_4_ = fVar150 * fVar270;
          fVar281 = auVar313._12_4_;
          fVar153 = auVar20._12_4_;
          auVar78._12_4_ = fVar153 * fVar281;
          fVar174 = auVar313._16_4_;
          fVar156 = auVar20._16_4_;
          auVar78._16_4_ = fVar156 * fVar174;
          fVar120 = auVar313._20_4_;
          fVar212 = auVar20._20_4_;
          auVar78._20_4_ = fVar212 * fVar120;
          fVar158 = auVar313._24_4_;
          fVar223 = auVar20._24_4_;
          auVar78._24_4_ = fVar223 * fVar158;
          auVar78._28_4_ = auVar24._28_4_;
          fVar239 = auVar16._0_4_;
          fVar225 = auVar196._0_4_;
          fVar256 = auVar16._4_4_;
          fVar227 = auVar196._4_4_;
          auVar79._4_4_ = fVar227 * fVar256;
          auVar79._0_4_ = fVar225 * fVar239;
          fVar207 = auVar16._8_4_;
          fVar231 = auVar196._8_4_;
          auVar79._8_4_ = fVar231 * fVar207;
          fVar282 = auVar16._12_4_;
          fVar238 = auVar196._12_4_;
          auVar79._12_4_ = fVar238 * fVar282;
          fVar295 = auVar16._16_4_;
          fVar240 = auVar196._16_4_;
          auVar79._16_4_ = fVar240 * fVar295;
          fVar139 = auVar16._20_4_;
          fVar242 = auVar196._20_4_;
          auVar79._20_4_ = fVar242 * fVar139;
          fVar175 = auVar16._24_4_;
          fVar244 = auVar196._24_4_;
          uVar9 = auVar272._28_4_;
          auVar79._24_4_ = fVar244 * fVar175;
          auVar79._28_4_ = uVar9;
          auVar24 = vsubps_avx(auVar79,auVar78);
          fVar204 = auVar201._0_4_;
          fVar319 = auVar201._4_4_;
          auVar80._4_4_ = fVar227 * fVar319;
          auVar80._0_4_ = fVar225 * fVar204;
          fVar266 = auVar201._8_4_;
          auVar80._8_4_ = fVar231 * fVar266;
          fVar209 = auVar201._12_4_;
          auVar80._12_4_ = fVar238 * fVar209;
          fVar137 = auVar201._16_4_;
          auVar80._16_4_ = fVar240 * fVar137;
          fVar143 = auVar201._20_4_;
          auVar80._20_4_ = fVar242 * fVar143;
          fVar259 = auVar201._24_4_;
          auVar80._24_4_ = fVar244 * fVar259;
          auVar80._28_4_ = uVar9;
          fVar241 = auVar17._0_4_;
          fVar309 = auVar17._4_4_;
          auVar81._4_4_ = fVar147 * fVar309;
          auVar81._0_4_ = fVar144 * fVar241;
          fVar277 = auVar17._8_4_;
          auVar81._8_4_ = fVar150 * fVar277;
          fVar268 = auVar17._12_4_;
          auVar81._12_4_ = fVar153 * fVar268;
          fVar141 = auVar17._16_4_;
          auVar81._16_4_ = fVar156 * fVar141;
          fVar146 = auVar17._20_4_;
          auVar81._20_4_ = fVar212 * fVar146;
          fVar294 = auVar17._24_4_;
          auVar81._24_4_ = fVar223 * fVar294;
          auVar81._28_4_ = auVar325._28_4_;
          auVar272 = vsubps_avx(auVar81,auVar80);
          auVar82._4_4_ = fVar256 * fVar309;
          auVar82._0_4_ = fVar239 * fVar241;
          auVar82._8_4_ = fVar207 * fVar277;
          auVar82._12_4_ = fVar282 * fVar268;
          auVar82._16_4_ = fVar295 * fVar141;
          auVar82._20_4_ = fVar139 * fVar146;
          auVar82._24_4_ = fVar175 * fVar294;
          auVar82._28_4_ = uVar9;
          auVar83._4_4_ = fVar319 * fVar254;
          auVar83._0_4_ = fVar204 * fVar203;
          auVar83._8_4_ = fVar266 * fVar270;
          auVar83._12_4_ = fVar209 * fVar281;
          auVar83._16_4_ = fVar137 * fVar174;
          auVar83._20_4_ = fVar143 * fVar120;
          auVar83._24_4_ = fVar259 * fVar158;
          auVar83._28_4_ = auVar308._28_4_;
          auVar308 = vsubps_avx(auVar83,auVar82);
          auVar20 = vsubps_avx(auVar20,auVar26);
          fVar243 = auVar308._28_4_ + auVar272._28_4_;
          auVar300._0_4_ = auVar308._0_4_ + auVar272._0_4_ * 0.0 + auVar24._0_4_ * 0.0;
          auVar300._4_4_ = auVar308._4_4_ + auVar272._4_4_ * 0.0 + auVar24._4_4_ * 0.0;
          auVar300._8_4_ = auVar308._8_4_ + auVar272._8_4_ * 0.0 + auVar24._8_4_ * 0.0;
          auVar300._12_4_ = auVar308._12_4_ + auVar272._12_4_ * 0.0 + auVar24._12_4_ * 0.0;
          auVar300._16_4_ = auVar308._16_4_ + auVar272._16_4_ * 0.0 + auVar24._16_4_ * 0.0;
          auVar300._20_4_ = auVar308._20_4_ + auVar272._20_4_ * 0.0 + auVar24._20_4_ * 0.0;
          auVar300._24_4_ = auVar308._24_4_ + auVar272._24_4_ * 0.0 + auVar24._24_4_ * 0.0;
          auVar300._28_4_ = fVar243 + auVar24._28_4_;
          fVar206 = auVar25._0_4_;
          fVar205 = auVar25._4_4_;
          auVar84._4_4_ = auVar26._4_4_ * fVar205;
          auVar84._0_4_ = auVar26._0_4_ * fVar206;
          fVar279 = auVar25._8_4_;
          auVar84._8_4_ = auVar26._8_4_ * fVar279;
          fVar283 = auVar25._12_4_;
          auVar84._12_4_ = auVar26._12_4_ * fVar283;
          fVar229 = auVar25._16_4_;
          auVar84._16_4_ = auVar26._16_4_ * fVar229;
          fVar149 = auVar25._20_4_;
          auVar84._20_4_ = auVar26._20_4_ * fVar149;
          fVar118 = auVar25._24_4_;
          auVar84._24_4_ = auVar26._24_4_ * fVar118;
          auVar84._28_4_ = fVar243;
          fVar243 = auVar20._0_4_;
          fVar311 = auVar20._4_4_;
          auVar85._4_4_ = auVar19._4_4_ * fVar311;
          auVar85._0_4_ = auVar19._0_4_ * fVar243;
          fVar208 = auVar20._8_4_;
          auVar85._8_4_ = auVar19._8_4_ * fVar208;
          fVar284 = auVar20._12_4_;
          auVar85._12_4_ = auVar19._12_4_ * fVar284;
          fVar258 = auVar20._16_4_;
          auVar85._16_4_ = auVar19._16_4_ * fVar258;
          fVar152 = auVar20._20_4_;
          auVar85._20_4_ = auVar19._20_4_ * fVar152;
          fVar136 = auVar20._24_4_;
          auVar85._24_4_ = auVar19._24_4_ * fVar136;
          auVar85._28_4_ = auVar308._28_4_;
          auVar272 = vsubps_avx(auVar85,auVar84);
          auVar308 = vsubps_avx(auVar201,auVar130);
          fVar252 = auVar308._0_4_;
          fVar310 = auVar308._4_4_;
          auVar86._4_4_ = auVar26._4_4_ * fVar310;
          auVar86._0_4_ = auVar26._0_4_ * fVar252;
          fVar267 = auVar308._8_4_;
          auVar86._8_4_ = auVar26._8_4_ * fVar267;
          fVar211 = auVar308._12_4_;
          auVar86._12_4_ = auVar26._12_4_ * fVar211;
          fVar210 = auVar308._16_4_;
          auVar86._16_4_ = auVar26._16_4_ * fVar210;
          fVar155 = auVar308._20_4_;
          auVar86._20_4_ = auVar26._20_4_ * fVar155;
          fVar140 = auVar308._24_4_;
          auVar86._24_4_ = auVar26._24_4_ * fVar140;
          auVar86._28_4_ = auVar26._28_4_;
          auVar87._4_4_ = fVar311 * auVar130._4_4_;
          auVar87._0_4_ = fVar243 * auVar130._0_4_;
          auVar87._8_4_ = fVar208 * auVar130._8_4_;
          auVar87._12_4_ = fVar284 * auVar130._12_4_;
          auVar87._16_4_ = fVar258 * auVar130._16_4_;
          auVar87._20_4_ = fVar152 * auVar130._20_4_;
          auVar87._24_4_ = fVar136 * auVar130._24_4_;
          auVar87._28_4_ = auVar24._28_4_;
          auVar201 = vsubps_avx(auVar86,auVar87);
          auVar88._4_4_ = auVar19._4_4_ * fVar310;
          auVar88._0_4_ = auVar19._0_4_ * fVar252;
          auVar88._8_4_ = auVar19._8_4_ * fVar267;
          auVar88._12_4_ = auVar19._12_4_ * fVar211;
          auVar88._16_4_ = auVar19._16_4_ * fVar210;
          auVar88._20_4_ = auVar19._20_4_ * fVar155;
          auVar88._24_4_ = auVar19._24_4_ * fVar140;
          auVar88._28_4_ = auVar19._28_4_;
          auVar89._4_4_ = fVar205 * auVar130._4_4_;
          auVar89._0_4_ = fVar206 * auVar130._0_4_;
          auVar89._8_4_ = fVar279 * auVar130._8_4_;
          auVar89._12_4_ = fVar283 * auVar130._12_4_;
          auVar89._16_4_ = fVar229 * auVar130._16_4_;
          auVar89._20_4_ = fVar149 * auVar130._20_4_;
          auVar89._24_4_ = fVar118 * auVar130._24_4_;
          auVar89._28_4_ = auVar130._28_4_;
          auVar130 = vsubps_avx(auVar89,auVar88);
          auVar133._0_4_ = auVar272._0_4_ * 0.0 + auVar130._0_4_ + auVar201._0_4_ * 0.0;
          auVar133._4_4_ = auVar272._4_4_ * 0.0 + auVar130._4_4_ + auVar201._4_4_ * 0.0;
          auVar133._8_4_ = auVar272._8_4_ * 0.0 + auVar130._8_4_ + auVar201._8_4_ * 0.0;
          auVar133._12_4_ = auVar272._12_4_ * 0.0 + auVar130._12_4_ + auVar201._12_4_ * 0.0;
          auVar133._16_4_ = auVar272._16_4_ * 0.0 + auVar130._16_4_ + auVar201._16_4_ * 0.0;
          auVar133._20_4_ = auVar272._20_4_ * 0.0 + auVar130._20_4_ + auVar201._20_4_ * 0.0;
          auVar133._24_4_ = auVar272._24_4_ * 0.0 + auVar130._24_4_ + auVar201._24_4_ * 0.0;
          auVar133._28_4_ = auVar201._28_4_ + auVar130._28_4_ + auVar201._28_4_;
          auVar201 = vmaxps_avx(auVar300,auVar133);
          auVar201 = vcmpps_avx(auVar201,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar130 = local_7e0 & auVar201;
          if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar130 >> 0x7f,0) == '\0') &&
                (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar130 >> 0xbf,0) == '\0') &&
              (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar130[0x1f]) {
LAB_0086772b:
            auVar202 = ZEXT3264(CONCAT824(uStack_5c8,
                                          CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            auVar318._4_4_ = fVar138;
            auVar318._0_4_ = fVar119;
            auVar318._8_4_ = fVar142;
            auVar318._12_4_ = fVar145;
            auVar318._16_4_ = fVar148;
            auVar318._20_4_ = fVar151;
            auVar318._24_4_ = fVar154;
            auVar318._28_4_ = fVar157;
          }
          else {
            auVar130 = vandps_avx(auVar201,local_7e0);
            auVar90._4_4_ = fVar311 * fVar254;
            auVar90._0_4_ = fVar243 * fVar203;
            auVar90._8_4_ = fVar208 * fVar270;
            auVar90._12_4_ = fVar284 * fVar281;
            auVar90._16_4_ = fVar258 * fVar174;
            auVar90._20_4_ = fVar152 * fVar120;
            auVar90._24_4_ = fVar136 * fVar158;
            auVar90._28_4_ = local_7e0._28_4_;
            auVar91._4_4_ = fVar205 * fVar227;
            auVar91._0_4_ = fVar206 * fVar225;
            auVar91._8_4_ = fVar279 * fVar231;
            auVar91._12_4_ = fVar283 * fVar238;
            auVar91._16_4_ = fVar229 * fVar240;
            auVar91._20_4_ = fVar149 * fVar242;
            auVar91._24_4_ = fVar118 * fVar244;
            auVar91._28_4_ = auVar201._28_4_;
            auVar19 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar310 * fVar227;
            auVar92._0_4_ = fVar252 * fVar225;
            auVar92._8_4_ = fVar267 * fVar231;
            auVar92._12_4_ = fVar211 * fVar238;
            auVar92._16_4_ = fVar210 * fVar240;
            auVar92._20_4_ = fVar155 * fVar242;
            auVar92._24_4_ = fVar140 * fVar244;
            auVar92._28_4_ = auVar196._28_4_;
            auVar93._4_4_ = fVar311 * fVar309;
            auVar93._0_4_ = fVar243 * fVar241;
            auVar93._8_4_ = fVar208 * fVar277;
            auVar93._12_4_ = fVar284 * fVar268;
            auVar93._16_4_ = fVar258 * fVar141;
            auVar93._20_4_ = fVar152 * fVar146;
            auVar93._24_4_ = fVar136 * fVar294;
            auVar93._28_4_ = auVar20._28_4_;
            auVar26 = vsubps_avx(auVar93,auVar92);
            auVar94._4_4_ = fVar205 * fVar309;
            auVar94._0_4_ = fVar206 * fVar241;
            auVar94._8_4_ = fVar279 * fVar277;
            auVar94._12_4_ = fVar283 * fVar268;
            auVar94._16_4_ = fVar229 * fVar141;
            auVar94._20_4_ = fVar149 * fVar146;
            auVar94._24_4_ = fVar118 * fVar294;
            auVar94._28_4_ = auVar17._28_4_;
            auVar95._4_4_ = fVar310 * fVar254;
            auVar95._0_4_ = fVar252 * fVar203;
            auVar95._8_4_ = fVar267 * fVar270;
            auVar95._12_4_ = fVar211 * fVar281;
            auVar95._16_4_ = fVar210 * fVar174;
            auVar95._20_4_ = fVar155 * fVar120;
            auVar95._24_4_ = fVar140 * fVar158;
            auVar95._28_4_ = auVar313._28_4_;
            auVar24 = vsubps_avx(auVar95,auVar94);
            auVar274._0_4_ = auVar19._0_4_ * 0.0 + auVar24._0_4_ + auVar26._0_4_ * 0.0;
            auVar274._4_4_ = auVar19._4_4_ * 0.0 + auVar24._4_4_ + auVar26._4_4_ * 0.0;
            auVar274._8_4_ = auVar19._8_4_ * 0.0 + auVar24._8_4_ + auVar26._8_4_ * 0.0;
            auVar274._12_4_ = auVar19._12_4_ * 0.0 + auVar24._12_4_ + auVar26._12_4_ * 0.0;
            auVar274._16_4_ = auVar19._16_4_ * 0.0 + auVar24._16_4_ + auVar26._16_4_ * 0.0;
            auVar274._20_4_ = auVar19._20_4_ * 0.0 + auVar24._20_4_ + auVar26._20_4_ * 0.0;
            auVar274._24_4_ = auVar19._24_4_ * 0.0 + auVar24._24_4_ + auVar26._24_4_ * 0.0;
            auVar274._28_4_ = auVar25._28_4_ + auVar24._28_4_ + auVar17._28_4_;
            auVar201 = vrcpps_avx(auVar274);
            fVar203 = auVar201._0_4_;
            fVar241 = auVar201._4_4_;
            auVar96._4_4_ = auVar274._4_4_ * fVar241;
            auVar96._0_4_ = auVar274._0_4_ * fVar203;
            fVar206 = auVar201._8_4_;
            auVar96._8_4_ = auVar274._8_4_ * fVar206;
            fVar243 = auVar201._12_4_;
            auVar96._12_4_ = auVar274._12_4_ * fVar243;
            fVar252 = auVar201._16_4_;
            auVar96._16_4_ = auVar274._16_4_ * fVar252;
            fVar254 = auVar201._20_4_;
            auVar96._20_4_ = auVar274._20_4_ * fVar254;
            fVar309 = auVar201._24_4_;
            auVar96._24_4_ = auVar274._24_4_ * fVar309;
            auVar96._28_4_ = auVar20._28_4_;
            auVar317._8_4_ = 0x3f800000;
            auVar317._0_8_ = 0x3f8000003f800000;
            auVar317._12_4_ = 0x3f800000;
            auVar317._16_4_ = 0x3f800000;
            auVar317._20_4_ = 0x3f800000;
            auVar317._24_4_ = 0x3f800000;
            auVar317._28_4_ = 0x3f800000;
            auVar201 = vsubps_avx(auVar317,auVar96);
            fVar203 = auVar201._0_4_ * fVar203 + fVar203;
            fVar241 = auVar201._4_4_ * fVar241 + fVar241;
            fVar206 = auVar201._8_4_ * fVar206 + fVar206;
            fVar243 = auVar201._12_4_ * fVar243 + fVar243;
            fVar252 = auVar201._16_4_ * fVar252 + fVar252;
            fVar254 = auVar201._20_4_ * fVar254 + fVar254;
            fVar309 = auVar201._24_4_ * fVar309 + fVar309;
            auVar97._4_4_ =
                 (fVar319 * auVar19._4_4_ + auVar26._4_4_ * fVar256 + fVar147 * auVar24._4_4_) *
                 fVar241;
            auVar97._0_4_ =
                 (fVar204 * auVar19._0_4_ + auVar26._0_4_ * fVar239 + fVar144 * auVar24._0_4_) *
                 fVar203;
            auVar97._8_4_ =
                 (fVar266 * auVar19._8_4_ + auVar26._8_4_ * fVar207 + fVar150 * auVar24._8_4_) *
                 fVar206;
            auVar97._12_4_ =
                 (fVar209 * auVar19._12_4_ + auVar26._12_4_ * fVar282 + fVar153 * auVar24._12_4_) *
                 fVar243;
            auVar97._16_4_ =
                 (fVar137 * auVar19._16_4_ + auVar26._16_4_ * fVar295 + fVar156 * auVar24._16_4_) *
                 fVar252;
            auVar97._20_4_ =
                 (fVar143 * auVar19._20_4_ + auVar26._20_4_ * fVar139 + fVar212 * auVar24._20_4_) *
                 fVar254;
            auVar97._24_4_ =
                 (fVar259 * auVar19._24_4_ + auVar26._24_4_ * fVar175 + fVar223 * auVar24._24_4_) *
                 fVar309;
            auVar97._28_4_ = auVar16._28_4_ + auVar24._28_4_;
            uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar200._4_4_ = uVar9;
            auVar200._0_4_ = uVar9;
            auVar200._8_4_ = uVar9;
            auVar200._12_4_ = uVar9;
            auVar200._16_4_ = uVar9;
            auVar200._20_4_ = uVar9;
            auVar200._24_4_ = uVar9;
            auVar200._28_4_ = uVar9;
            auVar16 = vcmpps_avx(_local_380,auVar97,2);
            auVar201 = vcmpps_avx(auVar97,auVar200,2);
            auVar201 = vandps_avx(auVar16,auVar201);
            auVar20 = auVar130 & auVar201;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0x7f,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0xbf,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar20[0x1f]) goto LAB_0086772b;
            auVar201 = vandps_avx(auVar130,auVar201);
            auVar20 = vcmpps_avx(auVar274,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar130 = auVar201 & auVar20;
            auVar202 = ZEXT3264(CONCAT824(uStack_5c8,
                                          CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            auVar318._4_4_ = fVar138;
            auVar318._0_4_ = fVar119;
            auVar318._8_4_ = fVar142;
            auVar318._12_4_ = fVar145;
            auVar318._16_4_ = fVar148;
            auVar318._20_4_ = fVar151;
            auVar318._24_4_ = fVar154;
            auVar318._28_4_ = fVar157;
            if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar130 >> 0x7f,0) != '\0') ||
                  (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar130 >> 0xbf,0) != '\0') ||
                (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar130[0x1f] < '\0') {
              auVar201 = vandps_avx(auVar20,auVar201);
              auVar202 = ZEXT3264(auVar201);
              auVar98._4_4_ = auVar300._4_4_ * fVar241;
              auVar98._0_4_ = auVar300._0_4_ * fVar203;
              auVar98._8_4_ = auVar300._8_4_ * fVar206;
              auVar98._12_4_ = auVar300._12_4_ * fVar243;
              auVar98._16_4_ = auVar300._16_4_ * fVar252;
              auVar98._20_4_ = auVar300._20_4_ * fVar254;
              auVar98._24_4_ = auVar300._24_4_ * fVar309;
              auVar98._28_4_ = auVar16._28_4_;
              auVar99._4_4_ = auVar133._4_4_ * fVar241;
              auVar99._0_4_ = auVar133._0_4_ * fVar203;
              auVar99._8_4_ = auVar133._8_4_ * fVar206;
              auVar99._12_4_ = auVar133._12_4_ * fVar243;
              auVar99._16_4_ = auVar133._16_4_ * fVar252;
              auVar99._20_4_ = auVar133._20_4_ * fVar254;
              auVar99._24_4_ = auVar133._24_4_ * fVar309;
              auVar99._28_4_ = auVar133._28_4_;
              auVar251._8_4_ = 0x3f800000;
              auVar251._0_8_ = 0x3f8000003f800000;
              auVar251._12_4_ = 0x3f800000;
              auVar251._16_4_ = 0x3f800000;
              auVar251._20_4_ = 0x3f800000;
              auVar251._24_4_ = 0x3f800000;
              auVar251._28_4_ = 0x3f800000;
              auVar201 = vsubps_avx(auVar251,auVar98);
              local_5c0 = vblendvps_avx(auVar201,auVar98,auVar218);
              auVar201 = vsubps_avx(auVar251,auVar99);
              _local_3c0 = vblendvps_avx(auVar201,auVar99,auVar218);
              local_580 = auVar97;
            }
          }
          auVar275 = ZEXT3264(local_7c0);
          auVar201 = auVar202._0_32_;
          _local_760 = auVar265;
          local_4c0 = auVar199;
          if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar201 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar201 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar201 >> 0x7f,0) == '\0') &&
                (auVar202 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar201 >> 0xbf,0) == '\0') &&
              (auVar202 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar202[0x1f]) {
LAB_00867415:
            auVar173 = ZEXT3264(local_5c0);
            fVar176 = (float)local_740._0_4_;
            fVar188 = (float)local_740._4_4_;
            fVar189 = fStack_738;
            fVar190 = fStack_734;
            fVar230 = fStack_730;
            fVar191 = fStack_72c;
            fVar237 = fStack_728;
          }
          else {
            auVar16 = vsubps_avx(auVar265,auVar318);
            fVar239 = auVar318._0_4_ + auVar16._0_4_ * local_5c0._0_4_;
            fVar204 = auVar318._4_4_ + auVar16._4_4_ * local_5c0._4_4_;
            fVar241 = auVar318._8_4_ + auVar16._8_4_ * local_5c0._8_4_;
            fVar206 = auVar318._12_4_ + auVar16._12_4_ * local_5c0._12_4_;
            fVar243 = auVar318._16_4_ + auVar16._16_4_ * local_5c0._16_4_;
            fVar252 = auVar318._20_4_ + auVar16._20_4_ * local_5c0._20_4_;
            fVar254 = auVar318._24_4_ + auVar16._24_4_ * local_5c0._24_4_;
            fVar256 = auVar318._28_4_ + auVar16._28_4_;
            fVar203 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar100._4_4_ = (fVar204 + fVar204) * fVar203;
            auVar100._0_4_ = (fVar239 + fVar239) * fVar203;
            auVar100._8_4_ = (fVar241 + fVar241) * fVar203;
            auVar100._12_4_ = (fVar206 + fVar206) * fVar203;
            auVar100._16_4_ = (fVar243 + fVar243) * fVar203;
            auVar100._20_4_ = (fVar252 + fVar252) * fVar203;
            auVar100._24_4_ = (fVar254 + fVar254) * fVar203;
            auVar100._28_4_ = fVar256 + fVar256;
            auVar16 = vcmpps_avx(local_580,auVar100,6);
            auVar20 = auVar201 & auVar16;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0x7f,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0xbf,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar20[0x1f]) {
              auVar173 = ZEXT3264(local_5c0);
            }
            else {
              local_3c0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
              local_3c0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
              uStack_3b8._0_4_ = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
              uStack_3b8._4_4_ = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
              uStack_3b0._0_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
              uStack_3b0._4_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
              uStack_3a8._0_4_ = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
              uStack_3a8._4_4_ = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
              local_2a0 = local_5c0;
              auVar110 = _local_3c0;
              auVar20 = _local_3c0;
              local_280 = (float)local_3c0._0_4_;
              fStack_27c = (float)local_3c0._4_4_;
              fStack_278 = (float)uStack_3b8;
              fStack_274 = uStack_3b8._4_4_;
              fStack_270 = (float)uStack_3b0;
              fStack_26c = uStack_3b0._4_4_;
              fStack_268 = (float)uStack_3a8;
              fStack_264 = uStack_3a8._4_4_;
              local_260 = local_580;
              local_23c = uVar12;
              local_230 = local_8a0;
              fStack_22c = fStack_89c;
              fStack_228 = fStack_898;
              fStack_224 = fStack_894;
              local_220 = local_880;
              fStack_21c = fStack_87c;
              fStack_218 = fStack_878;
              fStack_214 = fStack_874;
              local_210 = local_890;
              fStack_20c = fStack_88c;
              fStack_208 = fStack_888;
              fStack_204 = fStack_884;
              local_200 = local_830;
              fStack_1fc = fStack_82c;
              fStack_1f8 = fStack_828;
              fStack_1f4 = fStack_824;
              pGVar14 = (context->scene->geometries).items[uVar111].ptr;
              auVar173 = ZEXT3264(local_5c0);
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                local_620 = vandps_avx(auVar16,auVar201);
                auVar182._0_4_ = (float)(int)local_240;
                auVar182._4_12_ = auVar308._4_12_;
                auVar234 = vshufps_avx(auVar182,auVar182,0);
                local_1c0[0] = (auVar234._0_4_ + local_5c0._0_4_ + 0.0) * (float)local_e0._0_4_;
                local_1c0[1] = (auVar234._4_4_ + local_5c0._4_4_ + 1.0) * (float)local_e0._4_4_;
                local_1c0[2] = (auVar234._8_4_ + local_5c0._8_4_ + 2.0) * fStack_d8;
                local_1c0[3] = (auVar234._12_4_ + local_5c0._12_4_ + 3.0) * fStack_d4;
                fStack_1b0 = (auVar234._0_4_ + local_5c0._16_4_ + 4.0) * fStack_d0;
                fStack_1ac = (auVar234._4_4_ + local_5c0._20_4_ + 5.0) * fStack_cc;
                fStack_1a8 = (auVar234._8_4_ + local_5c0._24_4_ + 6.0) * fStack_c8;
                fStack_1a4 = auVar234._12_4_ + local_5c0._28_4_ + 7.0;
                uStack_3b0 = auVar110._16_8_;
                uStack_3a8 = auVar20._24_8_;
                local_1a0 = local_3c0;
                uStack_198 = uStack_3b8;
                uStack_190 = uStack_3b0;
                uStack_188 = uStack_3a8;
                local_180 = local_580;
                auVar170._8_4_ = 0x7f800000;
                auVar170._0_8_ = 0x7f8000007f800000;
                auVar170._12_4_ = 0x7f800000;
                auVar170._16_4_ = 0x7f800000;
                auVar170._20_4_ = 0x7f800000;
                auVar170._24_4_ = 0x7f800000;
                auVar170._28_4_ = 0x7f800000;
                auVar201 = vblendvps_avx(auVar170,local_580,local_620);
                auVar16 = vshufps_avx(auVar201,auVar201,0xb1);
                auVar16 = vminps_avx(auVar201,auVar16);
                auVar130 = vshufpd_avx(auVar16,auVar16,5);
                auVar16 = vminps_avx(auVar16,auVar130);
                auVar130 = vperm2f128_avx(auVar16,auVar16,1);
                auVar16 = vminps_avx(auVar16,auVar130);
                auVar16 = vcmpps_avx(auVar201,auVar16,0);
                auVar130 = local_620 & auVar16;
                auVar201 = local_620;
                if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar130 >> 0x7f,0) != '\0') ||
                      (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar130 >> 0xbf,0) != '\0') ||
                    (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar130[0x1f] < '\0') {
                  auVar201 = vandps_avx(auVar16,local_620);
                }
                uVar113 = vmovmskps_avx(auVar201);
                uVar11 = 0;
                if (uVar113 != 0) {
                  for (; (uVar113 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                  }
                }
                uVar115 = (ulong)uVar11;
                _local_3c0 = auVar20;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar230 = local_1c0[uVar115];
                  uVar9 = *(undefined4 *)((long)&local_1a0 + uVar115 * 4);
                  fVar237 = 1.0 - fVar230;
                  fVar191 = fVar230 * fVar237 * 4.0;
                  auVar234 = ZEXT416((uint)(fVar230 * fVar230 * 0.5));
                  auVar234 = vshufps_avx(auVar234,auVar234,0);
                  auVar183 = ZEXT416((uint)((fVar237 * fVar237 + fVar191) * 0.5));
                  auVar183 = vshufps_avx(auVar183,auVar183,0);
                  auVar217 = ZEXT416((uint)((-fVar230 * fVar230 - fVar191) * 0.5));
                  auVar217 = vshufps_avx(auVar217,auVar217,0);
                  auVar195 = ZEXT416((uint)(fVar237 * -fVar237 * 0.5));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  auVar184._0_4_ =
                       local_8a0 * auVar195._0_4_ +
                       local_880 * auVar217._0_4_ +
                       local_830 * auVar234._0_4_ + local_890 * auVar183._0_4_;
                  auVar184._4_4_ =
                       fStack_89c * auVar195._4_4_ +
                       fStack_87c * auVar217._4_4_ +
                       fStack_82c * auVar234._4_4_ + fStack_88c * auVar183._4_4_;
                  auVar184._8_4_ =
                       fStack_898 * auVar195._8_4_ +
                       fStack_878 * auVar217._8_4_ +
                       fStack_828 * auVar234._8_4_ + fStack_888 * auVar183._8_4_;
                  auVar184._12_4_ =
                       fStack_894 * auVar195._12_4_ +
                       fStack_874 * auVar217._12_4_ +
                       fStack_824 * auVar234._12_4_ + fStack_884 * auVar183._12_4_;
                  auVar202 = ZEXT464(*(uint *)(local_180 + uVar115 * 4));
                  *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_180 + uVar115 * 4);
                  *(float *)(ray + k * 4 + 0xc0) = auVar184._0_4_;
                  uVar13 = vextractps_avx(auVar184,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                  uVar13 = vextractps_avx(auVar184,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
                  *(float *)(ray + k * 4 + 0xf0) = fVar230;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar9;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_808;
                  *(uint *)(ray + k * 4 + 0x120) = uVar111;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  stack0xfffffffffffff968 = auVar235._8_24_;
                  auStack_7f0 = auVar323._16_16_;
                  local_800 = *local_718;
                  local_7e0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  local_720 = ray;
                  _local_560 = *pauVar4;
                  while( true ) {
                    local_420 = local_1c0[uVar115];
                    local_760 = (undefined1  [8])uVar115;
                    local_410 = *(undefined4 *)((long)&local_1a0 + uVar115 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar115 * 4);
                    fVar191 = 1.0 - local_420;
                    fVar230 = local_420 * fVar191 * 4.0;
                    auVar234 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                    auVar234 = vshufps_avx(auVar234,auVar234,0);
                    auVar183 = ZEXT416((uint)((fVar191 * fVar191 + fVar230) * 0.5));
                    auVar183 = vshufps_avx(auVar183,auVar183,0);
                    auVar217 = ZEXT416((uint)((-local_420 * local_420 - fVar230) * 0.5));
                    auVar217 = vshufps_avx(auVar217,auVar217,0);
                    local_790.context = context->user;
                    auVar195 = ZEXT416((uint)(fVar191 * -fVar191 * 0.5));
                    auVar195 = vshufps_avx(auVar195,auVar195,0);
                    auVar185._0_4_ =
                         local_8a0 * auVar195._0_4_ +
                         local_880 * auVar217._0_4_ +
                         auVar234._0_4_ * local_830 + local_890 * auVar183._0_4_;
                    auVar185._4_4_ =
                         fStack_89c * auVar195._4_4_ +
                         fStack_87c * auVar217._4_4_ +
                         auVar234._4_4_ * fStack_82c + fStack_88c * auVar183._4_4_;
                    auVar185._8_4_ =
                         fStack_898 * auVar195._8_4_ +
                         fStack_878 * auVar217._8_4_ +
                         auVar234._8_4_ * fStack_828 + fStack_888 * auVar183._8_4_;
                    auVar185._12_4_ =
                         fStack_894 * auVar195._12_4_ +
                         fStack_874 * auVar217._12_4_ +
                         auVar234._12_4_ * fStack_824 + fStack_884 * auVar183._12_4_;
                    auVar234 = vshufps_avx(auVar185,auVar185,0);
                    local_450[0] = (RTCHitN)auVar234[0];
                    local_450[1] = (RTCHitN)auVar234[1];
                    local_450[2] = (RTCHitN)auVar234[2];
                    local_450[3] = (RTCHitN)auVar234[3];
                    local_450[4] = (RTCHitN)auVar234[4];
                    local_450[5] = (RTCHitN)auVar234[5];
                    local_450[6] = (RTCHitN)auVar234[6];
                    local_450[7] = (RTCHitN)auVar234[7];
                    local_450[8] = (RTCHitN)auVar234[8];
                    local_450[9] = (RTCHitN)auVar234[9];
                    local_450[10] = (RTCHitN)auVar234[10];
                    local_450[0xb] = (RTCHitN)auVar234[0xb];
                    local_450[0xc] = (RTCHitN)auVar234[0xc];
                    local_450[0xd] = (RTCHitN)auVar234[0xd];
                    local_450[0xe] = (RTCHitN)auVar234[0xe];
                    local_450[0xf] = (RTCHitN)auVar234[0xf];
                    auVar234 = vshufps_avx(auVar185,auVar185,0x55);
                    local_440 = auVar234;
                    local_430 = vshufps_avx(auVar185,auVar185,0xaa);
                    fStack_41c = local_420;
                    fStack_418 = local_420;
                    fStack_414 = local_420;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    local_400 = local_680._0_8_;
                    uStack_3f8 = local_680._8_8_;
                    local_3f0 = local_670;
                    vcmpps_avx(ZEXT1632(local_670),ZEXT1632(local_670),0xf);
                    uStack_3dc = (local_790.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_790.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_820 = local_800;
                    local_790.valid = (int *)local_820;
                    local_790.geometryUserPtr = pGVar14->userPtr;
                    local_790.hit = local_450;
                    local_790.N = 4;
                    local_790.ray = (RTCRayN *)ray;
                    if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar14->intersectionFilterN)(&local_790);
                      ray = local_720;
                    }
                    if (local_820 == (undefined1  [16])0x0) {
                      auVar234 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar234 = auVar234 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_790);
                        ray = local_720;
                      }
                      auVar183 = vpcmpeqd_avx(local_820,_DAT_01f45a50);
                      auVar217 = vpcmpeqd_avx(auVar234,auVar234);
                      auVar234 = auVar183 ^ auVar217;
                      if (local_820 != (undefined1  [16])0x0) {
                        auVar183 = auVar183 ^ auVar217;
                        auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])local_790.hit);
                        *(undefined1 (*) [16])(local_790.ray + 0xc0) = auVar217;
                        auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x10));
                        *(undefined1 (*) [16])(local_790.ray + 0xd0) = auVar217;
                        auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x20));
                        *(undefined1 (*) [16])(local_790.ray + 0xe0) = auVar217;
                        auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x30));
                        *(undefined1 (*) [16])(local_790.ray + 0xf0) = auVar217;
                        auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x40));
                        *(undefined1 (*) [16])(local_790.ray + 0x100) = auVar217;
                        auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x50));
                        *(undefined1 (*) [16])(local_790.ray + 0x110) = auVar217;
                        auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x60));
                        *(undefined1 (*) [16])(local_790.ray + 0x120) = auVar217;
                        auVar217 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x70));
                        *(undefined1 (*) [16])(local_790.ray + 0x130) = auVar217;
                        auVar183 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                            (local_790.hit + 0x80));
                        *(undefined1 (*) [16])(local_790.ray + 0x140) = auVar183;
                      }
                    }
                    auVar201 = local_580;
                    auVar202 = ZEXT3264(local_580);
                    auVar163._8_8_ = 0x100000001;
                    auVar163._0_8_ = 0x100000001;
                    if ((auVar163 & auVar234) == (undefined1  [16])0x0) {
                      *(int *)(ray + k * 4 + 0x80) = local_7e0._0_4_;
                      auVar234 = local_7e0._0_16_;
                    }
                    else {
                      auVar234 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    }
                    *(undefined4 *)(local_620 + (long)local_760 * 4) = 0;
                    local_7e0._0_16_ = auVar234;
                    auVar234 = vshufps_avx(auVar234,auVar234,0);
                    auVar134._16_16_ = auVar234;
                    auVar134._0_16_ = auVar234;
                    auVar20 = vcmpps_avx(auVar201,auVar134,2);
                    auVar16 = vandps_avx(auVar20,local_620);
                    local_620 = local_620 & auVar20;
                    if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_620 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_620 >> 0x7f,0) == '\0') &&
                          (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_620 >> 0xbf,0) == '\0') &&
                        (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_620[0x1f]) break;
                    auVar171._8_4_ = 0x7f800000;
                    auVar171._0_8_ = 0x7f8000007f800000;
                    auVar171._12_4_ = 0x7f800000;
                    auVar171._16_4_ = 0x7f800000;
                    auVar171._20_4_ = 0x7f800000;
                    auVar171._24_4_ = 0x7f800000;
                    auVar171._28_4_ = 0x7f800000;
                    auVar201 = vblendvps_avx(auVar171,auVar201,auVar16);
                    auVar20 = vshufps_avx(auVar201,auVar201,0xb1);
                    auVar20 = vminps_avx(auVar201,auVar20);
                    auVar130 = vshufpd_avx(auVar20,auVar20,5);
                    auVar20 = vminps_avx(auVar20,auVar130);
                    auVar130 = vperm2f128_avx(auVar20,auVar20,1);
                    auVar20 = vminps_avx(auVar20,auVar130);
                    auVar20 = vcmpps_avx(auVar201,auVar20,0);
                    auVar130 = auVar16 & auVar20;
                    auVar201 = auVar16;
                    if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar130 >> 0x7f,0) != '\0') ||
                          (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar130 >> 0xbf,0) != '\0') ||
                        (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar130[0x1f] < '\0') {
                      auVar201 = vandps_avx(auVar20,auVar16);
                    }
                    uVar113 = vmovmskps_avx(auVar201);
                    uVar11 = 0;
                    if (uVar113 != 0) {
                      for (; (uVar113 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                      }
                    }
                    uVar115 = (ulong)uVar11;
                    local_620 = auVar16;
                  }
                  auVar275 = ZEXT3264(local_7c0);
                  pre = local_810;
                }
                goto LAB_00867415;
              }
            }
          }
        }
      }
    }
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar124._4_4_ = uVar9;
    auVar124._0_4_ = uVar9;
    auVar124._8_4_ = uVar9;
    auVar124._12_4_ = uVar9;
    auVar234 = vcmpps_avx(local_2b0,auVar124,2);
    uVar111 = vmovmskps_avx(auVar234);
    uVar111 = (uint)uVar117 & uVar111;
    prim = (Primitive *)local_6a0._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }